

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Primitive PVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  uint uVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  bool bVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar108 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar109 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar143 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  undefined1 auVar195 [32];
  float fVar201;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float t1;
  float fVar202;
  float fVar222;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar221;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar219;
  float fVar220;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar226;
  float fVar255;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar259;
  float fVar275;
  float fVar276;
  vfloat4 b0;
  undefined1 auVar260 [16];
  float fVar277;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar333;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar334;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar345;
  float fVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  float fVar357;
  float fVar359;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar358;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar356 [32];
  float fVar363;
  float fVar373;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  float fVar371;
  float fVar372;
  float fVar374;
  float fVar375;
  float fVar376;
  float in_register_0000151c;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  float fVar377;
  float fVar378;
  float fVar388;
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  float fVar386;
  float fVar387;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar389;
  float fVar390;
  vfloat4 a0;
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  float in_register_0000159c;
  undefined1 auVar397 [32];
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  uint auStack_3d8 [4];
  RTCFilterFunctionNArguments local_3c8;
  undefined1 local_398 [32];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar289 [32];
  undefined1 auVar398 [32];
  
  PVar22 = prim[1];
  uVar84 = (ulong)(byte)PVar22;
  lVar90 = uVar84 * 0x25;
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar139 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar139 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar104 = vsubps_avx(auVar104,*(undefined1 (*) [16])(prim + lVar90 + 6));
  fVar202 = *(float *)(prim + lVar90 + 0x12);
  auVar133._0_4_ = fVar202 * auVar104._0_4_;
  auVar133._4_4_ = fVar202 * auVar104._4_4_;
  auVar133._8_4_ = fVar202 * auVar104._8_4_;
  auVar133._12_4_ = fVar202 * auVar104._12_4_;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar260._0_4_ = fVar202 * auVar139._0_4_;
  auVar260._4_4_ = fVar202 * auVar139._4_4_;
  auVar260._8_4_ = fVar202 * auVar139._8_4_;
  auVar260._12_4_ = fVar202 * auVar139._12_4_;
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 10)));
  auVar123._16_16_ = auVar139;
  auVar123._0_16_ = auVar104;
  auVar123 = vcvtdq2ps_avx(auVar123);
  lVar1 = uVar84 * 5;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar195._16_16_ = auVar139;
  auVar195._0_16_ = auVar104;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 10)));
  auVar29 = vcvtdq2ps_avx(auVar195);
  auVar214._16_16_ = auVar139;
  auVar214._0_16_ = auVar104;
  auVar30 = vcvtdq2ps_avx(auVar214);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xf + 10)));
  auVar215._16_16_ = auVar139;
  auVar215._0_16_ = auVar104;
  auVar31 = vcvtdq2ps_avx(auVar215);
  lVar91 = (ulong)(byte)PVar22 * 0x10;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 10)));
  auVar288._16_16_ = auVar139;
  auVar288._0_16_ = auVar104;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar84 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar288);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar84 + 10)));
  auVar298._16_16_ = auVar139;
  auVar298._0_16_ = auVar104;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 6)));
  auVar33 = vcvtdq2ps_avx(auVar298);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1a + 10)));
  auVar299._16_16_ = auVar139;
  auVar299._0_16_ = auVar104;
  auVar34 = vcvtdq2ps_avx(auVar299);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1b + 10)));
  auVar327._16_16_ = auVar139;
  auVar327._0_16_ = auVar104;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 6)));
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x1c + 10)));
  auVar35 = vcvtdq2ps_avx(auVar327);
  auVar340._16_16_ = auVar139;
  auVar340._0_16_ = auVar104;
  auVar36 = vcvtdq2ps_avx(auVar340);
  auVar104 = vshufps_avx(auVar260,auVar260,0);
  auVar139 = vshufps_avx(auVar260,auVar260,0x55);
  auVar105 = vshufps_avx(auVar260,auVar260,0xaa);
  fVar202 = auVar105._0_4_;
  fVar226 = auVar105._4_4_;
  fVar200 = auVar105._8_4_;
  fVar219 = auVar105._12_4_;
  fVar201 = auVar139._0_4_;
  fVar390 = auVar139._4_4_;
  fVar220 = auVar139._8_4_;
  fVar254 = auVar139._12_4_;
  fVar334 = auVar104._0_4_;
  fVar222 = auVar104._4_4_;
  fVar255 = auVar104._8_4_;
  fVar221 = auVar104._12_4_;
  auVar367._0_4_ = fVar334 * auVar123._0_4_ + fVar201 * auVar29._0_4_ + fVar202 * auVar30._0_4_;
  auVar367._4_4_ = fVar222 * auVar123._4_4_ + fVar390 * auVar29._4_4_ + fVar226 * auVar30._4_4_;
  auVar367._8_4_ = fVar255 * auVar123._8_4_ + fVar220 * auVar29._8_4_ + fVar200 * auVar30._8_4_;
  auVar367._12_4_ = fVar221 * auVar123._12_4_ + fVar254 * auVar29._12_4_ + fVar219 * auVar30._12_4_;
  auVar367._16_4_ = fVar334 * auVar123._16_4_ + fVar201 * auVar29._16_4_ + fVar202 * auVar30._16_4_;
  auVar367._20_4_ = fVar222 * auVar123._20_4_ + fVar390 * auVar29._20_4_ + fVar226 * auVar30._20_4_;
  auVar367._24_4_ = fVar255 * auVar123._24_4_ + fVar220 * auVar29._24_4_ + fVar200 * auVar30._24_4_;
  auVar367._28_4_ = fVar254 + in_register_000015dc + in_register_0000151c;
  auVar351._0_4_ = fVar334 * auVar31._0_4_ + fVar201 * auVar32._0_4_ + auVar33._0_4_ * fVar202;
  auVar351._4_4_ = fVar222 * auVar31._4_4_ + fVar390 * auVar32._4_4_ + auVar33._4_4_ * fVar226;
  auVar351._8_4_ = fVar255 * auVar31._8_4_ + fVar220 * auVar32._8_4_ + auVar33._8_4_ * fVar200;
  auVar351._12_4_ = fVar221 * auVar31._12_4_ + fVar254 * auVar32._12_4_ + auVar33._12_4_ * fVar219;
  auVar351._16_4_ = fVar334 * auVar31._16_4_ + fVar201 * auVar32._16_4_ + auVar33._16_4_ * fVar202;
  auVar351._20_4_ = fVar222 * auVar31._20_4_ + fVar390 * auVar32._20_4_ + auVar33._20_4_ * fVar226;
  auVar351._24_4_ = fVar255 * auVar31._24_4_ + fVar220 * auVar32._24_4_ + auVar33._24_4_ * fVar200;
  auVar351._28_4_ = fVar254 + in_register_000015dc + in_register_0000159c;
  auVar272._0_4_ = fVar334 * auVar34._0_4_ + fVar201 * auVar35._0_4_ + auVar36._0_4_ * fVar202;
  auVar272._4_4_ = fVar222 * auVar34._4_4_ + fVar390 * auVar35._4_4_ + auVar36._4_4_ * fVar226;
  auVar272._8_4_ = fVar255 * auVar34._8_4_ + fVar220 * auVar35._8_4_ + auVar36._8_4_ * fVar200;
  auVar272._12_4_ = fVar221 * auVar34._12_4_ + fVar254 * auVar35._12_4_ + auVar36._12_4_ * fVar219;
  auVar272._16_4_ = fVar334 * auVar34._16_4_ + fVar201 * auVar35._16_4_ + auVar36._16_4_ * fVar202;
  auVar272._20_4_ = fVar222 * auVar34._20_4_ + fVar390 * auVar35._20_4_ + auVar36._20_4_ * fVar226;
  auVar272._24_4_ = fVar255 * auVar34._24_4_ + fVar220 * auVar35._24_4_ + auVar36._24_4_ * fVar200;
  auVar272._28_4_ = fVar221 + fVar254 + fVar219;
  auVar104 = vshufps_avx(auVar133,auVar133,0);
  auVar139 = vshufps_avx(auVar133,auVar133,0x55);
  auVar105 = vshufps_avx(auVar133,auVar133,0xaa);
  fVar202 = auVar105._0_4_;
  fVar226 = auVar105._4_4_;
  fVar200 = auVar105._8_4_;
  fVar219 = auVar105._12_4_;
  fVar222 = auVar139._0_4_;
  fVar255 = auVar139._4_4_;
  fVar221 = auVar139._8_4_;
  fVar223 = auVar139._12_4_;
  fVar201 = auVar29._28_4_ + auVar30._28_4_;
  fVar390 = auVar104._0_4_;
  fVar220 = auVar104._4_4_;
  fVar254 = auVar104._8_4_;
  fVar334 = auVar104._12_4_;
  auVar162._0_4_ = fVar390 * auVar123._0_4_ + fVar222 * auVar29._0_4_ + fVar202 * auVar30._0_4_;
  auVar162._4_4_ = fVar220 * auVar123._4_4_ + fVar255 * auVar29._4_4_ + fVar226 * auVar30._4_4_;
  auVar162._8_4_ = fVar254 * auVar123._8_4_ + fVar221 * auVar29._8_4_ + fVar200 * auVar30._8_4_;
  auVar162._12_4_ = fVar334 * auVar123._12_4_ + fVar223 * auVar29._12_4_ + fVar219 * auVar30._12_4_;
  auVar162._16_4_ = fVar390 * auVar123._16_4_ + fVar222 * auVar29._16_4_ + fVar202 * auVar30._16_4_;
  auVar162._20_4_ = fVar220 * auVar123._20_4_ + fVar255 * auVar29._20_4_ + fVar226 * auVar30._20_4_;
  auVar162._24_4_ = fVar254 * auVar123._24_4_ + fVar221 * auVar29._24_4_ + fVar200 * auVar30._24_4_;
  auVar162._28_4_ = auVar123._28_4_ + fVar201;
  auVar124._0_4_ = fVar390 * auVar31._0_4_ + auVar33._0_4_ * fVar202 + fVar222 * auVar32._0_4_;
  auVar124._4_4_ = fVar220 * auVar31._4_4_ + auVar33._4_4_ * fVar226 + fVar255 * auVar32._4_4_;
  auVar124._8_4_ = fVar254 * auVar31._8_4_ + auVar33._8_4_ * fVar200 + fVar221 * auVar32._8_4_;
  auVar124._12_4_ = fVar334 * auVar31._12_4_ + auVar33._12_4_ * fVar219 + fVar223 * auVar32._12_4_;
  auVar124._16_4_ = fVar390 * auVar31._16_4_ + auVar33._16_4_ * fVar202 + fVar222 * auVar32._16_4_;
  auVar124._20_4_ = fVar220 * auVar31._20_4_ + auVar33._20_4_ * fVar226 + fVar255 * auVar32._20_4_;
  auVar124._24_4_ = fVar254 * auVar31._24_4_ + auVar33._24_4_ * fVar200 + fVar221 * auVar32._24_4_;
  auVar124._28_4_ = auVar123._28_4_ + auVar33._28_4_ + auVar30._28_4_;
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar216._16_4_ = 0x7fffffff;
  auVar216._20_4_ = 0x7fffffff;
  auVar216._24_4_ = 0x7fffffff;
  auVar216._28_4_ = 0x7fffffff;
  auVar251._8_4_ = 0x219392ef;
  auVar251._0_8_ = 0x219392ef219392ef;
  auVar251._12_4_ = 0x219392ef;
  auVar251._16_4_ = 0x219392ef;
  auVar251._20_4_ = 0x219392ef;
  auVar251._24_4_ = 0x219392ef;
  auVar251._28_4_ = 0x219392ef;
  auVar123 = vandps_avx(auVar367,auVar216);
  auVar123 = vcmpps_avx(auVar123,auVar251,1);
  auVar29 = vblendvps_avx(auVar367,auVar251,auVar123);
  auVar123 = vandps_avx(auVar351,auVar216);
  auVar123 = vcmpps_avx(auVar123,auVar251,1);
  auVar30 = vblendvps_avx(auVar351,auVar251,auVar123);
  auVar123 = vandps_avx(auVar272,auVar216);
  auVar123 = vcmpps_avx(auVar123,auVar251,1);
  auVar123 = vblendvps_avx(auVar272,auVar251,auVar123);
  auVar196._0_4_ = fVar390 * auVar34._0_4_ + fVar222 * auVar35._0_4_ + auVar36._0_4_ * fVar202;
  auVar196._4_4_ = fVar220 * auVar34._4_4_ + fVar255 * auVar35._4_4_ + auVar36._4_4_ * fVar226;
  auVar196._8_4_ = fVar254 * auVar34._8_4_ + fVar221 * auVar35._8_4_ + auVar36._8_4_ * fVar200;
  auVar196._12_4_ = fVar334 * auVar34._12_4_ + fVar223 * auVar35._12_4_ + auVar36._12_4_ * fVar219;
  auVar196._16_4_ = fVar390 * auVar34._16_4_ + fVar222 * auVar35._16_4_ + auVar36._16_4_ * fVar202;
  auVar196._20_4_ = fVar220 * auVar34._20_4_ + fVar255 * auVar35._20_4_ + auVar36._20_4_ * fVar226;
  auVar196._24_4_ = fVar254 * auVar34._24_4_ + fVar221 * auVar35._24_4_ + auVar36._24_4_ * fVar200;
  auVar196._28_4_ = fVar201 + auVar32._28_4_ + fVar219;
  auVar31 = vrcpps_avx(auVar29);
  fVar202 = auVar31._0_4_;
  fVar219 = auVar31._4_4_;
  auVar32._4_4_ = auVar29._4_4_ * fVar219;
  auVar32._0_4_ = auVar29._0_4_ * fVar202;
  fVar220 = auVar31._8_4_;
  auVar32._8_4_ = auVar29._8_4_ * fVar220;
  fVar222 = auVar31._12_4_;
  auVar32._12_4_ = auVar29._12_4_ * fVar222;
  fVar223 = auVar31._16_4_;
  auVar32._16_4_ = auVar29._16_4_ * fVar223;
  fVar224 = auVar31._20_4_;
  auVar32._20_4_ = auVar29._20_4_ * fVar224;
  fVar225 = auVar31._24_4_;
  auVar32._24_4_ = auVar29._24_4_ * fVar225;
  auVar32._28_4_ = 0x219392ef;
  auVar300._8_4_ = 0x3f800000;
  auVar300._0_8_ = 0x3f8000003f800000;
  auVar300._12_4_ = 0x3f800000;
  auVar300._16_4_ = 0x3f800000;
  auVar300._20_4_ = 0x3f800000;
  auVar300._24_4_ = 0x3f800000;
  auVar300._28_4_ = 0x3f800000;
  auVar33 = vsubps_avx(auVar300,auVar32);
  auVar32 = vrcpps_avx(auVar30);
  fVar202 = fVar202 + fVar202 * auVar33._0_4_;
  fVar219 = fVar219 + fVar219 * auVar33._4_4_;
  fVar220 = fVar220 + fVar220 * auVar33._8_4_;
  fVar222 = fVar222 + fVar222 * auVar33._12_4_;
  fVar223 = fVar223 + fVar223 * auVar33._16_4_;
  fVar224 = fVar224 + fVar224 * auVar33._20_4_;
  fVar225 = fVar225 + fVar225 * auVar33._24_4_;
  fVar226 = auVar32._0_4_;
  fVar201 = auVar32._4_4_;
  auVar29._4_4_ = auVar30._4_4_ * fVar201;
  auVar29._0_4_ = auVar30._0_4_ * fVar226;
  fVar254 = auVar32._8_4_;
  auVar29._8_4_ = auVar30._8_4_ * fVar254;
  fVar255 = auVar32._12_4_;
  auVar29._12_4_ = auVar30._12_4_ * fVar255;
  fVar256 = auVar32._16_4_;
  auVar29._16_4_ = auVar30._16_4_ * fVar256;
  fVar257 = auVar32._20_4_;
  auVar29._20_4_ = auVar30._20_4_ * fVar257;
  fVar258 = auVar32._24_4_;
  auVar29._24_4_ = auVar30._24_4_ * fVar258;
  auVar29._28_4_ = auVar33._28_4_;
  auVar30 = vsubps_avx(auVar300,auVar29);
  fVar226 = fVar226 + fVar226 * auVar30._0_4_;
  fVar201 = fVar201 + fVar201 * auVar30._4_4_;
  fVar254 = fVar254 + fVar254 * auVar30._8_4_;
  fVar255 = fVar255 + fVar255 * auVar30._12_4_;
  fVar256 = fVar256 + fVar256 * auVar30._16_4_;
  fVar257 = fVar257 + fVar257 * auVar30._20_4_;
  fVar258 = fVar258 + fVar258 * auVar30._24_4_;
  auVar29 = vrcpps_avx(auVar123);
  fVar259 = auVar29._0_4_;
  fVar275 = auVar29._4_4_;
  auVar34._4_4_ = fVar275 * auVar123._4_4_;
  auVar34._0_4_ = fVar259 * auVar123._0_4_;
  fVar276 = auVar29._8_4_;
  auVar34._8_4_ = fVar276 * auVar123._8_4_;
  fVar277 = auVar29._12_4_;
  auVar34._12_4_ = fVar277 * auVar123._12_4_;
  fVar278 = auVar29._16_4_;
  auVar34._16_4_ = fVar278 * auVar123._16_4_;
  fVar279 = auVar29._20_4_;
  auVar34._20_4_ = fVar279 * auVar123._20_4_;
  fVar280 = auVar29._24_4_;
  auVar34._24_4_ = fVar280 * auVar123._24_4_;
  auVar34._28_4_ = auVar123._28_4_;
  auVar123 = vsubps_avx(auVar300,auVar34);
  fVar259 = fVar259 + fVar259 * auVar123._0_4_;
  fVar275 = fVar275 + fVar275 * auVar123._4_4_;
  fVar276 = fVar276 + fVar276 * auVar123._8_4_;
  fVar277 = fVar277 + fVar277 * auVar123._12_4_;
  fVar278 = fVar278 + fVar278 * auVar123._16_4_;
  fVar279 = fVar279 + fVar279 * auVar123._20_4_;
  fVar280 = fVar280 + fVar280 * auVar123._24_4_;
  auVar104 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar90 + 0x16)) *
                           *(float *)(prim + lVar90 + 0x1a)));
  auVar37 = vshufps_avx(auVar104,auVar104,0);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar104 = vpmovsxwd_avx(auVar104);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar84 * 7 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar139);
  auVar301._16_16_ = auVar139;
  auVar301._0_16_ = auVar104;
  auVar123 = vcvtdq2ps_avx(auVar301);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 6);
  auVar104 = vpmovsxwd_avx(auVar105);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 0xe);
  auVar139 = vpmovsxwd_avx(auVar103);
  auVar316._16_16_ = auVar139;
  auVar316._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar316);
  auVar29 = vsubps_avx(auVar29,auVar123);
  fVar200 = auVar37._0_4_;
  fVar390 = auVar37._4_4_;
  fVar334 = auVar37._8_4_;
  fVar221 = auVar37._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar104 = vpmovsxwd_avx(auVar37);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar84 * 9 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar232);
  auVar302._0_4_ = auVar29._0_4_ * fVar200 + auVar123._0_4_;
  auVar302._4_4_ = auVar29._4_4_ * fVar390 + auVar123._4_4_;
  auVar302._8_4_ = auVar29._8_4_ * fVar334 + auVar123._8_4_;
  auVar302._12_4_ = auVar29._12_4_ * fVar221 + auVar123._12_4_;
  auVar302._16_4_ = auVar29._16_4_ * fVar200 + auVar123._16_4_;
  auVar302._20_4_ = auVar29._20_4_ * fVar390 + auVar123._20_4_;
  auVar302._24_4_ = auVar29._24_4_ * fVar334 + auVar123._24_4_;
  auVar302._28_4_ = auVar29._28_4_ + auVar123._28_4_;
  auVar317._16_16_ = auVar139;
  auVar317._0_16_ = auVar104;
  auVar123 = vcvtdq2ps_avx(auVar317);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 6);
  auVar104 = vpmovsxwd_avx(auVar156);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar84 * 0xd + 0xe);
  auVar139 = vpmovsxwd_avx(auVar145);
  auVar328._16_16_ = auVar139;
  auVar328._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar328);
  auVar29 = vsubps_avx(auVar29,auVar123);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 6);
  auVar104 = vpmovsxwd_avx(auVar183);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar84 * 0x12 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar146);
  auVar318._0_4_ = auVar123._0_4_ + auVar29._0_4_ * fVar200;
  auVar318._4_4_ = auVar123._4_4_ + auVar29._4_4_ * fVar390;
  auVar318._8_4_ = auVar123._8_4_ + auVar29._8_4_ * fVar334;
  auVar318._12_4_ = auVar123._12_4_ + auVar29._12_4_ * fVar221;
  auVar318._16_4_ = auVar123._16_4_ + auVar29._16_4_ * fVar200;
  auVar318._20_4_ = auVar123._20_4_ + auVar29._20_4_ * fVar390;
  auVar318._24_4_ = auVar123._24_4_ + auVar29._24_4_ * fVar334;
  auVar318._28_4_ = auVar123._28_4_ + auVar29._28_4_;
  auVar329._16_16_ = auVar139;
  auVar329._0_16_ = auVar104;
  auVar123 = vcvtdq2ps_avx(auVar329);
  uVar85 = (ulong)(uint)((int)lVar1 << 2);
  lVar90 = uVar84 * 2 + uVar85;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar104 = vpmovsxwd_avx(auVar290);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar10);
  auVar341._16_16_ = auVar139;
  auVar341._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar341);
  auVar29 = vsubps_avx(auVar29,auVar123);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar104 = vpmovsxwd_avx(auVar11);
  auVar330._0_4_ = auVar123._0_4_ + auVar29._0_4_ * fVar200;
  auVar330._4_4_ = auVar123._4_4_ + auVar29._4_4_ * fVar390;
  auVar330._8_4_ = auVar123._8_4_ + auVar29._8_4_ * fVar334;
  auVar330._12_4_ = auVar123._12_4_ + auVar29._12_4_ * fVar221;
  auVar330._16_4_ = auVar123._16_4_ + auVar29._16_4_ * fVar200;
  auVar330._20_4_ = auVar123._20_4_ + auVar29._20_4_ * fVar390;
  auVar330._24_4_ = auVar123._24_4_ + auVar29._24_4_ * fVar334;
  auVar330._28_4_ = auVar123._28_4_ + auVar29._28_4_;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = *(ulong *)(prim + uVar85 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar337);
  auVar342._16_16_ = auVar139;
  auVar342._0_16_ = auVar104;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 6);
  auVar104 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar84 * 0x18 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar13);
  auVar123 = vcvtdq2ps_avx(auVar342);
  auVar352._16_16_ = auVar139;
  auVar352._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar352);
  auVar29 = vsubps_avx(auVar29,auVar123);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 6);
  auVar104 = vpmovsxwd_avx(auVar14);
  auVar343._0_4_ = auVar123._0_4_ + auVar29._0_4_ * fVar200;
  auVar343._4_4_ = auVar123._4_4_ + auVar29._4_4_ * fVar390;
  auVar343._8_4_ = auVar123._8_4_ + auVar29._8_4_ * fVar334;
  auVar343._12_4_ = auVar123._12_4_ + auVar29._12_4_ * fVar221;
  auVar343._16_4_ = auVar123._16_4_ + auVar29._16_4_ * fVar200;
  auVar343._20_4_ = auVar123._20_4_ + auVar29._20_4_ * fVar390;
  auVar343._24_4_ = auVar123._24_4_ + auVar29._24_4_ * fVar334;
  auVar343._28_4_ = auVar123._28_4_ + auVar29._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar84 * 0x1d + 0xe);
  auVar139 = vpmovsxwd_avx(auVar15);
  auVar353._16_16_ = auVar139;
  auVar353._0_16_ = auVar104;
  auVar123 = vcvtdq2ps_avx(auVar353);
  lVar90 = uVar84 + (ulong)(byte)PVar22 * 0x20;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar104 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar17);
  auVar368._16_16_ = auVar139;
  auVar368._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar368);
  auVar29 = vsubps_avx(auVar29,auVar123);
  auVar354._0_4_ = auVar123._0_4_ + auVar29._0_4_ * fVar200;
  auVar354._4_4_ = auVar123._4_4_ + auVar29._4_4_ * fVar390;
  auVar354._8_4_ = auVar123._8_4_ + auVar29._8_4_ * fVar334;
  auVar354._12_4_ = auVar123._12_4_ + auVar29._12_4_ * fVar221;
  auVar354._16_4_ = auVar123._16_4_ + auVar29._16_4_ * fVar200;
  auVar354._20_4_ = auVar123._20_4_ + auVar29._20_4_ * fVar390;
  auVar354._24_4_ = auVar123._24_4_ + auVar29._24_4_ * fVar334;
  auVar354._28_4_ = auVar123._28_4_ + auVar29._28_4_;
  lVar90 = (ulong)(byte)PVar22 * 0x20 - uVar84;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar104 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar19);
  auVar369._16_16_ = auVar139;
  auVar369._0_16_ = auVar104;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 6);
  auVar104 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar84 * 0x23 + 0xe);
  auVar139 = vpmovsxwd_avx(auVar21);
  auVar123 = vcvtdq2ps_avx(auVar369);
  auVar384._16_16_ = auVar139;
  auVar384._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar384);
  auVar29 = vsubps_avx(auVar29,auVar123);
  auVar370._0_4_ = auVar123._0_4_ + auVar29._0_4_ * fVar200;
  auVar370._4_4_ = auVar123._4_4_ + auVar29._4_4_ * fVar390;
  auVar370._8_4_ = auVar123._8_4_ + auVar29._8_4_ * fVar334;
  auVar370._12_4_ = auVar123._12_4_ + auVar29._12_4_ * fVar221;
  auVar370._16_4_ = auVar123._16_4_ + auVar29._16_4_ * fVar200;
  auVar370._20_4_ = auVar123._20_4_ + auVar29._20_4_ * fVar390;
  auVar370._24_4_ = auVar123._24_4_ + auVar29._24_4_ * fVar334;
  auVar370._28_4_ = auVar123._28_4_ + fVar221;
  auVar123 = vsubps_avx(auVar302,auVar162);
  auVar281._0_4_ = fVar202 * auVar123._0_4_;
  auVar281._4_4_ = fVar219 * auVar123._4_4_;
  auVar281._8_4_ = fVar220 * auVar123._8_4_;
  auVar281._12_4_ = fVar222 * auVar123._12_4_;
  auVar35._16_4_ = fVar223 * auVar123._16_4_;
  auVar35._0_16_ = auVar281;
  auVar35._20_4_ = fVar224 * auVar123._20_4_;
  auVar35._24_4_ = fVar225 * auVar123._24_4_;
  auVar35._28_4_ = auVar123._28_4_;
  auVar123 = vsubps_avx(auVar318,auVar162);
  auVar203._0_4_ = fVar202 * auVar123._0_4_;
  auVar203._4_4_ = fVar219 * auVar123._4_4_;
  auVar203._8_4_ = fVar220 * auVar123._8_4_;
  auVar203._12_4_ = fVar222 * auVar123._12_4_;
  auVar36._16_4_ = fVar223 * auVar123._16_4_;
  auVar36._0_16_ = auVar203;
  auVar36._20_4_ = fVar224 * auVar123._20_4_;
  auVar36._24_4_ = fVar225 * auVar123._24_4_;
  auVar36._28_4_ = auVar31._28_4_ + auVar33._28_4_;
  auVar123 = vsubps_avx(auVar330,auVar124);
  auVar134._0_4_ = fVar226 * auVar123._0_4_;
  auVar134._4_4_ = fVar201 * auVar123._4_4_;
  auVar134._8_4_ = fVar254 * auVar123._8_4_;
  auVar134._12_4_ = fVar255 * auVar123._12_4_;
  auVar31._16_4_ = fVar256 * auVar123._16_4_;
  auVar31._0_16_ = auVar134;
  auVar31._20_4_ = fVar257 * auVar123._20_4_;
  auVar31._24_4_ = fVar258 * auVar123._24_4_;
  auVar31._28_4_ = auVar123._28_4_;
  auVar123 = vsubps_avx(auVar343,auVar124);
  auVar227._0_4_ = fVar226 * auVar123._0_4_;
  auVar227._4_4_ = fVar201 * auVar123._4_4_;
  auVar227._8_4_ = fVar254 * auVar123._8_4_;
  auVar227._12_4_ = fVar255 * auVar123._12_4_;
  auVar33._16_4_ = fVar256 * auVar123._16_4_;
  auVar33._0_16_ = auVar227;
  auVar33._20_4_ = fVar257 * auVar123._20_4_;
  auVar33._24_4_ = fVar258 * auVar123._24_4_;
  auVar33._28_4_ = auVar32._28_4_ + auVar30._28_4_;
  auVar123 = vsubps_avx(auVar354,auVar196);
  auVar93._0_4_ = fVar259 * auVar123._0_4_;
  auVar93._4_4_ = fVar275 * auVar123._4_4_;
  auVar93._8_4_ = fVar276 * auVar123._8_4_;
  auVar93._12_4_ = fVar277 * auVar123._12_4_;
  auVar30._16_4_ = fVar278 * auVar123._16_4_;
  auVar30._0_16_ = auVar93;
  auVar30._20_4_ = fVar279 * auVar123._20_4_;
  auVar30._24_4_ = fVar280 * auVar123._24_4_;
  auVar30._28_4_ = auVar123._28_4_;
  auVar123 = vsubps_avx(auVar370,auVar196);
  auVar169._0_4_ = fVar259 * auVar123._0_4_;
  auVar169._4_4_ = fVar275 * auVar123._4_4_;
  auVar169._8_4_ = fVar276 * auVar123._8_4_;
  auVar169._12_4_ = fVar277 * auVar123._12_4_;
  auVar38._16_4_ = fVar278 * auVar123._16_4_;
  auVar38._0_16_ = auVar169;
  auVar38._20_4_ = fVar279 * auVar123._20_4_;
  auVar38._24_4_ = fVar280 * auVar123._24_4_;
  auVar38._28_4_ = auVar123._28_4_;
  auVar104 = vpminsd_avx(auVar35._16_16_,auVar36._16_16_);
  auVar139 = vpminsd_avx(auVar281,auVar203);
  auVar319._16_16_ = auVar104;
  auVar319._0_16_ = auVar139;
  auVar104 = vpminsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar139 = vpminsd_avx(auVar134,auVar227);
  auVar355._16_16_ = auVar104;
  auVar355._0_16_ = auVar139;
  auVar123 = vmaxps_avx(auVar319,auVar355);
  auVar104 = vpminsd_avx(auVar30._16_16_,auVar38._16_16_);
  auVar139 = vpminsd_avx(auVar93,auVar169);
  auVar385._16_16_ = auVar104;
  auVar385._0_16_ = auVar139;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar397._4_4_ = uVar8;
  auVar397._0_4_ = uVar8;
  auVar397._8_4_ = uVar8;
  auVar397._12_4_ = uVar8;
  auVar397._16_4_ = uVar8;
  auVar397._20_4_ = uVar8;
  auVar397._24_4_ = uVar8;
  auVar397._28_4_ = uVar8;
  auVar29 = vmaxps_avx(auVar385,auVar397);
  auVar123 = vmaxps_avx(auVar123,auVar29);
  local_178._4_4_ = auVar123._4_4_ * 0.99999964;
  local_178._0_4_ = auVar123._0_4_ * 0.99999964;
  local_178._8_4_ = auVar123._8_4_ * 0.99999964;
  local_178._12_4_ = auVar123._12_4_ * 0.99999964;
  local_178._16_4_ = auVar123._16_4_ * 0.99999964;
  local_178._20_4_ = auVar123._20_4_ * 0.99999964;
  local_178._24_4_ = auVar123._24_4_ * 0.99999964;
  local_178._28_4_ = auVar123._28_4_;
  auVar104 = vpmaxsd_avx(auVar35._16_16_,auVar36._16_16_);
  auVar139 = vpmaxsd_avx(auVar281,auVar203);
  auVar217._16_16_ = auVar104;
  auVar217._0_16_ = auVar139;
  auVar104 = vpmaxsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar139 = vpmaxsd_avx(auVar134,auVar227);
  auVar163._16_16_ = auVar104;
  auVar163._0_16_ = auVar139;
  auVar123 = vminps_avx(auVar217,auVar163);
  auVar104 = vpmaxsd_avx(auVar30._16_16_,auVar38._16_16_);
  auVar139 = vpmaxsd_avx(auVar93,auVar169);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar197._4_4_ = uVar8;
  auVar197._0_4_ = uVar8;
  auVar197._8_4_ = uVar8;
  auVar197._12_4_ = uVar8;
  auVar197._16_4_ = uVar8;
  auVar197._20_4_ = uVar8;
  auVar197._24_4_ = uVar8;
  auVar197._28_4_ = uVar8;
  auVar125._16_16_ = auVar104;
  auVar125._0_16_ = auVar139;
  auVar29 = vminps_avx(auVar125,auVar197);
  auVar123 = vminps_avx(auVar123,auVar29);
  auVar39._4_4_ = auVar123._4_4_ * 1.0000004;
  auVar39._0_4_ = auVar123._0_4_ * 1.0000004;
  auVar39._8_4_ = auVar123._8_4_ * 1.0000004;
  auVar39._12_4_ = auVar123._12_4_ * 1.0000004;
  auVar39._16_4_ = auVar123._16_4_ * 1.0000004;
  auVar39._20_4_ = auVar123._20_4_ * 1.0000004;
  auVar39._24_4_ = auVar123._24_4_ * 1.0000004;
  auVar39._28_4_ = auVar123._28_4_;
  auVar123 = vcmpps_avx(local_178,auVar39,2);
  auVar104 = vpshufd_avx(ZEXT116((byte)PVar22),0);
  auVar164._16_16_ = auVar104;
  auVar164._0_16_ = auVar104;
  auVar29 = vcvtdq2ps_avx(auVar164);
  auVar29 = vcmpps_avx(_DAT_01faff40,auVar29,1);
  auVar123 = vandps_avx(auVar123,auVar29);
  uVar82 = vmovmskps_avx(auVar123);
  if (uVar82 == 0) {
    uVar84 = 0;
LAB_011349d9:
    return (bool)((byte)uVar84 & 1);
  }
  uVar82 = uVar82 & 0xff;
  auVar126._16_16_ = mm_lookupmask_ps._240_16_;
  auVar126._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_450 = prim;
LAB_01132729:
  lVar90 = 0;
  if (uVar82 != 0) {
    for (; (uVar82 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  uVar83 = *(uint *)(local_450 + 2);
  pGVar23 = (context->scene->geometries).items[uVar83].ptr;
  fVar202 = (pGVar23->time_range).lower;
  fVar202 = pGVar23->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar202) / ((pGVar23->time_range).upper - fVar202));
  auVar104 = vroundss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),9);
  auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar23->fnumTimeSegments + -1.0)));
  auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                           (ulong)*(uint *)(local_450 + lVar90 * 4 + 6) *
                           pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar104._0_4_ * 0x38;
  lVar25 = *(long *)(_Var24 + lVar89);
  lVar26 = *(long *)(_Var24 + 0x10 + lVar89);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar84);
  fVar226 = *pfVar3;
  fVar200 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar201 = pfVar3[3];
  lVar1 = uVar84 + 1;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar1);
  lVar91 = uVar84 + 2;
  pfVar4 = (float *)(lVar25 + lVar26 * lVar91);
  lVar2 = uVar84 + 3;
  pfVar5 = (float *)(lVar25 + lVar26 * lVar2);
  fVar390 = *pfVar5;
  fVar220 = pfVar5[1];
  fVar254 = pfVar5[2];
  fVar334 = pfVar5[3];
  lVar25 = *(long *)&pGVar23[4].fnumTimeSegments;
  lVar26 = *(long *)(lVar25 + lVar89);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar89);
  pfVar5 = (float *)(lVar26 + lVar27 * uVar84);
  fVar222 = *pfVar5;
  fVar255 = pfVar5[1];
  fVar221 = pfVar5[2];
  fVar223 = pfVar5[3];
  pfVar5 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar6 = (float *)(lVar26 + lVar27 * lVar91);
  fVar202 = fVar202 - auVar104._0_4_;
  pfVar7 = (float *)(lVar26 + lVar27 * lVar2);
  fVar256 = *pfVar7;
  fVar224 = pfVar7[1];
  fVar257 = pfVar7[2];
  fVar225 = pfVar7[3];
  fVar277 = *pfVar4 * 0.0;
  fVar278 = pfVar4[1] * 0.0;
  fVar279 = pfVar4[2] * 0.0;
  fVar280 = pfVar4[3] * 0.0;
  fVar258 = fVar277 + fVar390 * 0.0;
  fVar259 = fVar278 + fVar220 * 0.0;
  fVar275 = fVar279 + fVar254 * 0.0;
  fVar276 = fVar280 + fVar334 * 0.0;
  fVar345 = *pfVar3 * 0.0;
  fVar357 = pfVar3[1] * 0.0;
  fVar359 = pfVar3[2] * 0.0;
  fVar361 = pfVar3[3] * 0.0;
  local_5e8._0_4_ = fVar226 + fVar345 + fVar258;
  local_5e8._4_4_ = fVar200 + fVar357 + fVar259;
  fStack_5e0 = fVar219 + fVar359 + fVar275;
  fStack_5dc = fVar201 + fVar361 + fVar276;
  auVar94._0_4_ = *pfVar3 * 3.0 + fVar258;
  auVar94._4_4_ = pfVar3[1] * 3.0 + fVar259;
  auVar94._8_4_ = pfVar3[2] * 3.0 + fVar275;
  auVar94._12_4_ = pfVar3[3] * 3.0 + fVar276;
  auVar170._0_4_ = fVar226 * 3.0;
  auVar170._4_4_ = fVar200 * 3.0;
  auVar170._8_4_ = fVar219 * 3.0;
  auVar170._12_4_ = fVar201 * 3.0;
  auVar156 = vsubps_avx(auVar94,auVar170);
  fVar363 = *pfVar6 * 0.0;
  fVar371 = pfVar6[1] * 0.0;
  fVar372 = pfVar6[2] * 0.0;
  fVar373 = pfVar6[3] * 0.0;
  fVar258 = fVar363 + fVar256 * 0.0;
  fVar259 = fVar371 + fVar224 * 0.0;
  fVar275 = fVar372 + fVar257 * 0.0;
  fVar276 = fVar373 + fVar225 * 0.0;
  fVar378 = *pfVar5 * 0.0;
  fVar386 = pfVar5[1] * 0.0;
  fVar387 = pfVar5[2] * 0.0;
  fVar388 = pfVar5[3] * 0.0;
  auVar391._0_4_ = fVar378 + fVar258 + fVar222;
  auVar391._4_4_ = fVar386 + fVar259 + fVar255;
  auVar391._8_4_ = fVar387 + fVar275 + fVar221;
  auVar391._12_4_ = fVar388 + fVar276 + fVar223;
  auVar95._0_4_ = *pfVar5 * 3.0 + fVar258;
  auVar95._4_4_ = pfVar5[1] * 3.0 + fVar259;
  auVar95._8_4_ = pfVar5[2] * 3.0 + fVar275;
  auVar95._12_4_ = pfVar5[3] * 3.0 + fVar276;
  auVar282._0_4_ = fVar222 * 3.0;
  auVar282._4_4_ = fVar255 * 3.0;
  auVar282._8_4_ = fVar221 * 3.0;
  auVar282._12_4_ = fVar223 * 3.0;
  auVar103 = vsubps_avx(auVar95,auVar282);
  auVar204._0_4_ = fVar226 * 0.0;
  auVar204._4_4_ = fVar200 * 0.0;
  auVar204._8_4_ = fVar219 * 0.0;
  auVar204._12_4_ = fVar201 * 0.0;
  auVar283._0_4_ = auVar204._0_4_ + fVar345 + fVar277 + fVar390;
  auVar283._4_4_ = auVar204._4_4_ + fVar357 + fVar278 + fVar220;
  auVar283._8_4_ = auVar204._8_4_ + fVar359 + fVar279 + fVar254;
  auVar283._12_4_ = auVar204._12_4_ + fVar361 + fVar280 + fVar334;
  auVar291._0_4_ = fVar390 * 3.0;
  auVar291._4_4_ = fVar220 * 3.0;
  auVar291._8_4_ = fVar254 * 3.0;
  auVar291._12_4_ = fVar334 * 3.0;
  auVar228._0_4_ = *pfVar4 * 3.0;
  auVar228._4_4_ = pfVar4[1] * 3.0;
  auVar228._8_4_ = pfVar4[2] * 3.0;
  auVar228._12_4_ = pfVar4[3] * 3.0;
  auVar104 = vsubps_avx(auVar291,auVar228);
  auVar229._0_4_ = fVar345 + auVar104._0_4_;
  auVar229._4_4_ = fVar357 + auVar104._4_4_;
  auVar229._8_4_ = fVar359 + auVar104._8_4_;
  auVar229._12_4_ = fVar361 + auVar104._12_4_;
  auVar145 = vsubps_avx(auVar229,auVar204);
  auVar230._0_4_ = fVar222 * 0.0;
  auVar230._4_4_ = fVar255 * 0.0;
  auVar230._8_4_ = fVar221 * 0.0;
  auVar230._12_4_ = fVar223 * 0.0;
  auVar205._0_4_ = auVar230._0_4_ + fVar378 + fVar363 + fVar256;
  auVar205._4_4_ = auVar230._4_4_ + fVar386 + fVar371 + fVar224;
  auVar205._8_4_ = auVar230._8_4_ + fVar387 + fVar372 + fVar257;
  auVar205._12_4_ = auVar230._12_4_ + fVar388 + fVar373 + fVar225;
  auVar261._0_4_ = fVar256 * 3.0;
  auVar261._4_4_ = fVar224 * 3.0;
  auVar261._8_4_ = fVar257 * 3.0;
  auVar261._12_4_ = fVar225 * 3.0;
  auVar292._0_4_ = *pfVar6 * 3.0;
  auVar292._4_4_ = pfVar6[1] * 3.0;
  auVar292._8_4_ = pfVar6[2] * 3.0;
  auVar292._12_4_ = pfVar6[3] * 3.0;
  auVar104 = vsubps_avx(auVar261,auVar292);
  auVar262._0_4_ = fVar378 + auVar104._0_4_;
  auVar262._4_4_ = fVar386 + auVar104._4_4_;
  auVar262._8_4_ = fVar387 + auVar104._8_4_;
  auVar262._12_4_ = fVar388 + auVar104._12_4_;
  auVar232 = vsubps_avx(auVar262,auVar230);
  auVar104 = vshufps_avx(auVar156,auVar156,0xc9);
  auVar139 = vshufps_avx(auVar391,auVar391,0xc9);
  fVar258 = auVar156._0_4_;
  auVar293._0_4_ = fVar258 * auVar139._0_4_;
  fVar259 = auVar156._4_4_;
  auVar293._4_4_ = fVar259 * auVar139._4_4_;
  fVar275 = auVar156._8_4_;
  auVar293._8_4_ = fVar275 * auVar139._8_4_;
  fVar276 = auVar156._12_4_;
  auVar293._12_4_ = fVar276 * auVar139._12_4_;
  auVar304._0_4_ = auVar391._0_4_ * auVar104._0_4_;
  auVar304._4_4_ = auVar391._4_4_ * auVar104._4_4_;
  auVar304._8_4_ = auVar391._8_4_ * auVar104._8_4_;
  auVar304._12_4_ = auVar391._12_4_ * auVar104._12_4_;
  auVar139 = vsubps_avx(auVar304,auVar293);
  auVar105 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar139 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar305._0_4_ = auVar139._0_4_ * fVar258;
  auVar305._4_4_ = auVar139._4_4_ * fVar259;
  auVar305._8_4_ = auVar139._8_4_ * fVar275;
  auVar305._12_4_ = auVar139._12_4_ * fVar276;
  auVar96._0_4_ = auVar104._0_4_ * auVar103._0_4_;
  auVar96._4_4_ = auVar104._4_4_ * auVar103._4_4_;
  auVar96._8_4_ = auVar104._8_4_ * auVar103._8_4_;
  auVar96._12_4_ = auVar104._12_4_ * auVar103._12_4_;
  auVar104 = vsubps_avx(auVar96,auVar305);
  auVar103 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar104 = vshufps_avx(auVar145,auVar145,0xc9);
  auVar139 = vshufps_avx(auVar205,auVar205,0xc9);
  fVar378 = auVar145._0_4_;
  auVar306._0_4_ = fVar378 * auVar139._0_4_;
  fVar386 = auVar145._4_4_;
  auVar306._4_4_ = fVar386 * auVar139._4_4_;
  fVar387 = auVar145._8_4_;
  auVar306._8_4_ = fVar387 * auVar139._8_4_;
  fVar388 = auVar145._12_4_;
  auVar306._12_4_ = fVar388 * auVar139._12_4_;
  auVar206._0_4_ = auVar104._0_4_ * auVar205._0_4_;
  auVar206._4_4_ = auVar104._4_4_ * auVar205._4_4_;
  auVar206._8_4_ = auVar104._8_4_ * auVar205._8_4_;
  auVar206._12_4_ = auVar104._12_4_ * auVar205._12_4_;
  auVar139 = vsubps_avx(auVar206,auVar306);
  auVar37 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar139 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar307._0_4_ = fVar378 * auVar139._0_4_;
  auVar307._4_4_ = fVar386 * auVar139._4_4_;
  auVar307._8_4_ = fVar387 * auVar139._8_4_;
  auVar307._12_4_ = fVar388 * auVar139._12_4_;
  auVar231._0_4_ = auVar104._0_4_ * auVar232._0_4_;
  auVar231._4_4_ = auVar104._4_4_ * auVar232._4_4_;
  auVar231._8_4_ = auVar104._8_4_ * auVar232._8_4_;
  auVar231._12_4_ = auVar104._12_4_ * auVar232._12_4_;
  auVar183 = vsubps_avx(auVar231,auVar307);
  auVar104 = vdpps_avx(auVar105,auVar105,0x7f);
  fVar200 = auVar104._0_4_;
  auVar290 = ZEXT416((uint)fVar200);
  auVar139 = vrsqrtss_avx(auVar290,auVar290);
  fVar226 = auVar139._0_4_;
  auVar139 = vdpps_avx(auVar105,auVar103,0x7f);
  auVar232 = ZEXT416((uint)(fVar226 * 1.5 - fVar200 * 0.5 * fVar226 * fVar226 * fVar226));
  auVar232 = vshufps_avx(auVar232,auVar232,0);
  fVar256 = auVar232._0_4_ * auVar105._0_4_;
  fVar224 = auVar232._4_4_ * auVar105._4_4_;
  fVar257 = auVar232._8_4_ * auVar105._8_4_;
  fVar225 = auVar232._12_4_ * auVar105._12_4_;
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar97._0_4_ = auVar104._0_4_ * auVar103._0_4_;
  auVar97._4_4_ = auVar104._4_4_ * auVar103._4_4_;
  auVar97._8_4_ = auVar104._8_4_ * auVar103._8_4_;
  auVar97._12_4_ = auVar104._12_4_ * auVar103._12_4_;
  auVar104 = vshufps_avx(auVar139,auVar139,0);
  auVar294._0_4_ = auVar104._0_4_ * auVar105._0_4_;
  auVar294._4_4_ = auVar104._4_4_ * auVar105._4_4_;
  auVar294._8_4_ = auVar104._8_4_ * auVar105._8_4_;
  auVar294._12_4_ = auVar104._12_4_ * auVar105._12_4_;
  auVar146 = vsubps_avx(auVar97,auVar294);
  auVar104 = vrcpss_avx(auVar290,auVar290);
  auVar104 = ZEXT416((uint)((2.0 - fVar200 * auVar104._0_4_) * auVar104._0_4_));
  auVar105 = vshufps_avx(auVar104,auVar104,0);
  auVar104 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar277 = auVar104._0_4_;
  auVar103 = ZEXT416((uint)fVar277);
  auVar139 = vrsqrtss_avx(auVar103,auVar103);
  fVar222 = auVar139._0_4_;
  lVar26 = *(long *)(_Var24 + 0x38 + lVar89);
  lVar27 = *(long *)(_Var24 + 0x48 + lVar89);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar84);
  fVar226 = *pfVar3;
  fVar200 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar201 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar4 = (float *)(lVar26 + lVar27 * lVar91);
  auVar139 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar379._0_4_ = auVar104._0_4_ * auVar139._0_4_;
  auVar379._4_4_ = auVar104._4_4_ * auVar139._4_4_;
  auVar379._8_4_ = auVar104._8_4_ * auVar139._8_4_;
  auVar379._12_4_ = auVar104._12_4_ * auVar139._12_4_;
  auVar104 = vdpps_avx(auVar37,auVar139,0x7f);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar98._0_4_ = auVar37._0_4_ * auVar104._0_4_;
  auVar98._4_4_ = auVar37._4_4_ * auVar104._4_4_;
  auVar98._8_4_ = auVar37._8_4_ * auVar104._8_4_;
  auVar98._12_4_ = auVar37._12_4_ * auVar104._12_4_;
  auVar183 = vsubps_avx(auVar379,auVar98);
  pfVar5 = (float *)(lVar26 + lVar27 * lVar2);
  fVar390 = *pfVar5;
  fVar220 = pfVar5[1];
  fVar254 = pfVar5[2];
  fVar334 = pfVar5[3];
  auVar104 = ZEXT416((uint)(fVar222 * 1.5 - fVar222 * fVar222 * fVar222 * fVar277 * 0.5));
  auVar139 = vshufps_avx(auVar104,auVar104,0);
  fVar222 = auVar37._0_4_ * auVar139._0_4_;
  fVar255 = auVar37._4_4_ * auVar139._4_4_;
  fVar221 = auVar37._8_4_ * auVar139._8_4_;
  fVar223 = auVar37._12_4_ * auVar139._12_4_;
  auVar104 = vrcpss_avx(auVar103,auVar103);
  auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar277 * auVar104._0_4_)));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar103 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar392._0_4_ = auVar103._0_4_ * fVar256;
  auVar392._4_4_ = auVar103._4_4_ * fVar224;
  auVar392._8_4_ = auVar103._8_4_ * fVar257;
  auVar392._12_4_ = auVar103._12_4_ * fVar225;
  auVar37 = vshufps_avx(auVar156,auVar156,0xff);
  auVar290 = vsubps_avx(_local_5e8,auVar392);
  auVar295._0_4_ =
       auVar37._0_4_ * fVar256 + auVar103._0_4_ * auVar232._0_4_ * auVar146._0_4_ * auVar105._0_4_;
  auVar295._4_4_ =
       auVar37._4_4_ * fVar224 + auVar103._4_4_ * auVar232._4_4_ * auVar146._4_4_ * auVar105._4_4_;
  auVar295._8_4_ =
       auVar37._8_4_ * fVar257 + auVar103._8_4_ * auVar232._8_4_ * auVar146._8_4_ * auVar105._8_4_;
  auVar295._12_4_ =
       auVar37._12_4_ * fVar225 +
       auVar103._12_4_ * auVar232._12_4_ * auVar146._12_4_ * auVar105._12_4_;
  auVar156 = vsubps_avx(auVar156,auVar295);
  local_5e8._0_4_ = (float)local_5e8._0_4_ + auVar392._0_4_;
  local_5e8._4_4_ = (float)local_5e8._4_4_ + auVar392._4_4_;
  fStack_5e0 = fStack_5e0 + auVar392._8_4_;
  fStack_5dc = fStack_5dc + auVar392._12_4_;
  auVar105 = vshufps_avx(auVar283,auVar283,0xff);
  auVar171._0_4_ = auVar105._0_4_ * fVar222;
  auVar171._4_4_ = auVar105._4_4_ * fVar255;
  auVar171._8_4_ = auVar105._8_4_ * fVar221;
  auVar171._12_4_ = auVar105._12_4_ * fVar223;
  auVar103 = vshufps_avx(auVar145,auVar145,0xff);
  auVar146 = vsubps_avx(auVar283,auVar171);
  auVar99._0_4_ =
       auVar103._0_4_ * fVar222 + auVar105._0_4_ * auVar139._0_4_ * auVar104._0_4_ * auVar183._0_4_;
  auVar99._4_4_ =
       auVar103._4_4_ * fVar255 + auVar105._4_4_ * auVar139._4_4_ * auVar104._4_4_ * auVar183._4_4_;
  auVar99._8_4_ =
       auVar103._8_4_ * fVar221 + auVar105._8_4_ * auVar139._8_4_ * auVar104._8_4_ * auVar183._8_4_;
  auVar99._12_4_ =
       auVar103._12_4_ * fVar223 +
       auVar105._12_4_ * auVar139._12_4_ * auVar104._12_4_ * auVar183._12_4_;
  auVar145 = vsubps_avx(auVar145,auVar99);
  local_558._4_4_ = auVar283._4_4_ + auVar171._4_4_;
  local_558._0_4_ = auVar283._0_4_ + auVar171._0_4_;
  fStack_550 = auVar283._8_4_ + auVar171._8_4_;
  fStack_54c = auVar283._12_4_ + auVar171._12_4_;
  fVar345 = *pfVar4 * 0.0;
  fVar357 = pfVar4[1] * 0.0;
  fVar359 = pfVar4[2] * 0.0;
  fVar361 = pfVar4[3] * 0.0;
  fVar399 = fVar345 + fVar390 * 0.0;
  fVar400 = fVar357 + fVar220 * 0.0;
  fVar401 = fVar359 + fVar254 * 0.0;
  fVar403 = fVar361 + fVar334 * 0.0;
  auVar100._0_4_ = fVar399 + *pfVar3 * 3.0;
  auVar100._4_4_ = fVar400 + pfVar3[1] * 3.0;
  auVar100._8_4_ = fVar401 + pfVar3[2] * 3.0;
  auVar100._12_4_ = fVar403 + pfVar3[3] * 3.0;
  auVar172._0_4_ = fVar226 * 3.0;
  auVar172._4_4_ = fVar200 * 3.0;
  auVar172._8_4_ = fVar219 * 3.0;
  auVar172._12_4_ = fVar201 * 3.0;
  auVar183 = vsubps_avx(auVar100,auVar172);
  lVar26 = *(long *)(lVar25 + 0x38 + lVar89);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar89);
  auVar104 = *(undefined1 (*) [16])(lVar26 + lVar91 * lVar25);
  pfVar5 = (float *)(lVar26 + lVar25 * lVar2);
  fVar222 = *pfVar5;
  fVar255 = pfVar5[1];
  fVar221 = pfVar5[2];
  fVar223 = pfVar5[3];
  fVar277 = auVar104._0_4_ * 0.0;
  fVar278 = auVar104._4_4_ * 0.0;
  fVar279 = auVar104._8_4_ * 0.0;
  fVar280 = auVar104._12_4_ * 0.0;
  fVar363 = fVar277 + fVar222 * 0.0;
  fVar371 = fVar278 + fVar255 * 0.0;
  fVar372 = fVar279 + fVar221 * 0.0;
  fVar373 = fVar280 + fVar223 * 0.0;
  pfVar5 = (float *)(lVar26 + lVar1 * lVar25);
  auVar393._0_4_ = *pfVar5 * 3.0 + fVar363;
  auVar393._4_4_ = pfVar5[1] * 3.0 + fVar371;
  auVar393._8_4_ = pfVar5[2] * 3.0 + fVar372;
  auVar393._12_4_ = pfVar5[3] * 3.0 + fVar373;
  pfVar6 = (float *)(lVar26 + uVar84 * lVar25);
  fVar256 = *pfVar6;
  fVar224 = pfVar6[1];
  fVar257 = pfVar6[2];
  fVar225 = pfVar6[3];
  auVar308._0_4_ = fVar256 * 3.0;
  auVar308._4_4_ = fVar224 * 3.0;
  auVar308._8_4_ = fVar257 * 3.0;
  auVar308._12_4_ = fVar225 * 3.0;
  auVar139 = vsubps_avx(auVar393,auVar308);
  auVar309._0_4_ = fVar390 * 3.0;
  auVar309._4_4_ = fVar220 * 3.0;
  auVar309._8_4_ = fVar254 * 3.0;
  auVar309._12_4_ = fVar334 * 3.0;
  auVar364._0_4_ = *pfVar4 * 3.0;
  auVar364._4_4_ = pfVar4[1] * 3.0;
  auVar364._8_4_ = pfVar4[2] * 3.0;
  auVar364._12_4_ = pfVar4[3] * 3.0;
  auVar105 = vsubps_avx(auVar309,auVar364);
  fVar346 = *pfVar3 * 0.0;
  fVar358 = pfVar3[1] * 0.0;
  fVar360 = pfVar3[2] * 0.0;
  fVar362 = pfVar3[3] * 0.0;
  auVar310._0_4_ = fVar346 + auVar105._0_4_;
  auVar310._4_4_ = fVar358 + auVar105._4_4_;
  auVar310._8_4_ = fVar360 + auVar105._8_4_;
  auVar310._12_4_ = fVar362 + auVar105._12_4_;
  auVar365._0_4_ = fVar226 + fVar346 + fVar399;
  auVar365._4_4_ = fVar200 + fVar358 + fVar400;
  auVar365._8_4_ = fVar219 + fVar360 + fVar401;
  auVar365._12_4_ = fVar201 + fVar362 + fVar403;
  auVar335._0_4_ = fVar226 * 0.0;
  auVar335._4_4_ = fVar200 * 0.0;
  auVar335._8_4_ = fVar219 * 0.0;
  auVar335._12_4_ = fVar201 * 0.0;
  local_608._0_4_ = auVar335._0_4_ + fVar346 + fVar390 + fVar345;
  local_608._4_4_ = auVar335._4_4_ + fVar358 + fVar220 + fVar357;
  fStack_600 = auVar335._8_4_ + fVar360 + fVar254 + fVar359;
  fStack_5fc = auVar335._12_4_ + fVar362 + fVar334 + fVar361;
  auVar10 = vsubps_avx(auVar310,auVar335);
  auVar135._0_4_ = fVar222 * 3.0;
  auVar135._4_4_ = fVar255 * 3.0;
  auVar135._8_4_ = fVar221 * 3.0;
  auVar135._12_4_ = fVar223 * 3.0;
  auVar233._0_4_ = auVar104._0_4_ * 3.0;
  auVar233._4_4_ = auVar104._4_4_ * 3.0;
  auVar233._8_4_ = auVar104._8_4_ * 3.0;
  auVar233._12_4_ = auVar104._12_4_ * 3.0;
  auVar104 = vsubps_avx(auVar135,auVar233);
  fVar226 = *pfVar5 * 0.0;
  fVar200 = pfVar5[1] * 0.0;
  fVar219 = pfVar5[2] * 0.0;
  fVar201 = pfVar5[3] * 0.0;
  auVar136._0_4_ = fVar226 + auVar104._0_4_;
  auVar136._4_4_ = fVar200 + auVar104._4_4_;
  auVar136._8_4_ = fVar219 + auVar104._8_4_;
  auVar136._12_4_ = fVar201 + auVar104._12_4_;
  auVar173._0_4_ = fVar256 + fVar226 + fVar363;
  auVar173._4_4_ = fVar224 + fVar200 + fVar371;
  auVar173._8_4_ = fVar257 + fVar219 + fVar372;
  auVar173._12_4_ = fVar225 + fVar201 + fVar373;
  auVar101._0_4_ = fVar256 * 0.0;
  auVar101._4_4_ = fVar224 * 0.0;
  auVar101._8_4_ = fVar257 * 0.0;
  auVar101._12_4_ = fVar225 * 0.0;
  auVar207._0_4_ = auVar101._0_4_ + fVar226 + fVar277 + fVar222;
  auVar207._4_4_ = auVar101._4_4_ + fVar200 + fVar278 + fVar255;
  auVar207._8_4_ = auVar101._8_4_ + fVar219 + fVar279 + fVar221;
  auVar207._12_4_ = auVar101._12_4_ + fVar201 + fVar280 + fVar223;
  auVar103 = vsubps_avx(auVar136,auVar101);
  auVar104 = vshufps_avx(auVar173,auVar173,0xc9);
  fVar334 = auVar183._0_4_;
  auVar137._0_4_ = fVar334 * auVar104._0_4_;
  fVar222 = auVar183._4_4_;
  auVar137._4_4_ = fVar222 * auVar104._4_4_;
  fVar255 = auVar183._8_4_;
  auVar137._8_4_ = fVar255 * auVar104._8_4_;
  fVar221 = auVar183._12_4_;
  auVar137._12_4_ = fVar221 * auVar104._12_4_;
  auVar104 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar174._0_4_ = auVar104._0_4_ * auVar173._0_4_;
  auVar174._4_4_ = auVar104._4_4_ * auVar173._4_4_;
  auVar174._8_4_ = auVar104._8_4_ * auVar173._8_4_;
  auVar174._12_4_ = auVar104._12_4_ * auVar173._12_4_;
  auVar105 = vsubps_avx(auVar174,auVar137);
  auVar175._0_4_ = auVar139._0_4_ * auVar104._0_4_;
  auVar175._4_4_ = auVar139._4_4_ * auVar104._4_4_;
  auVar175._8_4_ = auVar139._8_4_ * auVar104._8_4_;
  auVar175._12_4_ = auVar139._12_4_ * auVar104._12_4_;
  auVar104 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar234._0_4_ = fVar334 * auVar104._0_4_;
  auVar234._4_4_ = fVar222 * auVar104._4_4_;
  auVar234._8_4_ = fVar255 * auVar104._8_4_;
  auVar234._12_4_ = fVar221 * auVar104._12_4_;
  auVar37 = vsubps_avx(auVar175,auVar234);
  auVar104 = vshufps_avx(auVar207,auVar207,0xc9);
  fVar223 = auVar10._0_4_;
  auVar235._0_4_ = fVar223 * auVar104._0_4_;
  fVar256 = auVar10._4_4_;
  auVar235._4_4_ = fVar256 * auVar104._4_4_;
  fVar224 = auVar10._8_4_;
  auVar235._8_4_ = fVar224 * auVar104._8_4_;
  fVar257 = auVar10._12_4_;
  auVar235._12_4_ = fVar257 * auVar104._12_4_;
  auVar104 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar208._0_4_ = auVar104._0_4_ * auVar207._0_4_;
  auVar208._4_4_ = auVar104._4_4_ * auVar207._4_4_;
  auVar208._8_4_ = auVar104._8_4_ * auVar207._8_4_;
  auVar208._12_4_ = auVar104._12_4_ * auVar207._12_4_;
  auVar232 = vsubps_avx(auVar208,auVar235);
  auVar105 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar138._0_4_ = auVar104._0_4_ * auVar103._0_4_;
  auVar138._4_4_ = auVar104._4_4_ * auVar103._4_4_;
  auVar138._8_4_ = auVar104._8_4_ * auVar103._8_4_;
  auVar138._12_4_ = auVar104._12_4_ * auVar103._12_4_;
  auVar104 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar102._0_4_ = fVar223 * auVar104._0_4_;
  auVar102._4_4_ = fVar256 * auVar104._4_4_;
  auVar102._8_4_ = fVar224 * auVar104._8_4_;
  auVar102._12_4_ = fVar257 * auVar104._12_4_;
  auVar104 = vdpps_avx(auVar105,auVar105,0x7f);
  auVar11 = vsubps_avx(auVar138,auVar102);
  fVar200 = auVar104._0_4_;
  auVar103 = ZEXT416((uint)fVar200);
  auVar139 = vrsqrtss_avx(auVar103,auVar103);
  fVar226 = auVar139._0_4_;
  auVar139 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar236._0_4_ = auVar104._0_4_ * auVar139._0_4_;
  auVar236._4_4_ = auVar104._4_4_ * auVar139._4_4_;
  auVar236._8_4_ = auVar104._8_4_ * auVar139._8_4_;
  auVar236._12_4_ = auVar104._12_4_ * auVar139._12_4_;
  auVar104 = vdpps_avx(auVar105,auVar139,0x7f);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar176._0_4_ = auVar105._0_4_ * auVar104._0_4_;
  auVar176._4_4_ = auVar105._4_4_ * auVar104._4_4_;
  auVar176._8_4_ = auVar105._8_4_ * auVar104._8_4_;
  auVar176._12_4_ = auVar105._12_4_ * auVar104._12_4_;
  auVar337 = vsubps_avx(auVar236,auVar176);
  auVar104 = vrcpss_avx(auVar103,auVar103);
  auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar200 * auVar104._0_4_)));
  auVar103 = vshufps_avx(auVar104,auVar104,0);
  auVar37 = vshufps_avx(auVar232,auVar232,0xc9);
  auVar104 = ZEXT416((uint)(fVar226 * 1.5 - fVar200 * 0.5 * fVar226 * fVar226 * fVar226));
  auVar232 = vshufps_avx(auVar104,auVar104,0);
  fVar390 = auVar105._0_4_ * auVar232._0_4_;
  fVar220 = auVar105._4_4_ * auVar232._4_4_;
  fVar254 = auVar105._8_4_ * auVar232._8_4_;
  fVar225 = auVar105._12_4_ * auVar232._12_4_;
  auVar104 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar200 = auVar104._0_4_;
  auVar105 = ZEXT416((uint)fVar200);
  auVar139 = vrsqrtss_avx(auVar105,auVar105);
  fVar226 = auVar139._0_4_;
  auVar139 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar263._0_4_ = auVar104._0_4_ * auVar139._0_4_;
  auVar263._4_4_ = auVar104._4_4_ * auVar139._4_4_;
  auVar263._8_4_ = auVar104._8_4_ * auVar139._8_4_;
  auVar263._12_4_ = auVar104._12_4_ * auVar139._12_4_;
  auVar104 = vdpps_avx(auVar37,auVar139,0x7f);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar237._0_4_ = auVar37._0_4_ * auVar104._0_4_;
  auVar237._4_4_ = auVar37._4_4_ * auVar104._4_4_;
  auVar237._8_4_ = auVar37._8_4_ * auVar104._8_4_;
  auVar237._12_4_ = auVar37._12_4_ * auVar104._12_4_;
  auVar11 = vsubps_avx(auVar263,auVar237);
  auVar104 = vrcpss_avx(auVar105,auVar105);
  auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar200 * auVar104._0_4_)));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar139 = ZEXT416((uint)(fVar226 * 1.5 - fVar200 * 0.5 * fVar226 * fVar226 * fVar226));
  auVar139 = vshufps_avx(auVar139,auVar139,0);
  fVar226 = auVar37._0_4_ * auVar139._0_4_;
  fVar200 = auVar37._4_4_ * auVar139._4_4_;
  fVar219 = auVar37._8_4_ * auVar139._8_4_;
  fVar201 = auVar37._12_4_ * auVar139._12_4_;
  auVar105 = vshufps_avx(auVar183,auVar183,0xff);
  auVar37 = vshufps_avx(auVar365,auVar365,0xff);
  auVar238._0_4_ = fVar390 * auVar37._0_4_;
  auVar238._4_4_ = fVar220 * auVar37._4_4_;
  auVar238._8_4_ = fVar254 * auVar37._8_4_;
  auVar238._12_4_ = fVar225 * auVar37._12_4_;
  auVar140._0_4_ =
       fVar390 * auVar105._0_4_ + auVar232._0_4_ * auVar337._0_4_ * auVar103._0_4_ * auVar37._0_4_;
  auVar140._4_4_ =
       fVar220 * auVar105._4_4_ + auVar232._4_4_ * auVar337._4_4_ * auVar103._4_4_ * auVar37._4_4_;
  auVar140._8_4_ =
       fVar254 * auVar105._8_4_ + auVar232._8_4_ * auVar337._8_4_ * auVar103._8_4_ * auVar37._8_4_;
  auVar140._12_4_ =
       fVar225 * auVar105._12_4_ +
       auVar232._12_4_ * auVar337._12_4_ * auVar103._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar365,auVar238);
  auVar232 = vsubps_avx(auVar183,auVar140);
  auVar105 = vshufps_avx(auVar10,auVar10,0xff);
  auVar103 = vshufps_avx(_local_608,_local_608,0xff);
  auVar177._0_4_ = auVar103._0_4_ * fVar226;
  auVar177._4_4_ = auVar103._4_4_ * fVar200;
  auVar177._8_4_ = auVar103._8_4_ * fVar219;
  auVar177._12_4_ = auVar103._12_4_ * fVar201;
  auVar106._0_4_ =
       auVar105._0_4_ * fVar226 + auVar103._0_4_ * auVar139._0_4_ * auVar11._0_4_ * auVar104._0_4_;
  auVar106._4_4_ =
       auVar105._4_4_ * fVar200 + auVar103._4_4_ * auVar139._4_4_ * auVar11._4_4_ * auVar104._4_4_;
  auVar106._8_4_ =
       auVar105._8_4_ * fVar219 + auVar103._8_4_ * auVar139._8_4_ * auVar11._8_4_ * auVar104._8_4_;
  auVar106._12_4_ =
       auVar105._12_4_ * fVar201 +
       auVar103._12_4_ * auVar139._12_4_ * auVar11._12_4_ * auVar104._12_4_;
  auVar105 = vsubps_avx(_local_608,auVar177);
  auVar380._0_4_ = (float)local_608._0_4_ + auVar177._0_4_;
  auVar380._4_4_ = (float)local_608._4_4_ + auVar177._4_4_;
  auVar380._8_4_ = fStack_600 + auVar177._8_4_;
  auVar380._12_4_ = fStack_5fc + auVar177._12_4_;
  auVar103 = vsubps_avx(auVar10,auVar106);
  local_548 = auVar156._0_4_;
  fStack_544 = auVar156._4_4_;
  fStack_540 = auVar156._8_4_;
  fStack_53c = auVar156._12_4_;
  local_488 = auVar290._0_4_;
  fStack_484 = auVar290._4_4_;
  fStack_480 = auVar290._8_4_;
  fStack_47c = auVar290._12_4_;
  auVar104 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
  auVar139 = vshufps_avx(ZEXT416((uint)(1.0 - fVar202)),ZEXT416((uint)(1.0 - fVar202)),0);
  fVar201 = auVar104._0_4_;
  fVar390 = auVar104._4_4_;
  fVar220 = auVar104._8_4_;
  fVar254 = auVar104._12_4_;
  fVar202 = auVar139._0_4_;
  fVar226 = auVar139._4_4_;
  fVar200 = auVar139._8_4_;
  fVar219 = auVar139._12_4_;
  local_408._0_4_ = fVar202 * local_488 + fVar201 * auVar37._0_4_;
  local_408._4_4_ = fVar226 * fStack_484 + fVar390 * auVar37._4_4_;
  fStack_400 = fVar200 * fStack_480 + fVar220 * auVar37._8_4_;
  fStack_3fc = fVar219 * fStack_47c + fVar254 * auVar37._12_4_;
  fVar277 = fVar202 * (local_488 + local_548 * 0.33333334) +
            fVar201 * (auVar37._0_4_ + auVar232._0_4_ * 0.33333334);
  fVar278 = fVar226 * (fStack_484 + fStack_544 * 0.33333334) +
            fVar390 * (auVar37._4_4_ + auVar232._4_4_ * 0.33333334);
  fVar279 = fVar200 * (fStack_480 + fStack_540 * 0.33333334) +
            fVar220 * (auVar37._8_4_ + auVar232._8_4_ * 0.33333334);
  fVar280 = fVar219 * (fStack_47c + fStack_53c * 0.33333334) +
            fVar254 * (auVar37._12_4_ + auVar232._12_4_ * 0.33333334);
  local_598 = auVar145._0_4_;
  fStack_594 = auVar145._4_4_;
  fStack_590 = auVar145._8_4_;
  fStack_58c = auVar145._12_4_;
  auVar209._0_4_ = local_598 * 0.33333334;
  auVar209._4_4_ = fStack_594 * 0.33333334;
  auVar209._8_4_ = fStack_590 * 0.33333334;
  auVar209._12_4_ = fStack_58c * 0.33333334;
  auVar104 = vsubps_avx(auVar146,auVar209);
  auVar264._0_4_ = (fVar378 + auVar99._0_4_) * 0.33333334;
  auVar264._4_4_ = (fVar386 + auVar99._4_4_) * 0.33333334;
  auVar264._8_4_ = (fVar387 + auVar99._8_4_) * 0.33333334;
  auVar264._12_4_ = (fVar388 + auVar99._12_4_) * 0.33333334;
  auVar139 = vsubps_avx(_local_558,auVar264);
  auVar178._0_4_ = auVar103._0_4_ * 0.33333334;
  auVar178._4_4_ = auVar103._4_4_ * 0.33333334;
  auVar178._8_4_ = auVar103._8_4_ * 0.33333334;
  auVar178._12_4_ = auVar103._12_4_ * 0.33333334;
  auVar103 = vsubps_avx(auVar105,auVar178);
  auVar141._0_4_ = (fVar223 + auVar106._0_4_) * 0.33333334;
  auVar141._4_4_ = (fVar256 + auVar106._4_4_) * 0.33333334;
  auVar141._8_4_ = (fVar224 + auVar106._8_4_) * 0.33333334;
  auVar141._12_4_ = (fVar257 + auVar106._12_4_) * 0.33333334;
  auVar37 = vsubps_avx(auVar380,auVar141);
  local_418._0_4_ = fVar202 * auVar104._0_4_ + fVar201 * auVar103._0_4_;
  local_418._4_4_ = fVar226 * auVar104._4_4_ + fVar390 * auVar103._4_4_;
  fStack_410 = fVar200 * auVar104._8_4_ + fVar220 * auVar103._8_4_;
  fStack_40c = fVar219 * auVar104._12_4_ + fVar254 * auVar103._12_4_;
  local_428._0_4_ = fVar201 * auVar105._0_4_ + auVar146._0_4_ * fVar202;
  local_428._4_4_ = fVar390 * auVar105._4_4_ + auVar146._4_4_ * fVar226;
  fStack_420 = fVar220 * auVar105._8_4_ + auVar146._8_4_ * fVar200;
  fStack_41c = fVar254 * auVar105._12_4_ + auVar146._12_4_ * fVar219;
  local_438._0_4_ = fVar202 * (float)local_5e8._0_4_ + fVar201 * (auVar365._0_4_ + auVar238._0_4_);
  local_438._4_4_ = fVar226 * (float)local_5e8._4_4_ + fVar390 * (auVar365._4_4_ + auVar238._4_4_);
  fStack_430 = fVar200 * fStack_5e0 + fVar220 * (auVar365._8_4_ + auVar238._8_4_);
  fStack_42c = fVar219 * fStack_5dc + fVar254 * (auVar365._12_4_ + auVar238._12_4_);
  local_448._0_4_ =
       fVar202 * ((float)local_5e8._0_4_ + (fVar258 + auVar295._0_4_) * 0.33333334) +
       fVar201 * (auVar365._0_4_ + auVar238._0_4_ + (fVar334 + auVar140._0_4_) * 0.33333334);
  local_448._4_4_ =
       fVar226 * ((float)local_5e8._4_4_ + (fVar259 + auVar295._4_4_) * 0.33333334) +
       fVar390 * (auVar365._4_4_ + auVar238._4_4_ + (fVar222 + auVar140._4_4_) * 0.33333334);
  fStack_440 = fVar200 * (fStack_5e0 + (fVar275 + auVar295._8_4_) * 0.33333334) +
               fVar220 * (auVar365._8_4_ + auVar238._8_4_ + (fVar255 + auVar140._8_4_) * 0.33333334)
  ;
  fStack_43c = fVar219 * (fStack_5dc + (fVar276 + auVar295._12_4_) * 0.33333334) +
               fVar254 * (auVar365._12_4_ + auVar238._12_4_ +
                         (fVar221 + auVar140._12_4_) * 0.33333334);
  local_318._0_4_ = fVar202 * auVar139._0_4_ + fVar201 * auVar37._0_4_;
  local_318._4_4_ = fVar226 * auVar139._4_4_ + fVar390 * auVar37._4_4_;
  fStack_310 = fVar200 * auVar139._8_4_ + fVar220 * auVar37._8_4_;
  fStack_30c = fVar219 * auVar139._12_4_ + fVar254 * auVar37._12_4_;
  fVar223 = (auVar283._0_4_ + auVar171._0_4_) * fVar202 + fVar201 * auVar380._0_4_;
  fVar224 = (auVar283._4_4_ + auVar171._4_4_) * fVar226 + fVar390 * auVar380._4_4_;
  fVar225 = (auVar283._8_4_ + auVar171._8_4_) * fVar200 + fVar220 * auVar380._8_4_;
  fVar258 = (auVar283._12_4_ + auVar171._12_4_) * fVar219 + fVar254 * auVar380._12_4_;
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_288 = vsubps_avx(_local_408,auVar104);
  auVar105 = vmovsldup_avx(local_288);
  auVar139 = vmovshdup_avx(local_288);
  auVar103 = vshufps_avx(local_288,local_288,0xaa);
  fVar202 = pre->ray_space[k].vx.field_0.m128[0];
  fVar226 = pre->ray_space[k].vx.field_0.m128[1];
  fVar200 = pre->ray_space[k].vx.field_0.m128[2];
  fVar219 = pre->ray_space[k].vx.field_0.m128[3];
  fVar201 = pre->ray_space[k].vy.field_0.m128[0];
  fVar390 = pre->ray_space[k].vy.field_0.m128[1];
  fVar220 = pre->ray_space[k].vy.field_0.m128[2];
  fVar254 = pre->ray_space[k].vy.field_0.m128[3];
  fVar334 = pre->ray_space[k].vz.field_0.m128[0];
  fVar222 = pre->ray_space[k].vz.field_0.m128[1];
  fVar255 = pre->ray_space[k].vz.field_0.m128[2];
  fVar221 = pre->ray_space[k].vz.field_0.m128[3];
  local_5f8._0_4_ = fVar202 * auVar105._0_4_ + fVar201 * auVar139._0_4_ + fVar334 * auVar103._0_4_;
  local_5f8._4_4_ = fVar226 * auVar105._4_4_ + fVar390 * auVar139._4_4_ + fVar222 * auVar103._4_4_;
  fStack_5f0 = fVar200 * auVar105._8_4_ + fVar220 * auVar139._8_4_ + fVar255 * auVar103._8_4_;
  fStack_5ec = fVar219 * auVar105._12_4_ + fVar254 * auVar139._12_4_ + fVar221 * auVar103._12_4_;
  auVar80._4_4_ = fVar278;
  auVar80._0_4_ = fVar277;
  auVar80._8_4_ = fVar279;
  auVar80._12_4_ = fVar280;
  local_298 = vsubps_avx(auVar80,auVar104);
  auVar103 = vshufps_avx(local_298,local_298,0xaa);
  auVar139 = vmovshdup_avx(local_298);
  auVar105 = vmovsldup_avx(local_298);
  fVar256 = fVar202 * auVar105._0_4_ + fVar201 * auVar139._0_4_ + fVar334 * auVar103._0_4_;
  fVar257 = fVar226 * auVar105._4_4_ + fVar390 * auVar139._4_4_ + fVar222 * auVar103._4_4_;
  local_5e8._4_4_ = fVar257;
  local_5e8._0_4_ = fVar256;
  fStack_5e0 = fVar200 * auVar105._8_4_ + fVar220 * auVar139._8_4_ + fVar255 * auVar103._8_4_;
  fStack_5dc = fVar219 * auVar105._12_4_ + fVar254 * auVar139._12_4_ + fVar221 * auVar103._12_4_;
  local_2a8 = vsubps_avx(_local_418,auVar104);
  auVar103 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar139 = vmovshdup_avx(local_2a8);
  auVar105 = vmovsldup_avx(local_2a8);
  auVar210._0_4_ = fVar202 * auVar105._0_4_ + fVar201 * auVar139._0_4_ + fVar334 * auVar103._0_4_;
  auVar210._4_4_ = fVar226 * auVar105._4_4_ + fVar390 * auVar139._4_4_ + fVar222 * auVar103._4_4_;
  auVar210._8_4_ = fVar200 * auVar105._8_4_ + fVar220 * auVar139._8_4_ + fVar255 * auVar103._8_4_;
  auVar210._12_4_ =
       fVar219 * auVar105._12_4_ + fVar254 * auVar139._12_4_ + fVar221 * auVar103._12_4_;
  local_2b8 = vsubps_avx(_local_428,auVar104);
  auVar103 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar139 = vmovshdup_avx(local_2b8);
  auVar105 = vmovsldup_avx(local_2b8);
  auVar142._0_4_ = auVar105._0_4_ * fVar202 + auVar139._0_4_ * fVar201 + fVar334 * auVar103._0_4_;
  auVar142._4_4_ = auVar105._4_4_ * fVar226 + auVar139._4_4_ * fVar390 + fVar222 * auVar103._4_4_;
  auVar142._8_4_ = auVar105._8_4_ * fVar200 + auVar139._8_4_ * fVar220 + fVar255 * auVar103._8_4_;
  auVar142._12_4_ =
       auVar105._12_4_ * fVar219 + auVar139._12_4_ * fVar254 + fVar221 * auVar103._12_4_;
  local_2c8 = vsubps_avx(_local_438,auVar104);
  auVar103 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar139 = vmovshdup_avx(local_2c8);
  auVar105 = vmovsldup_avx(local_2c8);
  auVar311._0_4_ = auVar105._0_4_ * fVar202 + auVar139._0_4_ * fVar201 + auVar103._0_4_ * fVar334;
  auVar311._4_4_ = auVar105._4_4_ * fVar226 + auVar139._4_4_ * fVar390 + auVar103._4_4_ * fVar222;
  auVar311._8_4_ = auVar105._8_4_ * fVar200 + auVar139._8_4_ * fVar220 + auVar103._8_4_ * fVar255;
  auVar311._12_4_ =
       auVar105._12_4_ * fVar219 + auVar139._12_4_ * fVar254 + auVar103._12_4_ * fVar221;
  local_2d8 = vsubps_avx(_local_448,auVar104);
  auVar103 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar139 = vmovshdup_avx(local_2d8);
  auVar105 = vmovsldup_avx(local_2d8);
  auVar321._0_4_ = auVar105._0_4_ * fVar202 + auVar139._0_4_ * fVar201 + auVar103._0_4_ * fVar334;
  auVar321._4_4_ = auVar105._4_4_ * fVar226 + auVar139._4_4_ * fVar390 + auVar103._4_4_ * fVar222;
  auVar321._8_4_ = auVar105._8_4_ * fVar200 + auVar139._8_4_ * fVar220 + auVar103._8_4_ * fVar255;
  auVar321._12_4_ =
       auVar105._12_4_ * fVar219 + auVar139._12_4_ * fVar254 + auVar103._12_4_ * fVar221;
  local_2e8 = vsubps_avx(_local_318,auVar104);
  auVar103 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar139 = vmovshdup_avx(local_2e8);
  auVar105 = vmovsldup_avx(local_2e8);
  auVar336._0_4_ = auVar105._0_4_ * fVar202 + auVar139._0_4_ * fVar201 + auVar103._0_4_ * fVar334;
  auVar336._4_4_ = auVar105._4_4_ * fVar226 + auVar139._4_4_ * fVar390 + auVar103._4_4_ * fVar222;
  auVar336._8_4_ = auVar105._8_4_ * fVar200 + auVar139._8_4_ * fVar220 + auVar103._8_4_ * fVar255;
  auVar336._12_4_ =
       auVar105._12_4_ * fVar219 + auVar139._12_4_ * fVar254 + auVar103._12_4_ * fVar221;
  auVar78._4_4_ = fVar224;
  auVar78._0_4_ = fVar223;
  auVar78._8_4_ = fVar225;
  auVar78._12_4_ = fVar258;
  local_2f8 = vsubps_avx(auVar78,auVar104);
  auVar105 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar104 = vmovshdup_avx(local_2f8);
  auVar139 = vmovsldup_avx(local_2f8);
  auVar107._0_4_ = fVar202 * auVar139._0_4_ + fVar201 * auVar104._0_4_ + fVar334 * auVar105._0_4_;
  auVar107._4_4_ = fVar226 * auVar139._4_4_ + fVar390 * auVar104._4_4_ + fVar222 * auVar105._4_4_;
  auVar107._8_4_ = fVar200 * auVar139._8_4_ + fVar220 * auVar104._8_4_ + fVar255 * auVar105._8_4_;
  auVar107._12_4_ =
       fVar219 * auVar139._12_4_ + fVar254 * auVar104._12_4_ + fVar221 * auVar105._12_4_;
  auVar103 = vmovlhps_avx(_local_5f8,auVar311);
  auVar37 = vmovlhps_avx(_local_5e8,auVar321);
  auVar232 = vmovlhps_avx(auVar210,auVar336);
  _local_3e8 = vmovlhps_avx(auVar142,auVar107);
  auVar104 = vminps_avx(auVar103,auVar37);
  auVar139 = vminps_avx(auVar232,_local_3e8);
  auVar105 = vminps_avx(auVar104,auVar139);
  auVar104 = vmaxps_avx(auVar103,auVar37);
  auVar139 = vmaxps_avx(auVar232,_local_3e8);
  auVar104 = vmaxps_avx(auVar104,auVar139);
  auVar139 = vshufpd_avx(auVar105,auVar105,3);
  auVar105 = vminps_avx(auVar105,auVar139);
  auVar139 = vshufpd_avx(auVar104,auVar104,3);
  auVar139 = vmaxps_avx(auVar104,auVar139);
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar105,auVar284);
  auVar139 = vandps_avx(auVar139,auVar284);
  auVar104 = vmaxps_avx(auVar104,auVar139);
  auVar139 = vmovshdup_avx(auVar104);
  auVar104 = vmaxss_avx(auVar139,auVar104);
  fVar202 = auVar104._0_4_ * 9.536743e-07;
  local_3f8 = ZEXT416((uint)fVar202);
  auVar104 = vshufps_avx(local_3f8,ZEXT416((uint)fVar202),0);
  local_78._16_16_ = auVar104;
  local_78._0_16_ = auVar104;
  auVar108._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
  auVar108._8_4_ = auVar104._8_4_ ^ 0x80000000;
  auVar108._12_4_ = auVar104._12_4_ ^ 0x80000000;
  local_248._16_16_ = auVar108;
  local_248._0_16_ = auVar108;
  local_328 = vpshufd_avx(ZEXT416(uVar83),0);
  local_338 = vpshufd_avx(ZEXT416(*(uint *)(local_450 + lVar90 * 4 + 6)),0);
  uVar84 = 0;
  uVar87 = 0;
  fVar202 = *(float *)(ray + k * 4 + 0x30);
  _local_258 = vsubps_avx(auVar37,auVar103);
  _local_268 = vsubps_avx(auVar232,auVar37);
  _local_278 = vsubps_avx(_local_3e8,auVar232);
  _local_348 = vsubps_avx(_local_438,_local_408);
  auVar81._4_4_ = fVar278;
  auVar81._0_4_ = fVar277;
  auVar81._8_4_ = fVar279;
  auVar81._12_4_ = fVar280;
  _local_358 = vsubps_avx(_local_448,auVar81);
  _local_368 = vsubps_avx(_local_318,_local_418);
  auVar79._4_4_ = fVar224;
  auVar79._0_4_ = fVar223;
  auVar79._8_4_ = fVar225;
  auVar79._12_4_ = fVar258;
  _local_378 = vsubps_avx(auVar79,_local_428);
  auVar109 = ZEXT816(0x3f80000000000000);
  local_308 = auVar109;
LAB_01133325:
  do {
    auVar104 = vshufps_avx(auVar109,auVar109,0x50);
    auVar394._8_4_ = 0x3f800000;
    auVar394._0_8_ = 0x3f8000003f800000;
    auVar394._12_4_ = 0x3f800000;
    auVar398._16_4_ = 0x3f800000;
    auVar398._0_16_ = auVar394;
    auVar398._20_4_ = 0x3f800000;
    auVar398._24_4_ = 0x3f800000;
    auVar398._28_4_ = 0x3f800000;
    auVar139 = vsubps_avx(auVar394,auVar104);
    fVar226 = auVar104._0_4_;
    fVar200 = auVar104._4_4_;
    fVar219 = auVar104._8_4_;
    fVar201 = auVar104._12_4_;
    fVar390 = auVar139._0_4_;
    fVar220 = auVar139._4_4_;
    fVar254 = auVar139._8_4_;
    fVar334 = auVar139._12_4_;
    auVar211._0_4_ = auVar311._0_4_ * fVar226 + fVar390 * (float)local_5f8._0_4_;
    auVar211._4_4_ = auVar311._4_4_ * fVar200 + fVar220 * (float)local_5f8._4_4_;
    auVar211._8_4_ = auVar311._0_4_ * fVar219 + fVar254 * (float)local_5f8._0_4_;
    auVar211._12_4_ = auVar311._4_4_ * fVar201 + fVar334 * (float)local_5f8._4_4_;
    auVar179._0_4_ = auVar321._0_4_ * fVar226 + fVar256 * fVar390;
    auVar179._4_4_ = auVar321._4_4_ * fVar200 + fVar257 * fVar220;
    auVar179._8_4_ = auVar321._0_4_ * fVar219 + fVar256 * fVar254;
    auVar179._12_4_ = auVar321._4_4_ * fVar201 + fVar257 * fVar334;
    auVar296._0_4_ = auVar336._0_4_ * fVar226 + auVar210._0_4_ * fVar390;
    auVar296._4_4_ = auVar336._4_4_ * fVar200 + auVar210._4_4_ * fVar220;
    auVar296._8_4_ = auVar336._0_4_ * fVar219 + auVar210._0_4_ * fVar254;
    auVar296._12_4_ = auVar336._4_4_ * fVar201 + auVar210._4_4_ * fVar334;
    auVar239._0_4_ = auVar107._0_4_ * fVar226 + fVar390 * auVar142._0_4_;
    auVar239._4_4_ = auVar107._4_4_ * fVar200 + fVar220 * auVar142._4_4_;
    auVar239._8_4_ = auVar107._0_4_ * fVar219 + fVar254 * auVar142._0_4_;
    auVar239._12_4_ = auVar107._4_4_ * fVar201 + fVar334 * auVar142._4_4_;
    auVar104 = vmovshdup_avx(local_308);
    auVar139 = vshufps_avx(local_308,local_308,0);
    auVar331._16_16_ = auVar139;
    auVar331._0_16_ = auVar139;
    auVar105 = vshufps_avx(local_308,local_308,0x55);
    auVar127._16_16_ = auVar105;
    auVar127._0_16_ = auVar105;
    auVar123 = vsubps_avx(auVar127,auVar331);
    auVar105 = vshufps_avx(auVar211,auVar211,0);
    auVar156 = vshufps_avx(auVar211,auVar211,0x55);
    auVar145 = vshufps_avx(auVar179,auVar179,0);
    auVar183 = vshufps_avx(auVar179,auVar179,0x55);
    auVar146 = vshufps_avx(auVar296,auVar296,0);
    auVar290 = vshufps_avx(auVar296,auVar296,0x55);
    auVar10 = vshufps_avx(auVar239,auVar239,0);
    auVar11 = vshufps_avx(auVar239,auVar239,0x55);
    auVar104 = ZEXT416((uint)((auVar104._0_4_ - local_308._0_4_) * 0.04761905));
    auVar104 = vshufps_avx(auVar104,auVar104,0);
    auVar344._0_4_ = auVar139._0_4_ + auVar123._0_4_ * 0.0;
    auVar344._4_4_ = auVar139._4_4_ + auVar123._4_4_ * 0.14285715;
    auVar344._8_4_ = auVar139._8_4_ + auVar123._8_4_ * 0.2857143;
    auVar344._12_4_ = auVar139._12_4_ + auVar123._12_4_ * 0.42857146;
    auVar344._16_4_ = auVar139._0_4_ + auVar123._16_4_ * 0.5714286;
    auVar344._20_4_ = auVar139._4_4_ + auVar123._20_4_ * 0.71428573;
    auVar344._24_4_ = auVar139._8_4_ + auVar123._24_4_ * 0.8571429;
    auVar344._28_4_ = auVar139._12_4_ + auVar123._28_4_;
    auVar31 = vsubps_avx(auVar398,auVar344);
    fVar226 = auVar145._0_4_;
    fVar219 = auVar145._4_4_;
    fVar390 = auVar145._8_4_;
    fVar254 = auVar145._12_4_;
    fVar360 = auVar31._0_4_;
    fVar362 = auVar31._4_4_;
    fVar399 = auVar31._8_4_;
    fVar400 = auVar31._12_4_;
    fVar401 = auVar31._16_4_;
    fVar403 = auVar31._20_4_;
    fVar333 = auVar31._24_4_;
    fVar372 = auVar183._0_4_;
    fVar378 = auVar183._4_4_;
    fVar387 = auVar183._8_4_;
    fVar346 = auVar183._12_4_;
    fVar389 = auVar156._12_4_ + 1.0;
    fVar359 = auVar146._0_4_;
    fVar361 = auVar146._4_4_;
    fVar363 = auVar146._8_4_;
    fVar371 = auVar146._12_4_;
    fVar222 = fVar359 * auVar344._0_4_ + fVar360 * fVar226;
    fVar255 = fVar361 * auVar344._4_4_ + fVar362 * fVar219;
    fVar221 = fVar363 * auVar344._8_4_ + fVar399 * fVar390;
    fVar259 = fVar371 * auVar344._12_4_ + fVar400 * fVar254;
    fVar275 = fVar359 * auVar344._16_4_ + fVar401 * fVar226;
    fVar276 = fVar361 * auVar344._20_4_ + fVar403 * fVar219;
    fVar345 = fVar363 * auVar344._24_4_ + fVar333 * fVar390;
    fVar200 = auVar290._0_4_;
    fVar201 = auVar290._4_4_;
    fVar220 = auVar290._8_4_;
    fVar334 = auVar290._12_4_;
    fVar373 = fVar372 * fVar360 + auVar344._0_4_ * fVar200;
    fVar386 = fVar378 * fVar362 + auVar344._4_4_ * fVar201;
    fVar388 = fVar387 * fVar399 + auVar344._8_4_ * fVar220;
    fVar358 = fVar346 * fVar400 + auVar344._12_4_ * fVar334;
    fVar374 = fVar372 * fVar401 + auVar344._16_4_ * fVar200;
    fVar375 = fVar378 * fVar403 + auVar344._20_4_ * fVar201;
    fVar376 = fVar387 * fVar333 + auVar344._24_4_ * fVar220;
    fVar377 = fVar346 + fVar254;
    auVar139 = vshufps_avx(auVar211,auVar211,0xaa);
    auVar145 = vshufps_avx(auVar211,auVar211,0xff);
    fVar357 = fVar371 + 0.0;
    auVar183 = vshufps_avx(auVar179,auVar179,0xaa);
    auVar146 = vshufps_avx(auVar179,auVar179,0xff);
    auVar252._0_4_ =
         fVar360 * (auVar344._0_4_ * fVar226 + fVar360 * auVar105._0_4_) + auVar344._0_4_ * fVar222;
    auVar252._4_4_ =
         fVar362 * (auVar344._4_4_ * fVar219 + fVar362 * auVar105._4_4_) + auVar344._4_4_ * fVar255;
    auVar252._8_4_ =
         fVar399 * (auVar344._8_4_ * fVar390 + fVar399 * auVar105._8_4_) + auVar344._8_4_ * fVar221;
    auVar252._12_4_ =
         fVar400 * (auVar344._12_4_ * fVar254 + fVar400 * auVar105._12_4_) +
         auVar344._12_4_ * fVar259;
    auVar252._16_4_ =
         fVar401 * (auVar344._16_4_ * fVar226 + fVar401 * auVar105._0_4_) +
         auVar344._16_4_ * fVar275;
    auVar252._20_4_ =
         fVar403 * (auVar344._20_4_ * fVar219 + fVar403 * auVar105._4_4_) +
         auVar344._20_4_ * fVar276;
    auVar252._24_4_ =
         fVar333 * (auVar344._24_4_ * fVar390 + fVar333 * auVar105._8_4_) +
         auVar344._24_4_ * fVar345;
    auVar252._28_4_ = auVar105._12_4_ + 1.0 + fVar334;
    auVar273._0_4_ =
         fVar360 * (fVar372 * auVar344._0_4_ + auVar156._0_4_ * fVar360) + auVar344._0_4_ * fVar373;
    auVar273._4_4_ =
         fVar362 * (fVar378 * auVar344._4_4_ + auVar156._4_4_ * fVar362) + auVar344._4_4_ * fVar386;
    auVar273._8_4_ =
         fVar399 * (fVar387 * auVar344._8_4_ + auVar156._8_4_ * fVar399) + auVar344._8_4_ * fVar388;
    auVar273._12_4_ =
         fVar400 * (fVar346 * auVar344._12_4_ + auVar156._12_4_ * fVar400) +
         auVar344._12_4_ * fVar358;
    auVar273._16_4_ =
         fVar401 * (fVar372 * auVar344._16_4_ + auVar156._0_4_ * fVar401) +
         auVar344._16_4_ * fVar374;
    auVar273._20_4_ =
         fVar403 * (fVar378 * auVar344._20_4_ + auVar156._4_4_ * fVar403) +
         auVar344._20_4_ * fVar375;
    auVar273._24_4_ =
         fVar333 * (fVar387 * auVar344._24_4_ + auVar156._8_4_ * fVar333) +
         auVar344._24_4_ * fVar376;
    auVar273._28_4_ = auVar11._12_4_ + fVar334;
    auVar128._0_4_ =
         fVar360 * fVar222 + auVar344._0_4_ * (fVar359 * fVar360 + auVar10._0_4_ * auVar344._0_4_);
    auVar128._4_4_ =
         fVar362 * fVar255 + auVar344._4_4_ * (fVar361 * fVar362 + auVar10._4_4_ * auVar344._4_4_);
    auVar128._8_4_ =
         fVar399 * fVar221 + auVar344._8_4_ * (fVar363 * fVar399 + auVar10._8_4_ * auVar344._8_4_);
    auVar128._12_4_ =
         fVar400 * fVar259 +
         auVar344._12_4_ * (fVar371 * fVar400 + auVar10._12_4_ * auVar344._12_4_);
    auVar128._16_4_ =
         fVar401 * fVar275 + auVar344._16_4_ * (fVar359 * fVar401 + auVar10._0_4_ * auVar344._16_4_)
    ;
    auVar128._20_4_ =
         fVar403 * fVar276 + auVar344._20_4_ * (fVar361 * fVar403 + auVar10._4_4_ * auVar344._20_4_)
    ;
    auVar128._24_4_ =
         fVar333 * fVar345 + auVar344._24_4_ * (fVar363 * fVar333 + auVar10._8_4_ * auVar344._24_4_)
    ;
    auVar128._28_4_ = fVar254 + 1.0 + fVar357;
    auVar356._0_4_ =
         fVar360 * fVar373 + auVar344._0_4_ * (auVar11._0_4_ * auVar344._0_4_ + fVar360 * fVar200);
    auVar356._4_4_ =
         fVar362 * fVar386 + auVar344._4_4_ * (auVar11._4_4_ * auVar344._4_4_ + fVar362 * fVar201);
    auVar356._8_4_ =
         fVar399 * fVar388 + auVar344._8_4_ * (auVar11._8_4_ * auVar344._8_4_ + fVar399 * fVar220);
    auVar356._12_4_ =
         fVar400 * fVar358 +
         auVar344._12_4_ * (auVar11._12_4_ * auVar344._12_4_ + fVar400 * fVar334);
    auVar356._16_4_ =
         fVar401 * fVar374 + auVar344._16_4_ * (auVar11._0_4_ * auVar344._16_4_ + fVar401 * fVar200)
    ;
    auVar356._20_4_ =
         fVar403 * fVar375 + auVar344._20_4_ * (auVar11._4_4_ * auVar344._20_4_ + fVar403 * fVar201)
    ;
    auVar356._24_4_ =
         fVar333 * fVar376 + auVar344._24_4_ * (auVar11._8_4_ * auVar344._24_4_ + fVar333 * fVar220)
    ;
    auVar356._28_4_ = fVar357 + fVar334 + 0.0;
    local_98._0_4_ = fVar360 * auVar252._0_4_ + auVar344._0_4_ * auVar128._0_4_;
    local_98._4_4_ = fVar362 * auVar252._4_4_ + auVar344._4_4_ * auVar128._4_4_;
    local_98._8_4_ = fVar399 * auVar252._8_4_ + auVar344._8_4_ * auVar128._8_4_;
    local_98._12_4_ = fVar400 * auVar252._12_4_ + auVar344._12_4_ * auVar128._12_4_;
    local_98._16_4_ = fVar401 * auVar252._16_4_ + auVar344._16_4_ * auVar128._16_4_;
    local_98._20_4_ = fVar403 * auVar252._20_4_ + auVar344._20_4_ * auVar128._20_4_;
    local_98._24_4_ = fVar333 * auVar252._24_4_ + auVar344._24_4_ * auVar128._24_4_;
    local_98._28_4_ = fVar377 + fVar334 + 0.0;
    auVar218._0_4_ = fVar360 * auVar273._0_4_ + auVar344._0_4_ * auVar356._0_4_;
    auVar218._4_4_ = fVar362 * auVar273._4_4_ + auVar344._4_4_ * auVar356._4_4_;
    auVar218._8_4_ = fVar399 * auVar273._8_4_ + auVar344._8_4_ * auVar356._8_4_;
    auVar218._12_4_ = fVar400 * auVar273._12_4_ + auVar344._12_4_ * auVar356._12_4_;
    auVar218._16_4_ = fVar401 * auVar273._16_4_ + auVar344._16_4_ * auVar356._16_4_;
    auVar218._20_4_ = fVar403 * auVar273._20_4_ + auVar344._20_4_ * auVar356._20_4_;
    auVar218._24_4_ = fVar333 * auVar273._24_4_ + auVar344._24_4_ * auVar356._24_4_;
    auVar218._28_4_ = fVar377 + fVar357;
    auVar32 = vsubps_avx(auVar128,auVar252);
    auVar123 = vsubps_avx(auVar356,auVar273);
    local_548 = auVar104._0_4_;
    fStack_544 = auVar104._4_4_;
    fStack_540 = auVar104._8_4_;
    fStack_53c = auVar104._12_4_;
    local_d8 = local_548 * auVar32._0_4_ * 3.0;
    fStack_d4 = fStack_544 * auVar32._4_4_ * 3.0;
    auVar40._4_4_ = fStack_d4;
    auVar40._0_4_ = local_d8;
    fStack_d0 = fStack_540 * auVar32._8_4_ * 3.0;
    auVar40._8_4_ = fStack_d0;
    fStack_cc = fStack_53c * auVar32._12_4_ * 3.0;
    auVar40._12_4_ = fStack_cc;
    fStack_c8 = local_548 * auVar32._16_4_ * 3.0;
    auVar40._16_4_ = fStack_c8;
    fStack_c4 = fStack_544 * auVar32._20_4_ * 3.0;
    auVar40._20_4_ = fStack_c4;
    fStack_c0 = fStack_540 * auVar32._24_4_ * 3.0;
    auVar40._24_4_ = fStack_c0;
    auVar40._28_4_ = auVar32._28_4_;
    local_f8 = local_548 * auVar123._0_4_ * 3.0;
    fStack_f4 = fStack_544 * auVar123._4_4_ * 3.0;
    auVar41._4_4_ = fStack_f4;
    auVar41._0_4_ = local_f8;
    fStack_f0 = fStack_540 * auVar123._8_4_ * 3.0;
    auVar41._8_4_ = fStack_f0;
    fStack_ec = fStack_53c * auVar123._12_4_ * 3.0;
    auVar41._12_4_ = fStack_ec;
    fStack_e8 = local_548 * auVar123._16_4_ * 3.0;
    auVar41._16_4_ = fStack_e8;
    fStack_e4 = fStack_544 * auVar123._20_4_ * 3.0;
    auVar41._20_4_ = fStack_e4;
    fStack_e0 = fStack_540 * auVar123._24_4_ * 3.0;
    auVar41._24_4_ = fStack_e0;
    auVar41._28_4_ = fVar377;
    auVar29 = vsubps_avx(local_98,auVar40);
    auVar123 = vperm2f128_avx(auVar29,auVar29,1);
    auVar123 = vshufps_avx(auVar123,auVar29,0x30);
    auVar123 = vshufps_avx(auVar29,auVar123,0x29);
    auVar30 = vsubps_avx(auVar218,auVar41);
    auVar29 = vperm2f128_avx(auVar30,auVar30,1);
    auVar29 = vshufps_avx(auVar29,auVar30,0x30);
    auVar30 = vshufps_avx(auVar30,auVar29,0x29);
    fVar375 = auVar183._0_4_;
    fVar376 = auVar183._4_4_;
    fVar402 = auVar183._8_4_;
    fVar254 = auVar139._12_4_;
    fVar361 = auVar146._0_4_;
    fVar371 = auVar146._4_4_;
    fVar373 = auVar146._8_4_;
    fVar386 = auVar146._12_4_;
    auVar104 = vshufps_avx(auVar296,auVar296,0xaa);
    fVar226 = auVar104._0_4_;
    fVar219 = auVar104._4_4_;
    fVar390 = auVar104._8_4_;
    fVar334 = auVar104._12_4_;
    fVar221 = auVar344._0_4_ * fVar226 + fVar375 * fVar360;
    fVar259 = auVar344._4_4_ * fVar219 + fVar376 * fVar362;
    fVar275 = auVar344._8_4_ * fVar390 + fVar402 * fVar399;
    fVar276 = auVar344._12_4_ * fVar334 + auVar183._12_4_ * fVar400;
    fVar345 = auVar344._16_4_ * fVar226 + fVar375 * fVar401;
    fVar357 = auVar344._20_4_ * fVar219 + fVar376 * fVar403;
    fVar359 = auVar344._24_4_ * fVar390 + fVar402 * fVar333;
    auVar104 = vshufps_avx(auVar296,auVar296,0xff);
    fVar200 = auVar104._0_4_;
    fVar201 = auVar104._4_4_;
    fVar220 = auVar104._8_4_;
    fVar222 = auVar104._12_4_;
    fVar363 = auVar344._0_4_ * fVar200 + fVar361 * fVar360;
    fVar372 = auVar344._4_4_ * fVar201 + fVar371 * fVar362;
    fVar378 = auVar344._8_4_ * fVar220 + fVar373 * fVar399;
    fVar387 = auVar344._12_4_ * fVar222 + fVar386 * fVar400;
    fVar388 = auVar344._16_4_ * fVar200 + fVar361 * fVar401;
    fVar346 = auVar344._20_4_ * fVar201 + fVar371 * fVar403;
    fVar358 = auVar344._24_4_ * fVar220 + fVar373 * fVar333;
    auVar104 = vshufps_avx(auVar239,auVar239,0xaa);
    fVar374 = auVar104._12_4_ + fVar334;
    auVar105 = vshufps_avx(auVar239,auVar239,0xff);
    fVar255 = auVar105._12_4_;
    auVar129._0_4_ =
         fVar360 * (fVar375 * auVar344._0_4_ + fVar360 * auVar139._0_4_) + auVar344._0_4_ * fVar221;
    auVar129._4_4_ =
         fVar362 * (fVar376 * auVar344._4_4_ + fVar362 * auVar139._4_4_) + auVar344._4_4_ * fVar259;
    auVar129._8_4_ =
         fVar399 * (fVar402 * auVar344._8_4_ + fVar399 * auVar139._8_4_) + auVar344._8_4_ * fVar275;
    auVar129._12_4_ =
         fVar400 * (auVar183._12_4_ * auVar344._12_4_ + fVar400 * fVar254) +
         auVar344._12_4_ * fVar276;
    auVar129._16_4_ =
         fVar401 * (fVar375 * auVar344._16_4_ + fVar401 * auVar139._0_4_) +
         auVar344._16_4_ * fVar345;
    auVar129._20_4_ =
         fVar403 * (fVar376 * auVar344._20_4_ + fVar403 * auVar139._4_4_) +
         auVar344._20_4_ * fVar357;
    auVar129._24_4_ =
         fVar333 * (fVar402 * auVar344._24_4_ + fVar333 * auVar139._8_4_) +
         auVar344._24_4_ * fVar359;
    auVar129._28_4_ = auVar30._28_4_ + fVar254 + fVar255;
    auVar165._0_4_ =
         fVar360 * (fVar361 * auVar344._0_4_ + auVar145._0_4_ * fVar360) + auVar344._0_4_ * fVar363;
    auVar165._4_4_ =
         fVar362 * (fVar371 * auVar344._4_4_ + auVar145._4_4_ * fVar362) + auVar344._4_4_ * fVar372;
    auVar165._8_4_ =
         fVar399 * (fVar373 * auVar344._8_4_ + auVar145._8_4_ * fVar399) + auVar344._8_4_ * fVar378;
    auVar165._12_4_ =
         fVar400 * (fVar386 * auVar344._12_4_ + auVar145._12_4_ * fVar400) +
         auVar344._12_4_ * fVar387;
    auVar165._16_4_ =
         fVar401 * (fVar361 * auVar344._16_4_ + auVar145._0_4_ * fVar401) +
         auVar344._16_4_ * fVar388;
    auVar165._20_4_ =
         fVar403 * (fVar371 * auVar344._20_4_ + auVar145._4_4_ * fVar403) +
         auVar344._20_4_ * fVar346;
    auVar165._24_4_ =
         fVar333 * (fVar373 * auVar344._24_4_ + auVar145._8_4_ * fVar333) +
         auVar344._24_4_ * fVar358;
    auVar165._28_4_ = fVar254 + auVar29._28_4_ + fVar255;
    auVar29 = vperm2f128_avx(local_98,local_98,1);
    auVar29 = vshufps_avx(auVar29,local_98,0x30);
    auVar33 = vshufps_avx(local_98,auVar29,0x29);
    auVar274._0_4_ =
         auVar344._0_4_ * (auVar104._0_4_ * auVar344._0_4_ + fVar360 * fVar226) + fVar360 * fVar221;
    auVar274._4_4_ =
         auVar344._4_4_ * (auVar104._4_4_ * auVar344._4_4_ + fVar362 * fVar219) + fVar362 * fVar259;
    auVar274._8_4_ =
         auVar344._8_4_ * (auVar104._8_4_ * auVar344._8_4_ + fVar399 * fVar390) + fVar399 * fVar275;
    auVar274._12_4_ =
         auVar344._12_4_ * (auVar104._12_4_ * auVar344._12_4_ + fVar400 * fVar334) +
         fVar400 * fVar276;
    auVar274._16_4_ =
         auVar344._16_4_ * (auVar104._0_4_ * auVar344._16_4_ + fVar401 * fVar226) +
         fVar401 * fVar345;
    auVar274._20_4_ =
         auVar344._20_4_ * (auVar104._4_4_ * auVar344._20_4_ + fVar403 * fVar219) +
         fVar403 * fVar357;
    auVar274._24_4_ =
         auVar344._24_4_ * (auVar104._8_4_ * auVar344._24_4_ + fVar333 * fVar390) +
         fVar333 * fVar359;
    auVar274._28_4_ = fVar374 + fVar389 + auVar273._28_4_;
    auVar320._0_4_ =
         fVar360 * fVar363 + auVar344._0_4_ * (auVar344._0_4_ * auVar105._0_4_ + fVar360 * fVar200);
    auVar320._4_4_ =
         fVar362 * fVar372 + auVar344._4_4_ * (auVar344._4_4_ * auVar105._4_4_ + fVar362 * fVar201);
    auVar320._8_4_ =
         fVar399 * fVar378 + auVar344._8_4_ * (auVar344._8_4_ * auVar105._8_4_ + fVar399 * fVar220);
    auVar320._12_4_ =
         fVar400 * fVar387 + auVar344._12_4_ * (auVar344._12_4_ * fVar255 + fVar400 * fVar222);
    auVar320._16_4_ =
         fVar401 * fVar388 +
         auVar344._16_4_ * (auVar344._16_4_ * auVar105._0_4_ + fVar401 * fVar200);
    auVar320._20_4_ =
         fVar403 * fVar346 +
         auVar344._20_4_ * (auVar344._20_4_ * auVar105._4_4_ + fVar403 * fVar201);
    auVar320._24_4_ =
         fVar333 * fVar358 +
         auVar344._24_4_ * (auVar344._24_4_ * auVar105._8_4_ + fVar333 * fVar220);
    auVar320._28_4_ = fVar389 + fVar386 + fVar255 + fVar222;
    auVar303._0_4_ = fVar360 * auVar129._0_4_ + auVar344._0_4_ * auVar274._0_4_;
    auVar303._4_4_ = fVar362 * auVar129._4_4_ + auVar344._4_4_ * auVar274._4_4_;
    auVar303._8_4_ = fVar399 * auVar129._8_4_ + auVar344._8_4_ * auVar274._8_4_;
    auVar303._12_4_ = fVar400 * auVar129._12_4_ + auVar344._12_4_ * auVar274._12_4_;
    auVar303._16_4_ = fVar401 * auVar129._16_4_ + auVar344._16_4_ * auVar274._16_4_;
    auVar303._20_4_ = fVar403 * auVar129._20_4_ + auVar344._20_4_ * auVar274._20_4_;
    auVar303._24_4_ = fVar333 * auVar129._24_4_ + auVar344._24_4_ * auVar274._24_4_;
    auVar303._28_4_ = fVar374 + fVar255 + fVar222;
    auVar332._0_4_ = fVar360 * auVar165._0_4_ + auVar344._0_4_ * auVar320._0_4_;
    auVar332._4_4_ = fVar362 * auVar165._4_4_ + auVar344._4_4_ * auVar320._4_4_;
    auVar332._8_4_ = fVar399 * auVar165._8_4_ + auVar344._8_4_ * auVar320._8_4_;
    auVar332._12_4_ = fVar400 * auVar165._12_4_ + auVar344._12_4_ * auVar320._12_4_;
    auVar332._16_4_ = fVar401 * auVar165._16_4_ + auVar344._16_4_ * auVar320._16_4_;
    auVar332._20_4_ = fVar403 * auVar165._20_4_ + auVar344._20_4_ * auVar320._20_4_;
    auVar332._24_4_ = fVar333 * auVar165._24_4_ + auVar344._24_4_ * auVar320._24_4_;
    auVar332._28_4_ = auVar31._28_4_ + auVar344._28_4_;
    auVar36 = vsubps_avx(auVar274,auVar129);
    auVar29 = vsubps_avx(auVar320,auVar165);
    local_118 = local_548 * auVar36._0_4_ * 3.0;
    fStack_114 = fStack_544 * auVar36._4_4_ * 3.0;
    auVar42._4_4_ = fStack_114;
    auVar42._0_4_ = local_118;
    fStack_110 = fStack_540 * auVar36._8_4_ * 3.0;
    auVar42._8_4_ = fStack_110;
    fStack_10c = fStack_53c * auVar36._12_4_ * 3.0;
    auVar42._12_4_ = fStack_10c;
    fStack_108 = local_548 * auVar36._16_4_ * 3.0;
    auVar42._16_4_ = fStack_108;
    fStack_104 = fStack_544 * auVar36._20_4_ * 3.0;
    auVar42._20_4_ = fStack_104;
    fStack_100 = fStack_540 * auVar36._24_4_ * 3.0;
    auVar42._24_4_ = fStack_100;
    auVar42._28_4_ = auVar36._28_4_;
    local_138 = local_548 * auVar29._0_4_ * 3.0;
    fStack_134 = fStack_544 * auVar29._4_4_ * 3.0;
    auVar43._4_4_ = fStack_134;
    auVar43._0_4_ = local_138;
    fStack_130 = fStack_540 * auVar29._8_4_ * 3.0;
    auVar43._8_4_ = fStack_130;
    fStack_12c = fStack_53c * auVar29._12_4_ * 3.0;
    auVar43._12_4_ = fStack_12c;
    fStack_128 = local_548 * auVar29._16_4_ * 3.0;
    auVar43._16_4_ = fStack_128;
    fStack_124 = fStack_544 * auVar29._20_4_ * 3.0;
    auVar43._20_4_ = fStack_124;
    fStack_120 = fStack_540 * auVar29._24_4_ * 3.0;
    auVar43._24_4_ = fStack_120;
    auVar43._28_4_ = auVar274._28_4_;
    auVar29 = vperm2f128_avx(auVar303,auVar303,1);
    auVar29 = vshufps_avx(auVar29,auVar303,0x30);
    auVar34 = vshufps_avx(auVar303,auVar29,0x29);
    auVar31 = vsubps_avx(auVar303,auVar42);
    auVar29 = vperm2f128_avx(auVar31,auVar31,1);
    auVar29 = vshufps_avx(auVar29,auVar31,0x30);
    auVar29 = vshufps_avx(auVar31,auVar29,0x29);
    auVar35 = vsubps_avx(auVar332,auVar43);
    auVar31 = vperm2f128_avx(auVar35,auVar35,1);
    auVar31 = vshufps_avx(auVar31,auVar35,0x30);
    auVar35 = vshufps_avx(auVar35,auVar31,0x29);
    auVar38 = vsubps_avx(auVar303,local_98);
    auVar39 = vsubps_avx(auVar34,auVar33);
    fVar226 = auVar39._0_4_ + auVar38._0_4_;
    fVar200 = auVar39._4_4_ + auVar38._4_4_;
    fVar219 = auVar39._8_4_ + auVar38._8_4_;
    fVar201 = auVar39._12_4_ + auVar38._12_4_;
    fVar390 = auVar39._16_4_ + auVar38._16_4_;
    fVar220 = auVar39._20_4_ + auVar38._20_4_;
    fVar254 = auVar39._24_4_ + auVar38._24_4_;
    auVar31 = vperm2f128_avx(auVar218,auVar218,1);
    auVar31 = vshufps_avx(auVar31,auVar218,0x30);
    local_b8 = vshufps_avx(auVar218,auVar31,0x29);
    auVar31 = vperm2f128_avx(auVar332,auVar332,1);
    auVar31 = vshufps_avx(auVar31,auVar332,0x30);
    local_398 = vshufps_avx(auVar332,auVar31,0x29);
    auVar31 = vsubps_avx(auVar332,auVar218);
    auVar124 = vsubps_avx(local_398,local_b8);
    fVar334 = auVar124._0_4_ + auVar31._0_4_;
    fVar222 = auVar124._4_4_ + auVar31._4_4_;
    fVar255 = auVar124._8_4_ + auVar31._8_4_;
    fVar221 = auVar124._12_4_ + auVar31._12_4_;
    fVar259 = auVar124._16_4_ + auVar31._16_4_;
    fVar275 = auVar124._20_4_ + auVar31._20_4_;
    fVar276 = auVar124._24_4_ + auVar31._24_4_;
    auVar44._4_4_ = fVar200 * auVar218._4_4_;
    auVar44._0_4_ = fVar226 * auVar218._0_4_;
    auVar44._8_4_ = fVar219 * auVar218._8_4_;
    auVar44._12_4_ = fVar201 * auVar218._12_4_;
    auVar44._16_4_ = fVar390 * auVar218._16_4_;
    auVar44._20_4_ = fVar220 * auVar218._20_4_;
    auVar44._24_4_ = fVar254 * auVar218._24_4_;
    auVar44._28_4_ = auVar31._28_4_;
    auVar45._4_4_ = fVar222 * local_98._4_4_;
    auVar45._0_4_ = fVar334 * local_98._0_4_;
    auVar45._8_4_ = fVar255 * local_98._8_4_;
    auVar45._12_4_ = fVar221 * local_98._12_4_;
    auVar45._16_4_ = fVar259 * local_98._16_4_;
    auVar45._20_4_ = fVar275 * local_98._20_4_;
    auVar45._24_4_ = fVar276 * local_98._24_4_;
    auVar45._28_4_ = fVar374;
    auVar125 = vsubps_avx(auVar44,auVar45);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar32._28_4_;
    local_f8 = local_f8 + auVar218._0_4_;
    fStack_f4 = fStack_f4 + auVar218._4_4_;
    fStack_f0 = fStack_f0 + auVar218._8_4_;
    fStack_ec = fStack_ec + auVar218._12_4_;
    fStack_e8 = fStack_e8 + auVar218._16_4_;
    fStack_e4 = fStack_e4 + auVar218._20_4_;
    fStack_e0 = fStack_e0 + auVar218._24_4_;
    fStack_dc = fVar377 + auVar218._28_4_;
    auVar46._4_4_ = fVar200 * fStack_f4;
    auVar46._0_4_ = fVar226 * local_f8;
    auVar46._8_4_ = fVar219 * fStack_f0;
    auVar46._12_4_ = fVar201 * fStack_ec;
    auVar46._16_4_ = fVar390 * fStack_e8;
    auVar46._20_4_ = fVar220 * fStack_e4;
    auVar46._24_4_ = fVar254 * fStack_e0;
    auVar46._28_4_ = fVar377;
    auVar47._4_4_ = fVar222 * fStack_d4;
    auVar47._0_4_ = fVar334 * local_d8;
    auVar47._8_4_ = fVar255 * fStack_d0;
    auVar47._12_4_ = fVar221 * fStack_cc;
    auVar47._16_4_ = fVar259 * fStack_c8;
    auVar47._20_4_ = fVar275 * fStack_c4;
    auVar47._24_4_ = fVar276 * fStack_c0;
    auVar47._28_4_ = fVar377 + auVar218._28_4_;
    auVar32 = vsubps_avx(auVar46,auVar47);
    local_528 = auVar30._0_4_;
    fStack_524 = auVar30._4_4_;
    fStack_520 = auVar30._8_4_;
    fStack_51c = auVar30._12_4_;
    fStack_518 = auVar30._16_4_;
    fStack_514 = auVar30._20_4_;
    fStack_510 = auVar30._24_4_;
    auVar48._4_4_ = fVar200 * fStack_524;
    auVar48._0_4_ = fVar226 * local_528;
    auVar48._8_4_ = fVar219 * fStack_520;
    auVar48._12_4_ = fVar201 * fStack_51c;
    auVar48._16_4_ = fVar390 * fStack_518;
    auVar48._20_4_ = fVar220 * fStack_514;
    auVar48._24_4_ = fVar254 * fStack_510;
    auVar48._28_4_ = fVar377;
    local_5e8._0_4_ = auVar123._0_4_;
    local_5e8._4_4_ = auVar123._4_4_;
    fStack_5e0 = auVar123._8_4_;
    fStack_5dc = auVar123._12_4_;
    fStack_5d8 = auVar123._16_4_;
    fStack_5d4 = auVar123._20_4_;
    fStack_5d0 = auVar123._24_4_;
    auVar49._4_4_ = fVar222 * (float)local_5e8._4_4_;
    auVar49._0_4_ = fVar334 * (float)local_5e8._0_4_;
    auVar49._8_4_ = fVar255 * fStack_5e0;
    auVar49._12_4_ = fVar221 * fStack_5dc;
    auVar49._16_4_ = fVar259 * fStack_5d8;
    auVar49._20_4_ = fVar275 * fStack_5d4;
    auVar49._24_4_ = fVar276 * fStack_5d0;
    auVar49._28_4_ = local_98._28_4_;
    auVar162 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = local_b8._4_4_ * fVar200;
    auVar50._0_4_ = local_b8._0_4_ * fVar226;
    auVar50._8_4_ = local_b8._8_4_ * fVar219;
    auVar50._12_4_ = local_b8._12_4_ * fVar201;
    auVar50._16_4_ = local_b8._16_4_ * fVar390;
    auVar50._20_4_ = local_b8._20_4_ * fVar220;
    auVar50._24_4_ = local_b8._24_4_ * fVar254;
    auVar50._28_4_ = fVar377;
    auVar51._4_4_ = auVar33._4_4_ * fVar222;
    auVar51._0_4_ = auVar33._0_4_ * fVar334;
    auVar51._8_4_ = auVar33._8_4_ * fVar255;
    auVar51._12_4_ = auVar33._12_4_ * fVar221;
    auVar51._16_4_ = auVar33._16_4_ * fVar259;
    auVar51._20_4_ = auVar33._20_4_ * fVar275;
    auVar51._24_4_ = auVar33._24_4_ * fVar276;
    auVar51._28_4_ = local_b8._28_4_;
    local_548 = auVar29._0_4_;
    fStack_544 = auVar29._4_4_;
    fStack_540 = auVar29._8_4_;
    fStack_53c = auVar29._12_4_;
    fStack_538 = auVar29._16_4_;
    fStack_534 = auVar29._20_4_;
    fStack_530 = auVar29._24_4_;
    auVar163 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar332._4_4_ * fVar200;
    auVar52._0_4_ = auVar332._0_4_ * fVar226;
    auVar52._8_4_ = auVar332._8_4_ * fVar219;
    auVar52._12_4_ = auVar332._12_4_ * fVar201;
    auVar52._16_4_ = auVar332._16_4_ * fVar390;
    auVar52._20_4_ = auVar332._20_4_ * fVar220;
    auVar52._24_4_ = auVar332._24_4_ * fVar254;
    auVar52._28_4_ = fVar377;
    auVar53._4_4_ = fVar222 * auVar303._4_4_;
    auVar53._0_4_ = fVar334 * auVar303._0_4_;
    auVar53._8_4_ = fVar255 * auVar303._8_4_;
    auVar53._12_4_ = fVar221 * auVar303._12_4_;
    auVar53._16_4_ = fVar259 * auVar303._16_4_;
    auVar53._20_4_ = fVar275 * auVar303._20_4_;
    auVar53._24_4_ = fVar276 * auVar303._24_4_;
    auVar53._28_4_ = fStack_bc;
    auVar164 = vsubps_avx(auVar52,auVar53);
    local_118 = auVar303._0_4_ + local_118;
    fStack_114 = auVar303._4_4_ + fStack_114;
    fStack_110 = auVar303._8_4_ + fStack_110;
    fStack_10c = auVar303._12_4_ + fStack_10c;
    fStack_108 = auVar303._16_4_ + fStack_108;
    fStack_104 = auVar303._20_4_ + fStack_104;
    fStack_100 = auVar303._24_4_ + fStack_100;
    fStack_fc = auVar303._28_4_ + auVar36._28_4_;
    local_138 = auVar332._0_4_ + local_138;
    fStack_134 = auVar332._4_4_ + fStack_134;
    fStack_130 = auVar332._8_4_ + fStack_130;
    fStack_12c = auVar332._12_4_ + fStack_12c;
    fStack_128 = auVar332._16_4_ + fStack_128;
    fStack_124 = auVar332._20_4_ + fStack_124;
    fStack_120 = auVar332._24_4_ + fStack_120;
    fStack_11c = auVar332._28_4_ + auVar274._28_4_;
    auVar54._4_4_ = fVar200 * fStack_134;
    auVar54._0_4_ = fVar226 * local_138;
    auVar54._8_4_ = fVar219 * fStack_130;
    auVar54._12_4_ = fVar201 * fStack_12c;
    auVar54._16_4_ = fVar390 * fStack_128;
    auVar54._20_4_ = fVar220 * fStack_124;
    auVar54._24_4_ = fVar254 * fStack_120;
    auVar54._28_4_ = auVar332._28_4_ + auVar274._28_4_;
    auVar55._4_4_ = fStack_114 * fVar222;
    auVar55._0_4_ = local_118 * fVar334;
    auVar55._8_4_ = fStack_110 * fVar255;
    auVar55._12_4_ = fStack_10c * fVar221;
    auVar55._16_4_ = fStack_108 * fVar259;
    auVar55._20_4_ = fStack_104 * fVar275;
    auVar55._24_4_ = fStack_100 * fVar276;
    auVar55._28_4_ = fStack_fc;
    auVar36 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar200 * auVar35._4_4_;
    auVar56._0_4_ = fVar226 * auVar35._0_4_;
    auVar56._8_4_ = fVar219 * auVar35._8_4_;
    auVar56._12_4_ = fVar201 * auVar35._12_4_;
    auVar56._16_4_ = fVar390 * auVar35._16_4_;
    auVar56._20_4_ = fVar220 * auVar35._20_4_;
    auVar56._24_4_ = fVar254 * auVar35._24_4_;
    auVar56._28_4_ = fStack_fc;
    auVar57._4_4_ = fVar222 * fStack_544;
    auVar57._0_4_ = fVar334 * local_548;
    auVar57._8_4_ = fVar255 * fStack_540;
    auVar57._12_4_ = fVar221 * fStack_53c;
    auVar57._16_4_ = fVar259 * fStack_538;
    auVar57._20_4_ = fVar275 * fStack_534;
    auVar57._24_4_ = fVar276 * fStack_530;
    auVar57._28_4_ = auVar35._28_4_;
    auVar195 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = fVar200 * local_398._4_4_;
    auVar58._0_4_ = fVar226 * local_398._0_4_;
    auVar58._8_4_ = fVar219 * local_398._8_4_;
    auVar58._12_4_ = fVar201 * local_398._12_4_;
    auVar58._16_4_ = fVar390 * local_398._16_4_;
    auVar58._20_4_ = fVar220 * local_398._20_4_;
    auVar58._24_4_ = fVar254 * local_398._24_4_;
    auVar58._28_4_ = auVar39._28_4_ + auVar38._28_4_;
    auVar59._4_4_ = auVar34._4_4_ * fVar222;
    auVar59._0_4_ = auVar34._0_4_ * fVar334;
    auVar59._8_4_ = auVar34._8_4_ * fVar255;
    auVar59._12_4_ = auVar34._12_4_ * fVar221;
    auVar59._16_4_ = auVar34._16_4_ * fVar259;
    auVar59._20_4_ = auVar34._20_4_ * fVar275;
    auVar59._24_4_ = auVar34._24_4_ * fVar276;
    auVar59._28_4_ = auVar124._28_4_ + auVar31._28_4_;
    auVar38 = vsubps_avx(auVar58,auVar59);
    auVar29 = vminps_avx(auVar125,auVar32);
    auVar123 = vmaxps_avx(auVar125,auVar32);
    auVar30 = vminps_avx(auVar162,auVar163);
    auVar30 = vminps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar162,auVar163);
    auVar123 = vmaxps_avx(auVar123,auVar29);
    auVar31 = vminps_avx(auVar164,auVar36);
    auVar29 = vmaxps_avx(auVar164,auVar36);
    auVar32 = vminps_avx(auVar195,auVar38);
    auVar32 = vminps_avx(auVar31,auVar32);
    auVar32 = vminps_avx(auVar30,auVar32);
    auVar30 = vmaxps_avx(auVar195,auVar38);
    auVar29 = vmaxps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar123,auVar29);
    auVar123 = vcmpps_avx(auVar32,local_78,2);
    auVar29 = vcmpps_avx(auVar29,local_248,5);
    auVar123 = vandps_avx(auVar29,auVar123);
    auVar29 = local_158 & auVar123;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar29 = vsubps_avx(auVar33,local_98);
      auVar30 = vsubps_avx(auVar34,auVar303);
      fVar200 = auVar29._0_4_ + auVar30._0_4_;
      fVar219 = auVar29._4_4_ + auVar30._4_4_;
      fVar201 = auVar29._8_4_ + auVar30._8_4_;
      fVar390 = auVar29._12_4_ + auVar30._12_4_;
      fVar220 = auVar29._16_4_ + auVar30._16_4_;
      fVar254 = auVar29._20_4_ + auVar30._20_4_;
      fVar334 = auVar29._24_4_ + auVar30._24_4_;
      auVar32 = vsubps_avx(local_b8,auVar218);
      auVar36 = vsubps_avx(local_398,auVar332);
      fVar222 = auVar32._0_4_ + auVar36._0_4_;
      fVar255 = auVar32._4_4_ + auVar36._4_4_;
      fVar221 = auVar32._8_4_ + auVar36._8_4_;
      fVar259 = auVar32._12_4_ + auVar36._12_4_;
      fVar275 = auVar32._16_4_ + auVar36._16_4_;
      fVar276 = auVar32._20_4_ + auVar36._20_4_;
      fVar345 = auVar32._24_4_ + auVar36._24_4_;
      fVar226 = auVar36._28_4_;
      auVar60._4_4_ = auVar218._4_4_ * fVar219;
      auVar60._0_4_ = auVar218._0_4_ * fVar200;
      auVar60._8_4_ = auVar218._8_4_ * fVar201;
      auVar60._12_4_ = auVar218._12_4_ * fVar390;
      auVar60._16_4_ = auVar218._16_4_ * fVar220;
      auVar60._20_4_ = auVar218._20_4_ * fVar254;
      auVar60._24_4_ = auVar218._24_4_ * fVar334;
      auVar60._28_4_ = auVar218._28_4_;
      auVar61._4_4_ = local_98._4_4_ * fVar255;
      auVar61._0_4_ = local_98._0_4_ * fVar222;
      auVar61._8_4_ = local_98._8_4_ * fVar221;
      auVar61._12_4_ = local_98._12_4_ * fVar259;
      auVar61._16_4_ = local_98._16_4_ * fVar275;
      auVar61._20_4_ = local_98._20_4_ * fVar276;
      auVar61._24_4_ = local_98._24_4_ * fVar345;
      auVar61._28_4_ = local_98._28_4_;
      auVar36 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar219 * fStack_f4;
      auVar62._0_4_ = fVar200 * local_f8;
      auVar62._8_4_ = fVar201 * fStack_f0;
      auVar62._12_4_ = fVar390 * fStack_ec;
      auVar62._16_4_ = fVar220 * fStack_e8;
      auVar62._20_4_ = fVar254 * fStack_e4;
      auVar62._24_4_ = fVar334 * fStack_e0;
      auVar62._28_4_ = auVar218._28_4_;
      auVar63._4_4_ = fVar255 * fStack_d4;
      auVar63._0_4_ = fVar222 * local_d8;
      auVar63._8_4_ = fVar221 * fStack_d0;
      auVar63._12_4_ = fVar259 * fStack_cc;
      auVar63._16_4_ = fVar275 * fStack_c8;
      auVar63._20_4_ = fVar276 * fStack_c4;
      auVar63._24_4_ = fVar345 * fStack_c0;
      auVar63._28_4_ = fVar226;
      auVar38 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fVar219 * fStack_524;
      auVar64._0_4_ = fVar200 * local_528;
      auVar64._8_4_ = fVar201 * fStack_520;
      auVar64._12_4_ = fVar390 * fStack_51c;
      auVar64._16_4_ = fVar220 * fStack_518;
      auVar64._20_4_ = fVar254 * fStack_514;
      auVar64._24_4_ = fVar334 * fStack_510;
      auVar64._28_4_ = fVar226;
      auVar65._4_4_ = fVar255 * (float)local_5e8._4_4_;
      auVar65._0_4_ = fVar222 * (float)local_5e8._0_4_;
      auVar65._8_4_ = fVar221 * fStack_5e0;
      auVar65._12_4_ = fVar259 * fStack_5dc;
      auVar65._16_4_ = fVar275 * fStack_5d8;
      auVar65._20_4_ = fVar276 * fStack_5d4;
      auVar65._24_4_ = fVar345 * fStack_5d0;
      auVar65._28_4_ = auVar31._28_4_;
      auVar39 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = local_b8._4_4_ * fVar219;
      auVar66._0_4_ = local_b8._0_4_ * fVar200;
      auVar66._8_4_ = local_b8._8_4_ * fVar201;
      auVar66._12_4_ = local_b8._12_4_ * fVar390;
      auVar66._16_4_ = local_b8._16_4_ * fVar220;
      auVar66._20_4_ = local_b8._20_4_ * fVar254;
      auVar66._24_4_ = local_b8._24_4_ * fVar334;
      auVar66._28_4_ = auVar31._28_4_;
      auVar67._4_4_ = auVar33._4_4_ * fVar255;
      auVar67._0_4_ = auVar33._0_4_ * fVar222;
      auVar67._8_4_ = auVar33._8_4_ * fVar221;
      auVar67._12_4_ = auVar33._12_4_ * fVar259;
      auVar67._16_4_ = auVar33._16_4_ * fVar275;
      auVar67._20_4_ = auVar33._20_4_ * fVar276;
      uVar8 = auVar33._28_4_;
      auVar67._24_4_ = auVar33._24_4_ * fVar345;
      auVar67._28_4_ = uVar8;
      auVar33 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = auVar332._4_4_ * fVar219;
      auVar68._0_4_ = auVar332._0_4_ * fVar200;
      auVar68._8_4_ = auVar332._8_4_ * fVar201;
      auVar68._12_4_ = auVar332._12_4_ * fVar390;
      auVar68._16_4_ = auVar332._16_4_ * fVar220;
      auVar68._20_4_ = auVar332._20_4_ * fVar254;
      auVar68._24_4_ = auVar332._24_4_ * fVar334;
      auVar68._28_4_ = uVar8;
      auVar69._4_4_ = auVar303._4_4_ * fVar255;
      auVar69._0_4_ = auVar303._0_4_ * fVar222;
      auVar69._8_4_ = auVar303._8_4_ * fVar221;
      auVar69._12_4_ = auVar303._12_4_ * fVar259;
      auVar69._16_4_ = auVar303._16_4_ * fVar275;
      auVar69._20_4_ = auVar303._20_4_ * fVar276;
      auVar69._24_4_ = auVar303._24_4_ * fVar345;
      auVar69._28_4_ = auVar303._28_4_;
      auVar124 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = fVar219 * fStack_134;
      auVar70._0_4_ = fVar200 * local_138;
      auVar70._8_4_ = fVar201 * fStack_130;
      auVar70._12_4_ = fVar390 * fStack_12c;
      auVar70._16_4_ = fVar220 * fStack_128;
      auVar70._20_4_ = fVar254 * fStack_124;
      auVar70._24_4_ = fVar334 * fStack_120;
      auVar70._28_4_ = uVar8;
      auVar71._4_4_ = fVar255 * fStack_114;
      auVar71._0_4_ = fVar222 * local_118;
      auVar71._8_4_ = fVar221 * fStack_110;
      auVar71._12_4_ = fVar259 * fStack_10c;
      auVar71._16_4_ = fVar275 * fStack_108;
      auVar71._20_4_ = fVar276 * fStack_104;
      auVar71._24_4_ = fVar345 * fStack_100;
      auVar71._28_4_ = auVar332._28_4_;
      auVar125 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = fVar219 * auVar35._4_4_;
      auVar72._0_4_ = fVar200 * auVar35._0_4_;
      auVar72._8_4_ = fVar201 * auVar35._8_4_;
      auVar72._12_4_ = fVar390 * auVar35._12_4_;
      auVar72._16_4_ = fVar220 * auVar35._16_4_;
      auVar72._20_4_ = fVar254 * auVar35._20_4_;
      auVar72._24_4_ = fVar334 * auVar35._24_4_;
      auVar72._28_4_ = auVar332._28_4_;
      auVar73._4_4_ = fStack_544 * fVar255;
      auVar73._0_4_ = local_548 * fVar222;
      auVar73._8_4_ = fStack_540 * fVar221;
      auVar73._12_4_ = fStack_53c * fVar259;
      auVar73._16_4_ = fStack_538 * fVar275;
      auVar73._20_4_ = fStack_534 * fVar276;
      auVar73._24_4_ = fStack_530 * fVar345;
      auVar73._28_4_ = local_b8._28_4_;
      auVar35 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = local_398._4_4_ * fVar219;
      auVar74._0_4_ = local_398._0_4_ * fVar200;
      auVar74._8_4_ = local_398._8_4_ * fVar201;
      auVar74._12_4_ = local_398._12_4_ * fVar390;
      auVar74._16_4_ = local_398._16_4_ * fVar220;
      auVar74._20_4_ = local_398._20_4_ * fVar254;
      auVar74._24_4_ = local_398._24_4_ * fVar334;
      auVar74._28_4_ = auVar29._28_4_ + auVar30._28_4_;
      auVar75._4_4_ = auVar34._4_4_ * fVar255;
      auVar75._0_4_ = auVar34._0_4_ * fVar222;
      auVar75._8_4_ = auVar34._8_4_ * fVar221;
      auVar75._12_4_ = auVar34._12_4_ * fVar259;
      auVar75._16_4_ = auVar34._16_4_ * fVar275;
      auVar75._20_4_ = auVar34._20_4_ * fVar276;
      auVar75._24_4_ = auVar34._24_4_ * fVar345;
      auVar75._28_4_ = auVar32._28_4_ + fVar226;
      auVar34 = vsubps_avx(auVar74,auVar75);
      auVar30 = vminps_avx(auVar36,auVar38);
      auVar29 = vmaxps_avx(auVar36,auVar38);
      auVar31 = vminps_avx(auVar39,auVar33);
      auVar31 = vminps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx(auVar39,auVar33);
      auVar29 = vmaxps_avx(auVar29,auVar30);
      auVar32 = vminps_avx(auVar124,auVar125);
      auVar30 = vmaxps_avx(auVar124,auVar125);
      auVar33 = vminps_avx(auVar35,auVar34);
      auVar32 = vminps_avx(auVar32,auVar33);
      auVar32 = vminps_avx(auVar31,auVar32);
      auVar31 = vmaxps_avx(auVar35,auVar34);
      auVar30 = vmaxps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vcmpps_avx(auVar32,local_78,2);
      auVar30 = vcmpps_avx(auVar30,local_248,5);
      auVar29 = vandps_avx(auVar30,auVar29);
      auVar123 = vandps_avx(local_158,auVar123);
      auVar30 = auVar123 & auVar29;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar123 = vandps_avx(auVar29,auVar123);
        uVar88 = vmovmskps_avx(auVar123);
        if (uVar88 != 0) {
          uVar86 = (ulong)uVar87;
          auStack_3d8[uVar86] = uVar88 & 0xff;
          uVar9 = vmovlps_avx(local_308);
          *(undefined8 *)(afStack_228 + uVar86 * 2) = uVar9;
          uVar85 = vmovlps_avx(auVar109);
          auStack_58[uVar86] = uVar85;
          uVar87 = uVar87 + 1;
        }
      }
    }
LAB_01133956:
    do {
      do {
        do {
          do {
            if (uVar87 == 0) {
              if ((uVar84 & 1) != 0) goto LAB_011349d9;
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar132._4_4_ = uVar8;
              auVar132._0_4_ = uVar8;
              auVar132._8_4_ = uVar8;
              auVar132._12_4_ = uVar8;
              auVar132._16_4_ = uVar8;
              auVar132._20_4_ = uVar8;
              auVar132._24_4_ = uVar8;
              auVar132._28_4_ = uVar8;
              auVar123 = vcmpps_avx(local_178,auVar132,2);
              uVar83 = vmovmskps_avx(auVar123);
              uVar82 = uVar82 & uVar82 + 0xff & uVar83;
              if (uVar82 != 0) goto LAB_01132729;
              goto LAB_011349d9;
            }
            uVar86 = (ulong)(uVar87 - 1);
            uVar88 = auStack_3d8[uVar86];
            fVar226 = afStack_228[uVar86 * 2];
            fVar200 = afStack_228[uVar86 * 2 + 1];
            auVar109._8_8_ = 0;
            auVar109._0_8_ = auStack_58[uVar86];
            uVar85 = 0;
            if (uVar88 != 0) {
              for (; (uVar88 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
              }
            }
            uVar88 = uVar88 - 1 & uVar88;
            auStack_3d8[uVar86] = uVar88;
            if (uVar88 == 0) {
              uVar87 = uVar87 - 1;
            }
            fVar201 = (float)(uVar85 + 1) * 0.14285715;
            fVar219 = (1.0 - (float)uVar85 * 0.14285715) * fVar226 +
                      fVar200 * (float)uVar85 * 0.14285715;
            fVar226 = (1.0 - fVar201) * fVar226 + fVar200 * fVar201;
            fVar200 = fVar226 - fVar219;
            if (0.16666667 <= fVar200) {
              local_308 = vinsertps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar226),0x10);
              goto LAB_01133325;
            }
            auVar104 = vshufps_avx(auVar109,auVar109,0x50);
            auVar143._8_4_ = 0x3f800000;
            auVar143._0_8_ = 0x3f8000003f800000;
            auVar143._12_4_ = 0x3f800000;
            auVar139 = vsubps_avx(auVar143,auVar104);
            fVar201 = auVar104._0_4_;
            fVar390 = auVar104._4_4_;
            fVar220 = auVar104._8_4_;
            fVar254 = auVar104._12_4_;
            fVar334 = auVar139._0_4_;
            fVar222 = auVar139._4_4_;
            fVar255 = auVar139._8_4_;
            fVar221 = auVar139._12_4_;
            auVar180._0_4_ = fVar201 * auVar311._0_4_ + fVar334 * (float)local_5f8._0_4_;
            auVar180._4_4_ = fVar390 * auVar311._4_4_ + fVar222 * (float)local_5f8._4_4_;
            auVar180._8_4_ = fVar220 * auVar311._0_4_ + fVar255 * (float)local_5f8._0_4_;
            auVar180._12_4_ = fVar254 * auVar311._4_4_ + fVar221 * (float)local_5f8._4_4_;
            auVar240._0_4_ = fVar201 * auVar321._0_4_ + fVar256 * fVar334;
            auVar240._4_4_ = fVar390 * auVar321._4_4_ + fVar257 * fVar222;
            auVar240._8_4_ = fVar220 * auVar321._0_4_ + fVar256 * fVar255;
            auVar240._12_4_ = fVar254 * auVar321._4_4_ + fVar257 * fVar221;
            auVar265._0_4_ = fVar201 * auVar336._0_4_ + auVar210._0_4_ * fVar334;
            auVar265._4_4_ = fVar390 * auVar336._4_4_ + auVar210._4_4_ * fVar222;
            auVar265._8_4_ = fVar220 * auVar336._0_4_ + auVar210._0_4_ * fVar255;
            auVar265._12_4_ = fVar254 * auVar336._4_4_ + auVar210._4_4_ * fVar221;
            auVar110._0_4_ = fVar201 * auVar107._0_4_ + fVar334 * auVar142._0_4_;
            auVar110._4_4_ = fVar390 * auVar107._4_4_ + fVar222 * auVar142._4_4_;
            auVar110._8_4_ = fVar220 * auVar107._0_4_ + fVar255 * auVar142._0_4_;
            auVar110._12_4_ = fVar254 * auVar107._4_4_ + fVar221 * auVar142._4_4_;
            auVar166._16_16_ = auVar180;
            auVar166._0_16_ = auVar180;
            auVar198._16_16_ = auVar240;
            auVar198._0_16_ = auVar240;
            auVar253._16_16_ = auVar265;
            auVar253._0_16_ = auVar265;
            auVar123 = ZEXT2032(CONCAT416(fVar226,ZEXT416((uint)fVar219)));
            auVar123 = vshufps_avx(auVar123,auVar123,0);
            auVar29 = vsubps_avx(auVar198,auVar166);
            fVar201 = auVar123._0_4_;
            fVar390 = auVar123._4_4_;
            fVar220 = auVar123._8_4_;
            fVar254 = auVar123._12_4_;
            fVar334 = auVar123._16_4_;
            fVar222 = auVar123._20_4_;
            fVar255 = auVar123._24_4_;
            auVar167._0_4_ = auVar180._0_4_ + auVar29._0_4_ * fVar201;
            auVar167._4_4_ = auVar180._4_4_ + auVar29._4_4_ * fVar390;
            auVar167._8_4_ = auVar180._8_4_ + auVar29._8_4_ * fVar220;
            auVar167._12_4_ = auVar180._12_4_ + auVar29._12_4_ * fVar254;
            auVar167._16_4_ = auVar180._0_4_ + auVar29._16_4_ * fVar334;
            auVar167._20_4_ = auVar180._4_4_ + auVar29._20_4_ * fVar222;
            auVar167._24_4_ = auVar180._8_4_ + auVar29._24_4_ * fVar255;
            auVar167._28_4_ = auVar180._12_4_ + auVar29._28_4_;
            auVar123 = vsubps_avx(auVar253,auVar198);
            auVar199._0_4_ = auVar240._0_4_ + auVar123._0_4_ * fVar201;
            auVar199._4_4_ = auVar240._4_4_ + auVar123._4_4_ * fVar390;
            auVar199._8_4_ = auVar240._8_4_ + auVar123._8_4_ * fVar220;
            auVar199._12_4_ = auVar240._12_4_ + auVar123._12_4_ * fVar254;
            auVar199._16_4_ = auVar240._0_4_ + auVar123._16_4_ * fVar334;
            auVar199._20_4_ = auVar240._4_4_ + auVar123._20_4_ * fVar222;
            auVar199._24_4_ = auVar240._8_4_ + auVar123._24_4_ * fVar255;
            auVar199._28_4_ = auVar240._12_4_ + auVar123._28_4_;
            auVar104 = vsubps_avx(auVar110,auVar265);
            auVar130._0_4_ = auVar265._0_4_ + auVar104._0_4_ * fVar201;
            auVar130._4_4_ = auVar265._4_4_ + auVar104._4_4_ * fVar390;
            auVar130._8_4_ = auVar265._8_4_ + auVar104._8_4_ * fVar220;
            auVar130._12_4_ = auVar265._12_4_ + auVar104._12_4_ * fVar254;
            auVar130._16_4_ = auVar265._0_4_ + auVar104._0_4_ * fVar334;
            auVar130._20_4_ = auVar265._4_4_ + auVar104._4_4_ * fVar222;
            auVar130._24_4_ = auVar265._8_4_ + auVar104._8_4_ * fVar255;
            auVar130._28_4_ = auVar265._12_4_ + auVar104._12_4_;
            auVar123 = vsubps_avx(auVar199,auVar167);
            auVar168._0_4_ = auVar167._0_4_ + fVar201 * auVar123._0_4_;
            auVar168._4_4_ = auVar167._4_4_ + fVar390 * auVar123._4_4_;
            auVar168._8_4_ = auVar167._8_4_ + fVar220 * auVar123._8_4_;
            auVar168._12_4_ = auVar167._12_4_ + fVar254 * auVar123._12_4_;
            auVar168._16_4_ = auVar167._16_4_ + fVar334 * auVar123._16_4_;
            auVar168._20_4_ = auVar167._20_4_ + fVar222 * auVar123._20_4_;
            auVar168._24_4_ = auVar167._24_4_ + fVar255 * auVar123._24_4_;
            auVar168._28_4_ = auVar167._28_4_ + auVar123._28_4_;
            auVar123 = vsubps_avx(auVar130,auVar199);
            auVar131._0_4_ = auVar199._0_4_ + fVar201 * auVar123._0_4_;
            auVar131._4_4_ = auVar199._4_4_ + fVar390 * auVar123._4_4_;
            auVar131._8_4_ = auVar199._8_4_ + fVar220 * auVar123._8_4_;
            auVar131._12_4_ = auVar199._12_4_ + fVar254 * auVar123._12_4_;
            auVar131._16_4_ = auVar199._16_4_ + fVar334 * auVar123._16_4_;
            auVar131._20_4_ = auVar199._20_4_ + fVar222 * auVar123._20_4_;
            auVar131._24_4_ = auVar199._24_4_ + fVar255 * auVar123._24_4_;
            auVar131._28_4_ = auVar199._28_4_ + auVar123._28_4_;
            auVar123 = vsubps_avx(auVar131,auVar168);
            auVar285._0_4_ = auVar168._0_4_ + fVar201 * auVar123._0_4_;
            auVar285._4_4_ = auVar168._4_4_ + fVar390 * auVar123._4_4_;
            auVar285._8_4_ = auVar168._8_4_ + fVar220 * auVar123._8_4_;
            auVar285._12_4_ = auVar168._12_4_ + fVar254 * auVar123._12_4_;
            auVar289._16_4_ = auVar168._16_4_ + fVar334 * auVar123._16_4_;
            auVar289._0_16_ = auVar285;
            auVar289._20_4_ = auVar168._20_4_ + fVar222 * auVar123._20_4_;
            auVar289._24_4_ = auVar168._24_4_ + fVar255 * auVar123._24_4_;
            auVar289._28_4_ = auVar168._28_4_ + auVar199._28_4_;
            auVar290 = auVar289._16_16_;
            auVar145 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.33333334)),
                                   ZEXT416((uint)(fVar200 * 0.33333334)),0);
            auVar266._0_4_ = auVar285._0_4_ + auVar145._0_4_ * auVar123._0_4_ * 3.0;
            auVar266._4_4_ = auVar285._4_4_ + auVar145._4_4_ * auVar123._4_4_ * 3.0;
            auVar266._8_4_ = auVar285._8_4_ + auVar145._8_4_ * auVar123._8_4_ * 3.0;
            auVar266._12_4_ = auVar285._12_4_ + auVar145._12_4_ * auVar123._12_4_ * 3.0;
            auVar105 = vshufpd_avx(auVar285,auVar285,3);
            auVar156 = vshufpd_avx(auVar290,auVar290,3);
            auVar104 = vsubps_avx(auVar105,auVar285);
            auVar139 = vsubps_avx(auVar156,auVar290);
            auVar111._0_4_ = auVar104._0_4_ + auVar139._0_4_;
            auVar111._4_4_ = auVar104._4_4_ + auVar139._4_4_;
            auVar111._8_4_ = auVar104._8_4_ + auVar139._8_4_;
            auVar111._12_4_ = auVar104._12_4_ + auVar139._12_4_;
            auVar104 = vmovshdup_avx(auVar285);
            auVar139 = vmovshdup_avx(auVar266);
            auVar183 = vshufps_avx(auVar111,auVar111,0);
            auVar146 = vshufps_avx(auVar111,auVar111,0x55);
            fVar201 = auVar146._0_4_;
            fVar390 = auVar146._4_4_;
            fVar220 = auVar146._8_4_;
            fVar254 = auVar146._12_4_;
            fVar334 = auVar183._0_4_;
            fVar222 = auVar183._4_4_;
            fVar255 = auVar183._8_4_;
            fVar221 = auVar183._12_4_;
            auVar112._0_4_ = fVar334 * auVar285._0_4_ + auVar104._0_4_ * fVar201;
            auVar112._4_4_ = fVar222 * auVar285._4_4_ + auVar104._4_4_ * fVar390;
            auVar112._8_4_ = fVar255 * auVar285._8_4_ + auVar104._8_4_ * fVar220;
            auVar112._12_4_ = fVar221 * auVar285._12_4_ + auVar104._12_4_ * fVar254;
            auVar181._0_4_ = fVar334 * auVar266._0_4_ + auVar139._0_4_ * fVar201;
            auVar181._4_4_ = fVar222 * auVar266._4_4_ + auVar139._4_4_ * fVar390;
            auVar181._8_4_ = fVar255 * auVar266._8_4_ + auVar139._8_4_ * fVar220;
            auVar181._12_4_ = fVar221 * auVar266._12_4_ + auVar139._12_4_ * fVar254;
            auVar139 = vshufps_avx(auVar112,auVar112,0xe8);
            auVar183 = vshufps_avx(auVar181,auVar181,0xe8);
            auVar104 = vcmpps_avx(auVar139,auVar183,1);
            uVar88 = vextractps_avx(auVar104,0);
            auVar146 = auVar181;
            if ((uVar88 & 1) == 0) {
              auVar146 = auVar112;
            }
            auVar144._0_4_ = auVar145._0_4_ * auVar123._16_4_ * 3.0;
            auVar144._4_4_ = auVar145._4_4_ * auVar123._20_4_ * 3.0;
            auVar144._8_4_ = auVar145._8_4_ * auVar123._24_4_ * 3.0;
            auVar144._12_4_ = auVar145._12_4_ * 0.0;
            auVar11 = vsubps_avx(auVar290,auVar144);
            auVar145 = vmovshdup_avx(auVar11);
            auVar290 = vmovshdup_avx(auVar290);
            fVar259 = auVar11._0_4_;
            fVar275 = auVar11._4_4_;
            auVar241._0_4_ = fVar259 * fVar334 + auVar145._0_4_ * fVar201;
            auVar241._4_4_ = fVar275 * fVar222 + auVar145._4_4_ * fVar390;
            auVar241._8_4_ = auVar11._8_4_ * fVar255 + auVar145._8_4_ * fVar220;
            auVar241._12_4_ = auVar11._12_4_ * fVar221 + auVar145._12_4_ * fVar254;
            auVar267._0_4_ = fVar334 * auVar289._16_4_ + auVar290._0_4_ * fVar201;
            auVar267._4_4_ = fVar222 * auVar289._20_4_ + auVar290._4_4_ * fVar390;
            auVar267._8_4_ = fVar255 * auVar289._24_4_ + auVar290._8_4_ * fVar220;
            auVar267._12_4_ = fVar221 * auVar289._28_4_ + auVar290._12_4_ * fVar254;
            auVar290 = vshufps_avx(auVar241,auVar241,0xe8);
            auVar10 = vshufps_avx(auVar267,auVar267,0xe8);
            auVar145 = vcmpps_avx(auVar290,auVar10,1);
            uVar88 = vextractps_avx(auVar145,0);
            auVar337 = auVar267;
            if ((uVar88 & 1) == 0) {
              auVar337 = auVar241;
            }
            auVar146 = vmaxss_avx(auVar337,auVar146);
            auVar139 = vminps_avx(auVar139,auVar183);
            auVar183 = vminps_avx(auVar290,auVar10);
            auVar183 = vminps_avx(auVar139,auVar183);
            auVar104 = vshufps_avx(auVar104,auVar104,0x55);
            auVar104 = vblendps_avx(auVar104,auVar145,2);
            auVar145 = vpslld_avx(auVar104,0x1f);
            auVar104 = vshufpd_avx(auVar181,auVar181,1);
            auVar104 = vinsertps_avx(auVar104,auVar267,0x9c);
            auVar139 = vshufpd_avx(auVar112,auVar112,1);
            auVar139 = vinsertps_avx(auVar139,auVar241,0x9c);
            auVar104 = vblendvps_avx(auVar139,auVar104,auVar145);
            auVar139 = vmovshdup_avx(auVar104);
            auVar104 = vmaxss_avx(auVar139,auVar104);
            fVar220 = auVar183._0_4_;
            auVar139 = vmovshdup_avx(auVar183);
            fVar390 = auVar104._0_4_;
            fVar254 = auVar139._0_4_;
            fVar201 = auVar146._0_4_;
            if ((fVar220 < 0.0001) && (-0.0001 < fVar390)) break;
            if ((fVar254 < 0.0001 && -0.0001 < fVar201) || (fVar220 < 0.0001 && -0.0001 < fVar201))
            break;
            auVar145 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar104,1);
            auVar139 = vcmpps_avx(auVar139,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar139 = vandps_avx(auVar139,auVar145);
          } while ((auVar139 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar145 = vcmpps_avx(auVar183,_DAT_01f7aa10,1);
          auVar139 = vcmpss_avx(auVar146,ZEXT416(0),1);
          auVar182._8_4_ = 0x3f800000;
          auVar182._0_8_ = 0x3f8000003f800000;
          auVar182._12_4_ = 0x3f800000;
          auVar242._8_4_ = 0xbf800000;
          auVar242._0_8_ = 0xbf800000bf800000;
          auVar242._12_4_ = 0xbf800000;
          auVar139 = vblendvps_avx(auVar182,auVar242,auVar139);
          auVar145 = vblendvps_avx(auVar182,auVar242,auVar145);
          auVar183 = vcmpss_avx(auVar145,auVar139,4);
          auVar183 = vpshufd_avx(ZEXT416(auVar183._0_4_ & 1),0x50);
          auVar183 = vpslld_avx(auVar183,0x1f);
          auVar183 = vpsrad_avx(auVar183,0x1f);
          auVar183 = vpandn_avx(auVar183,_DAT_01fafeb0);
          auVar146 = vmovshdup_avx(auVar145);
          fVar334 = auVar146._0_4_;
          if ((auVar145._0_4_ != fVar334) || (NAN(auVar145._0_4_) || NAN(fVar334))) {
            if ((fVar254 != fVar220) || (NAN(fVar254) || NAN(fVar220))) {
              fVar220 = -fVar220 / (fVar254 - fVar220);
              auVar145 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar220) * 0.0 + fVar220)));
            }
            else {
              auVar145 = ZEXT816(0x3f80000000000000);
              if ((fVar220 != 0.0) || (NAN(fVar220))) {
                auVar145 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar290 = vcmpps_avx(auVar183,auVar145,1);
            auVar146 = vblendps_avx(auVar183,auVar145,2);
            auVar145 = vblendps_avx(auVar145,auVar183,2);
            auVar183 = vblendvps_avx(auVar145,auVar146,auVar290);
          }
          auVar104 = vcmpss_avx(auVar104,ZEXT416(0),1);
          auVar184._8_4_ = 0x3f800000;
          auVar184._0_8_ = 0x3f8000003f800000;
          auVar184._12_4_ = 0x3f800000;
          auVar243._8_4_ = 0xbf800000;
          auVar243._0_8_ = 0xbf800000bf800000;
          auVar243._12_4_ = 0xbf800000;
          auVar104 = vblendvps_avx(auVar184,auVar243,auVar104);
          fVar220 = auVar104._0_4_;
          if ((auVar139._0_4_ != fVar220) || (NAN(auVar139._0_4_) || NAN(fVar220))) {
            if ((fVar390 != fVar201) || (NAN(fVar390) || NAN(fVar201))) {
              fVar201 = -fVar201 / (fVar390 - fVar201);
              auVar104 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar201) * 0.0 + fVar201)));
            }
            else {
              auVar104 = ZEXT816(0x3f80000000000000);
              if ((fVar201 != 0.0) || (NAN(fVar201))) {
                auVar104 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar145 = vcmpps_avx(auVar183,auVar104,1);
            auVar139 = vblendps_avx(auVar183,auVar104,2);
            auVar104 = vblendps_avx(auVar104,auVar183,2);
            auVar183 = vblendvps_avx(auVar104,auVar139,auVar145);
          }
          if ((fVar334 != fVar220) || (NAN(fVar334) || NAN(fVar220))) {
            auVar113._8_4_ = 0x3f800000;
            auVar113._0_8_ = 0x3f8000003f800000;
            auVar113._12_4_ = 0x3f800000;
            auVar104 = vcmpps_avx(auVar183,auVar113,1);
            auVar139 = vinsertps_avx(auVar183,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar185._4_12_ = auVar183._4_12_;
            auVar185._0_4_ = 0x3f800000;
            auVar183 = vblendvps_avx(auVar185,auVar139,auVar104);
          }
          auVar104 = vcmpps_avx(auVar183,_DAT_01f7b6f0,1);
          auVar76._12_4_ = 0;
          auVar76._0_12_ = auVar183._4_12_;
          auVar139 = vinsertps_avx(auVar183,ZEXT416(0x3f800000),0x10);
          auVar104 = vblendvps_avx(auVar139,auVar76 << 0x20,auVar104);
          auVar139 = vmovshdup_avx(auVar104);
        } while (auVar139._0_4_ < auVar104._0_4_);
        auVar114._0_4_ = auVar104._0_4_ + -0.1;
        auVar114._4_4_ = auVar104._4_4_ + 0.1;
        auVar114._8_4_ = auVar104._8_4_ + 0.0;
        auVar114._12_4_ = auVar104._12_4_ + 0.0;
        auVar145 = vshufpd_avx(auVar266,auVar266,3);
        auVar286._8_8_ = 0x3f80000000000000;
        auVar286._0_8_ = 0x3f80000000000000;
        auVar104 = vcmpps_avx(auVar114,auVar286,1);
        auVar77._12_4_ = 0;
        auVar77._0_12_ = auVar114._4_12_;
        auVar139 = vinsertps_avx(auVar114,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar104 = vblendvps_avx(auVar139,auVar77 << 0x20,auVar104);
        auVar139 = vshufpd_avx(auVar11,auVar11,3);
        auVar183 = vshufps_avx(auVar104,auVar104,0x50);
        auVar287._8_4_ = 0x3f800000;
        auVar287._0_8_ = 0x3f8000003f800000;
        auVar287._12_4_ = 0x3f800000;
        auVar146 = vsubps_avx(auVar287,auVar183);
        local_488 = auVar105._0_4_;
        fStack_484 = auVar105._4_4_;
        fStack_480 = auVar105._8_4_;
        fStack_47c = auVar105._12_4_;
        fVar201 = auVar183._0_4_;
        fVar390 = auVar183._4_4_;
        fVar220 = auVar183._8_4_;
        fVar254 = auVar183._12_4_;
        local_598 = auVar156._0_4_;
        fStack_594 = auVar156._4_4_;
        fStack_590 = auVar156._8_4_;
        fStack_58c = auVar156._12_4_;
        fVar334 = auVar146._0_4_;
        fVar222 = auVar146._4_4_;
        fVar255 = auVar146._8_4_;
        fVar221 = auVar146._12_4_;
        auVar115._0_4_ = fVar201 * local_488 + fVar334 * auVar285._0_4_;
        auVar115._4_4_ = fVar390 * fStack_484 + fVar222 * auVar285._4_4_;
        auVar115._8_4_ = fVar220 * fStack_480 + fVar255 * auVar285._0_4_;
        auVar115._12_4_ = fVar254 * fStack_47c + fVar221 * auVar285._4_4_;
        auVar186._0_4_ = fVar201 * auVar145._0_4_ + fVar334 * auVar266._0_4_;
        auVar186._4_4_ = fVar390 * auVar145._4_4_ + fVar222 * auVar266._4_4_;
        auVar186._8_4_ = fVar220 * auVar145._8_4_ + fVar255 * auVar266._0_4_;
        auVar186._12_4_ = fVar254 * auVar145._12_4_ + fVar221 * auVar266._4_4_;
        auVar268._0_4_ = fVar201 * auVar139._0_4_ + fVar334 * fVar259;
        auVar268._4_4_ = fVar390 * auVar139._4_4_ + fVar222 * fVar275;
        auVar268._8_4_ = fVar220 * auVar139._8_4_ + fVar255 * fVar259;
        auVar268._12_4_ = fVar254 * auVar139._12_4_ + fVar221 * fVar275;
        auVar297._0_4_ = fVar201 * local_598 + fVar334 * auVar289._16_4_;
        auVar297._4_4_ = fVar390 * fStack_594 + fVar222 * auVar289._20_4_;
        auVar297._8_4_ = fVar220 * fStack_590 + fVar255 * auVar289._16_4_;
        auVar297._12_4_ = fVar254 * fStack_58c + fVar221 * auVar289._20_4_;
        auVar156 = vsubps_avx(auVar287,auVar104);
        auVar139 = vmovshdup_avx(auVar109);
        auVar105 = vmovsldup_avx(auVar109);
        auVar109._0_4_ = auVar105._0_4_ * auVar156._0_4_ + auVar104._0_4_ * auVar139._0_4_;
        auVar109._4_4_ = auVar105._4_4_ * auVar156._4_4_ + auVar104._4_4_ * auVar139._4_4_;
        auVar109._8_4_ = auVar105._8_4_ * auVar156._8_4_ + auVar104._8_4_ * auVar139._8_4_;
        auVar109._12_4_ = auVar105._12_4_ * auVar156._12_4_ + auVar104._12_4_ * auVar139._12_4_;
        auVar11 = vmovshdup_avx(auVar109);
        auVar104 = vsubps_avx(auVar186,auVar115);
        auVar212._0_4_ = auVar104._0_4_ * 3.0;
        auVar212._4_4_ = auVar104._4_4_ * 3.0;
        auVar212._8_4_ = auVar104._8_4_ * 3.0;
        auVar212._12_4_ = auVar104._12_4_ * 3.0;
        auVar104 = vsubps_avx(auVar268,auVar186);
        auVar312._0_4_ = auVar104._0_4_ * 3.0;
        auVar312._4_4_ = auVar104._4_4_ * 3.0;
        auVar312._8_4_ = auVar104._8_4_ * 3.0;
        auVar312._12_4_ = auVar104._12_4_ * 3.0;
        auVar104 = vsubps_avx(auVar297,auVar268);
        auVar322._0_4_ = auVar104._0_4_ * 3.0;
        auVar322._4_4_ = auVar104._4_4_ * 3.0;
        auVar322._8_4_ = auVar104._8_4_ * 3.0;
        auVar322._12_4_ = auVar104._12_4_ * 3.0;
        auVar139 = vminps_avx(auVar312,auVar322);
        auVar104 = vmaxps_avx(auVar312,auVar322);
        auVar139 = vminps_avx(auVar212,auVar139);
        auVar104 = vmaxps_avx(auVar212,auVar104);
        auVar105 = vshufpd_avx(auVar139,auVar139,3);
        auVar156 = vshufpd_avx(auVar104,auVar104,3);
        auVar139 = vminps_avx(auVar139,auVar105);
        auVar104 = vmaxps_avx(auVar104,auVar156);
        auVar105 = vshufps_avx(ZEXT416((uint)(1.0 / fVar200)),ZEXT416((uint)(1.0 / fVar200)),0);
        auVar313._0_4_ = auVar139._0_4_ * auVar105._0_4_;
        auVar313._4_4_ = auVar139._4_4_ * auVar105._4_4_;
        auVar313._8_4_ = auVar139._8_4_ * auVar105._8_4_;
        auVar313._12_4_ = auVar139._12_4_ * auVar105._12_4_;
        auVar323._0_4_ = auVar105._0_4_ * auVar104._0_4_;
        auVar323._4_4_ = auVar105._4_4_ * auVar104._4_4_;
        auVar323._8_4_ = auVar105._8_4_ * auVar104._8_4_;
        auVar323._12_4_ = auVar105._12_4_ * auVar104._12_4_;
        auVar146 = ZEXT416((uint)(1.0 / (auVar11._0_4_ - auVar109._0_4_)));
        auVar104 = vshufpd_avx(auVar115,auVar115,3);
        auVar139 = vshufpd_avx(auVar186,auVar186,3);
        auVar105 = vshufpd_avx(auVar268,auVar268,3);
        auVar156 = vshufpd_avx(auVar297,auVar297,3);
        auVar104 = vsubps_avx(auVar104,auVar115);
        auVar145 = vsubps_avx(auVar139,auVar186);
        auVar183 = vsubps_avx(auVar105,auVar268);
        auVar156 = vsubps_avx(auVar156,auVar297);
        auVar139 = vminps_avx(auVar104,auVar145);
        auVar104 = vmaxps_avx(auVar104,auVar145);
        auVar105 = vminps_avx(auVar183,auVar156);
        auVar105 = vminps_avx(auVar139,auVar105);
        auVar139 = vmaxps_avx(auVar183,auVar156);
        auVar104 = vmaxps_avx(auVar104,auVar139);
        auVar139 = vshufps_avx(auVar146,auVar146,0);
        auVar381._0_4_ = auVar139._0_4_ * auVar105._0_4_;
        auVar381._4_4_ = auVar139._4_4_ * auVar105._4_4_;
        auVar381._8_4_ = auVar139._8_4_ * auVar105._8_4_;
        auVar381._12_4_ = auVar139._12_4_ * auVar105._12_4_;
        auVar395._0_4_ = auVar139._0_4_ * auVar104._0_4_;
        auVar395._4_4_ = auVar139._4_4_ * auVar104._4_4_;
        auVar395._8_4_ = auVar139._8_4_ * auVar104._8_4_;
        auVar395._12_4_ = auVar139._12_4_ * auVar104._12_4_;
        auVar104 = vmovsldup_avx(auVar109);
        auVar338._4_12_ = auVar104._4_12_;
        auVar338._0_4_ = fVar219;
        auVar347._4_12_ = auVar109._4_12_;
        auVar347._0_4_ = fVar226;
        auVar213._0_4_ = (fVar219 + fVar226) * 0.5;
        auVar213._4_4_ = (auVar104._4_4_ + auVar109._4_4_) * 0.5;
        auVar213._8_4_ = (auVar104._8_4_ + auVar109._8_4_) * 0.5;
        auVar213._12_4_ = (auVar104._12_4_ + auVar109._12_4_) * 0.5;
        auVar104 = vshufps_avx(auVar213,auVar213,0);
        fVar201 = auVar104._0_4_;
        fVar390 = auVar104._4_4_;
        fVar220 = auVar104._8_4_;
        fVar254 = auVar104._12_4_;
        local_558._0_4_ = auVar103._0_4_;
        local_558._4_4_ = auVar103._4_4_;
        fStack_550 = auVar103._8_4_;
        fStack_54c = auVar103._12_4_;
        auVar147._0_4_ = fVar201 * (float)local_258._0_4_ + (float)local_558._0_4_;
        auVar147._4_4_ = fVar390 * (float)local_258._4_4_ + (float)local_558._4_4_;
        auVar147._8_4_ = fVar220 * fStack_250 + fStack_550;
        auVar147._12_4_ = fVar254 * fStack_24c + fStack_54c;
        local_568 = auVar37._0_4_;
        fStack_564 = auVar37._4_4_;
        fStack_560 = auVar37._8_4_;
        fStack_55c = auVar37._12_4_;
        auVar187._0_4_ = fVar201 * (float)local_268._0_4_ + local_568;
        auVar187._4_4_ = fVar390 * (float)local_268._4_4_ + fStack_564;
        auVar187._8_4_ = fVar220 * fStack_260 + fStack_560;
        auVar187._12_4_ = fVar254 * fStack_25c + fStack_55c;
        local_578 = auVar232._0_4_;
        fStack_574 = auVar232._4_4_;
        fStack_570 = auVar232._8_4_;
        fStack_56c = auVar232._12_4_;
        auVar269._0_4_ = fVar201 * (float)local_278._0_4_ + local_578;
        auVar269._4_4_ = fVar390 * (float)local_278._4_4_ + fStack_574;
        auVar269._8_4_ = fVar220 * fStack_270 + fStack_570;
        auVar269._12_4_ = fVar254 * fStack_26c + fStack_56c;
        auVar104 = vsubps_avx(auVar187,auVar147);
        auVar148._0_4_ = auVar147._0_4_ + fVar201 * auVar104._0_4_;
        auVar148._4_4_ = auVar147._4_4_ + fVar390 * auVar104._4_4_;
        auVar148._8_4_ = auVar147._8_4_ + fVar220 * auVar104._8_4_;
        auVar148._12_4_ = auVar147._12_4_ + fVar254 * auVar104._12_4_;
        auVar104 = vsubps_avx(auVar269,auVar187);
        auVar188._0_4_ = auVar187._0_4_ + fVar201 * auVar104._0_4_;
        auVar188._4_4_ = auVar187._4_4_ + fVar390 * auVar104._4_4_;
        auVar188._8_4_ = auVar187._8_4_ + fVar220 * auVar104._8_4_;
        auVar188._12_4_ = auVar187._12_4_ + fVar254 * auVar104._12_4_;
        auVar104 = vsubps_avx(auVar188,auVar148);
        fVar201 = auVar148._0_4_ + fVar201 * auVar104._0_4_;
        fVar390 = auVar148._4_4_ + fVar390 * auVar104._4_4_;
        auVar116._0_8_ = CONCAT44(fVar390,fVar201);
        auVar116._8_4_ = auVar148._8_4_ + fVar220 * auVar104._8_4_;
        auVar116._12_4_ = auVar148._12_4_ + fVar254 * auVar104._12_4_;
        fVar220 = auVar104._0_4_ * 3.0;
        fVar254 = auVar104._4_4_ * 3.0;
        auVar149._0_8_ = CONCAT44(fVar254,fVar220);
        auVar149._8_4_ = auVar104._8_4_ * 3.0;
        auVar149._12_4_ = auVar104._12_4_ * 3.0;
        auVar189._8_8_ = auVar116._0_8_;
        auVar189._0_8_ = auVar116._0_8_;
        auVar104 = vshufpd_avx(auVar116,auVar116,3);
        auVar139 = vshufps_avx(auVar213,auVar213,0x55);
        auVar183 = vsubps_avx(auVar104,auVar189);
        auVar366._0_4_ = auVar183._0_4_ * auVar139._0_4_ + fVar201;
        auVar366._4_4_ = auVar183._4_4_ * auVar139._4_4_ + fVar390;
        auVar366._8_4_ = auVar183._8_4_ * auVar139._8_4_ + fVar201;
        auVar366._12_4_ = auVar183._12_4_ * auVar139._12_4_ + fVar390;
        auVar190._8_8_ = auVar149._0_8_;
        auVar190._0_8_ = auVar149._0_8_;
        auVar104 = vshufpd_avx(auVar149,auVar149,1);
        auVar104 = vsubps_avx(auVar104,auVar190);
        auVar150._0_4_ = auVar104._0_4_ * auVar139._0_4_ + fVar220;
        auVar150._4_4_ = auVar104._4_4_ * auVar139._4_4_ + fVar254;
        auVar150._8_4_ = auVar104._8_4_ * auVar139._8_4_ + fVar220;
        auVar150._12_4_ = auVar104._12_4_ * auVar139._12_4_ + fVar254;
        auVar139 = vmovshdup_avx(auVar150);
        auVar270._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
        auVar270._8_4_ = auVar139._8_4_ ^ 0x80000000;
        auVar270._12_4_ = auVar139._12_4_ ^ 0x80000000;
        auVar105 = vmovshdup_avx(auVar183);
        auVar104 = vunpcklps_avx(auVar105,auVar270);
        auVar156 = vshufps_avx(auVar104,auVar270,4);
        auVar117._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
        auVar117._8_4_ = -auVar183._8_4_;
        auVar117._12_4_ = -auVar183._12_4_;
        auVar104 = vmovlhps_avx(auVar117,auVar150);
        auVar145 = vshufps_avx(auVar104,auVar150,8);
        auVar104 = ZEXT416((uint)(auVar150._0_4_ * auVar105._0_4_ - auVar183._0_4_ * auVar139._0_4_)
                          );
        auVar139 = vshufps_avx(auVar104,auVar104,0);
        auVar104 = vdivps_avx(auVar156,auVar139);
        auVar139 = vdivps_avx(auVar145,auVar139);
        auVar145 = vinsertps_avx(auVar313,auVar381,0x1c);
        auVar183 = vinsertps_avx(auVar323,auVar395,0x1c);
        auVar146 = vinsertps_avx(auVar381,auVar313,0x4c);
        auVar290 = vinsertps_avx(auVar395,auVar323,0x4c);
        auVar105 = vmovsldup_avx(auVar104);
        auVar324._0_4_ = auVar145._0_4_ * auVar105._0_4_;
        auVar324._4_4_ = auVar145._4_4_ * auVar105._4_4_;
        auVar324._8_4_ = auVar145._8_4_ * auVar105._8_4_;
        auVar324._12_4_ = auVar145._12_4_ * auVar105._12_4_;
        auVar151._0_4_ = auVar105._0_4_ * auVar183._0_4_;
        auVar151._4_4_ = auVar105._4_4_ * auVar183._4_4_;
        auVar151._8_4_ = auVar105._8_4_ * auVar183._8_4_;
        auVar151._12_4_ = auVar105._12_4_ * auVar183._12_4_;
        auVar156 = vminps_avx(auVar324,auVar151);
        auVar105 = vmaxps_avx(auVar151,auVar324);
        auVar10 = vmovsldup_avx(auVar139);
        auVar396._0_4_ = auVar10._0_4_ * auVar146._0_4_;
        auVar396._4_4_ = auVar10._4_4_ * auVar146._4_4_;
        auVar396._8_4_ = auVar10._8_4_ * auVar146._8_4_;
        auVar396._12_4_ = auVar10._12_4_ * auVar146._12_4_;
        auVar325._0_4_ = auVar10._0_4_ * auVar290._0_4_;
        auVar325._4_4_ = auVar10._4_4_ * auVar290._4_4_;
        auVar325._8_4_ = auVar10._8_4_ * auVar290._8_4_;
        auVar325._12_4_ = auVar10._12_4_ * auVar290._12_4_;
        auVar10 = vminps_avx(auVar396,auVar325);
        auVar244._0_4_ = auVar156._0_4_ + auVar10._0_4_;
        auVar244._4_4_ = auVar156._4_4_ + auVar10._4_4_;
        auVar244._8_4_ = auVar156._8_4_ + auVar10._8_4_;
        auVar244._12_4_ = auVar156._12_4_ + auVar10._12_4_;
        auVar156 = vmaxps_avx(auVar325,auVar396);
        auVar10 = vsubps_avx(auVar338,auVar213);
        auVar337 = vsubps_avx(auVar347,auVar213);
        auVar152._0_4_ = auVar156._0_4_ + auVar105._0_4_;
        auVar152._4_4_ = auVar156._4_4_ + auVar105._4_4_;
        auVar152._8_4_ = auVar156._8_4_ + auVar105._8_4_;
        auVar152._12_4_ = auVar156._12_4_ + auVar105._12_4_;
        auVar348._8_8_ = 0x3f800000;
        auVar348._0_8_ = 0x3f800000;
        auVar105 = vsubps_avx(auVar348,auVar152);
        auVar156 = vsubps_avx(auVar348,auVar244);
        fVar255 = auVar10._0_4_;
        auVar349._0_4_ = fVar255 * auVar105._0_4_;
        fVar221 = auVar10._4_4_;
        auVar349._4_4_ = fVar221 * auVar105._4_4_;
        fVar259 = auVar10._8_4_;
        auVar349._8_4_ = fVar259 * auVar105._8_4_;
        fVar275 = auVar10._12_4_;
        auVar349._12_4_ = fVar275 * auVar105._12_4_;
        fVar220 = auVar337._0_4_;
        auVar153._0_4_ = fVar220 * auVar105._0_4_;
        fVar254 = auVar337._4_4_;
        auVar153._4_4_ = fVar254 * auVar105._4_4_;
        fVar334 = auVar337._8_4_;
        auVar153._8_4_ = fVar334 * auVar105._8_4_;
        fVar222 = auVar337._12_4_;
        auVar153._12_4_ = fVar222 * auVar105._12_4_;
        auVar382._0_4_ = fVar255 * auVar156._0_4_;
        auVar382._4_4_ = fVar221 * auVar156._4_4_;
        auVar382._8_4_ = fVar259 * auVar156._8_4_;
        auVar382._12_4_ = fVar275 * auVar156._12_4_;
        auVar245._0_4_ = fVar220 * auVar156._0_4_;
        auVar245._4_4_ = fVar254 * auVar156._4_4_;
        auVar245._8_4_ = fVar334 * auVar156._8_4_;
        auVar245._12_4_ = fVar222 * auVar156._12_4_;
        auVar105 = vminps_avx(auVar349,auVar382);
        auVar156 = vminps_avx(auVar153,auVar245);
        auVar10 = vminps_avx(auVar105,auVar156);
        auVar105 = vmaxps_avx(auVar382,auVar349);
        auVar156 = vmaxps_avx(auVar245,auVar153);
        auVar337 = vshufps_avx(auVar213,auVar213,0x54);
        auVar156 = vmaxps_avx(auVar156,auVar105);
        auVar12 = vshufps_avx(auVar366,auVar366,0);
        auVar13 = vshufps_avx(auVar366,auVar366,0x55);
        auVar105 = vhaddps_avx(auVar10,auVar10);
        auVar156 = vhaddps_avx(auVar156,auVar156);
        auVar246._0_4_ = auVar13._0_4_ * auVar139._0_4_ + auVar12._0_4_ * auVar104._0_4_;
        auVar246._4_4_ = auVar13._4_4_ * auVar139._4_4_ + auVar12._4_4_ * auVar104._4_4_;
        auVar246._8_4_ = auVar13._8_4_ * auVar139._8_4_ + auVar12._8_4_ * auVar104._8_4_;
        auVar246._12_4_ = auVar13._12_4_ * auVar139._12_4_ + auVar12._12_4_ * auVar104._12_4_;
        auVar10 = vsubps_avx(auVar337,auVar246);
        fVar201 = auVar10._0_4_ + auVar105._0_4_;
        fVar390 = auVar10._0_4_ + auVar156._0_4_;
        auVar105 = vmaxss_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar201));
        auVar156 = vminss_avx(ZEXT416((uint)fVar390),ZEXT416((uint)fVar226));
      } while (auVar156._0_4_ < auVar105._0_4_);
      auVar105 = vmovshdup_avx(auVar104);
      auVar247._0_4_ = auVar145._0_4_ * auVar105._0_4_;
      auVar247._4_4_ = auVar145._4_4_ * auVar105._4_4_;
      auVar247._8_4_ = auVar145._8_4_ * auVar105._8_4_;
      auVar247._12_4_ = auVar145._12_4_ * auVar105._12_4_;
      auVar154._0_4_ = auVar105._0_4_ * auVar183._0_4_;
      auVar154._4_4_ = auVar105._4_4_ * auVar183._4_4_;
      auVar154._8_4_ = auVar105._8_4_ * auVar183._8_4_;
      auVar154._12_4_ = auVar105._12_4_ * auVar183._12_4_;
      auVar156 = vminps_avx(auVar247,auVar154);
      auVar105 = vmaxps_avx(auVar154,auVar247);
      auVar145 = vmovshdup_avx(auVar139);
      auVar118._0_4_ = auVar145._0_4_ * auVar146._0_4_;
      auVar118._4_4_ = auVar145._4_4_ * auVar146._4_4_;
      auVar118._8_4_ = auVar145._8_4_ * auVar146._8_4_;
      auVar118._12_4_ = auVar145._12_4_ * auVar146._12_4_;
      auVar248._0_4_ = auVar290._0_4_ * auVar145._0_4_;
      auVar248._4_4_ = auVar290._4_4_ * auVar145._4_4_;
      auVar248._8_4_ = auVar290._8_4_ * auVar145._8_4_;
      auVar248._12_4_ = auVar290._12_4_ * auVar145._12_4_;
      auVar145 = vminps_avx(auVar118,auVar248);
      auVar191._0_4_ = auVar156._0_4_ + auVar145._0_4_;
      auVar191._4_4_ = auVar156._4_4_ + auVar145._4_4_;
      auVar191._8_4_ = auVar156._8_4_ + auVar145._8_4_;
      auVar191._12_4_ = auVar156._12_4_ + auVar145._12_4_;
      auVar156 = vmaxps_avx(auVar248,auVar118);
      auVar119._0_4_ = auVar105._0_4_ + auVar156._0_4_;
      auVar119._4_4_ = auVar105._4_4_ + auVar156._4_4_;
      auVar119._8_4_ = auVar105._8_4_ + auVar156._8_4_;
      auVar119._12_4_ = auVar105._12_4_ + auVar156._12_4_;
      auVar105 = vsubps_avx(auVar286,auVar119);
      auVar156 = vsubps_avx(auVar286,auVar191);
      auVar192._0_4_ = fVar255 * auVar105._0_4_;
      auVar192._4_4_ = fVar221 * auVar105._4_4_;
      auVar192._8_4_ = fVar259 * auVar105._8_4_;
      auVar192._12_4_ = fVar275 * auVar105._12_4_;
      auVar249._0_4_ = fVar255 * auVar156._0_4_;
      auVar249._4_4_ = fVar221 * auVar156._4_4_;
      auVar249._8_4_ = fVar259 * auVar156._8_4_;
      auVar249._12_4_ = fVar275 * auVar156._12_4_;
      auVar120._0_4_ = fVar220 * auVar105._0_4_;
      auVar120._4_4_ = fVar254 * auVar105._4_4_;
      auVar120._8_4_ = fVar334 * auVar105._8_4_;
      auVar120._12_4_ = fVar222 * auVar105._12_4_;
      auVar155._0_4_ = fVar220 * auVar156._0_4_;
      auVar155._4_4_ = fVar254 * auVar156._4_4_;
      auVar155._8_4_ = fVar334 * auVar156._8_4_;
      auVar155._12_4_ = fVar222 * auVar156._12_4_;
      auVar105 = vminps_avx(auVar192,auVar249);
      auVar156 = vminps_avx(auVar120,auVar155);
      auVar105 = vminps_avx(auVar105,auVar156);
      auVar156 = vmaxps_avx(auVar249,auVar192);
      auVar145 = vmaxps_avx(auVar155,auVar120);
      auVar105 = vhaddps_avx(auVar105,auVar105);
      auVar156 = vmaxps_avx(auVar145,auVar156);
      auVar156 = vhaddps_avx(auVar156,auVar156);
      auVar145 = vmovshdup_avx(auVar10);
      auVar183 = ZEXT416((uint)(auVar145._0_4_ + auVar105._0_4_));
      auVar105 = vmaxss_avx(auVar109,auVar183);
      auVar145 = ZEXT416((uint)(auVar145._0_4_ + auVar156._0_4_));
      auVar156 = vminss_avx(auVar145,auVar11);
      auVar383._8_4_ = 0x7fffffff;
      auVar383._0_8_ = 0x7fffffff7fffffff;
      auVar383._12_4_ = 0x7fffffff;
    } while (auVar156._0_4_ < auVar105._0_4_);
    uVar88 = 0;
    if ((fVar219 < fVar201) && (fVar390 < fVar226)) {
      auVar105 = vcmpps_avx(auVar145,auVar11,1);
      auVar156 = vcmpps_avx(auVar109,auVar183,1);
      auVar105 = vandps_avx(auVar156,auVar105);
      uVar88 = auVar105._0_4_;
    }
    if ((3 < uVar87 || fVar200 < 0.001) || (uVar88 & 1) != 0) {
      lVar90 = 200;
      do {
        fVar200 = auVar10._0_4_;
        fVar226 = 1.0 - fVar200;
        auVar105 = ZEXT416((uint)(fVar226 * fVar226 * fVar226));
        auVar105 = vshufps_avx(auVar105,auVar105,0);
        auVar156 = ZEXT416((uint)(fVar200 * 3.0 * fVar226 * fVar226));
        auVar156 = vshufps_avx(auVar156,auVar156,0);
        auVar145 = ZEXT416((uint)(fVar226 * fVar200 * fVar200 * 3.0));
        auVar145 = vshufps_avx(auVar145,auVar145,0);
        auVar183 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
        auVar183 = vshufps_avx(auVar183,auVar183,0);
        fVar226 = (float)local_558._0_4_ * auVar105._0_4_ +
                  local_568 * auVar156._0_4_ +
                  (float)local_3e8._0_4_ * auVar183._0_4_ + local_578 * auVar145._0_4_;
        fVar200 = (float)local_558._4_4_ * auVar105._4_4_ +
                  fStack_564 * auVar156._4_4_ +
                  (float)local_3e8._4_4_ * auVar183._4_4_ + fStack_574 * auVar145._4_4_;
        auVar121._0_8_ = CONCAT44(fVar200,fVar226);
        auVar121._8_4_ =
             fStack_550 * auVar105._8_4_ +
             fStack_560 * auVar156._8_4_ + fStack_3e0 * auVar183._8_4_ + fStack_570 * auVar145._8_4_
        ;
        auVar121._12_4_ =
             fStack_54c * auVar105._12_4_ +
             fStack_55c * auVar156._12_4_ +
             fStack_3dc * auVar183._12_4_ + fStack_56c * auVar145._12_4_;
        auVar157._8_8_ = auVar121._0_8_;
        auVar157._0_8_ = auVar121._0_8_;
        auVar156 = vshufpd_avx(auVar121,auVar121,1);
        auVar105 = vmovshdup_avx(auVar10);
        auVar156 = vsubps_avx(auVar156,auVar157);
        auVar122._0_4_ = auVar105._0_4_ * auVar156._0_4_ + fVar226;
        auVar122._4_4_ = auVar105._4_4_ * auVar156._4_4_ + fVar200;
        auVar122._8_4_ = auVar105._8_4_ * auVar156._8_4_ + fVar226;
        auVar122._12_4_ = auVar105._12_4_ * auVar156._12_4_ + fVar200;
        auVar105 = vshufps_avx(auVar122,auVar122,0);
        auVar156 = vshufps_avx(auVar122,auVar122,0x55);
        auVar158._0_4_ = auVar104._0_4_ * auVar105._0_4_ + auVar139._0_4_ * auVar156._0_4_;
        auVar158._4_4_ = auVar104._4_4_ * auVar105._4_4_ + auVar139._4_4_ * auVar156._4_4_;
        auVar158._8_4_ = auVar104._8_4_ * auVar105._8_4_ + auVar139._8_4_ * auVar156._8_4_;
        auVar158._12_4_ = auVar104._12_4_ * auVar105._12_4_ + auVar139._12_4_ * auVar156._12_4_;
        auVar10 = vsubps_avx(auVar10,auVar158);
        auVar105 = vandps_avx(auVar383,auVar122);
        auVar156 = vshufps_avx(auVar105,auVar105,0xf5);
        auVar105 = vmaxss_avx(auVar156,auVar105);
        if (auVar105._0_4_ < (float)local_3f8._0_4_) {
          fVar226 = auVar10._0_4_;
          if ((0.0 <= fVar226) && (fVar226 <= 1.0)) {
            auVar104 = vmovshdup_avx(auVar10);
            fVar200 = auVar104._0_4_;
            if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
              auVar104 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                       ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar290 = vinsertps_avx(auVar104,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar104 = vdpps_avx(auVar290,local_288,0x7f);
              auVar139 = vdpps_avx(auVar290,local_298,0x7f);
              auVar105 = vdpps_avx(auVar290,local_2c8,0x7f);
              auVar156 = vdpps_avx(auVar290,local_2d8,0x7f);
              auVar145 = vdpps_avx(auVar290,local_2e8,0x7f);
              auVar183 = vdpps_avx(auVar290,local_2f8,0x7f);
              fVar254 = 1.0 - fVar200;
              auVar146 = vdpps_avx(auVar290,local_2a8,0x7f);
              auVar290 = vdpps_avx(auVar290,local_2b8,0x7f);
              fVar334 = 1.0 - fVar226;
              fVar219 = auVar10._4_4_;
              fVar201 = auVar10._8_4_;
              fVar390 = auVar10._12_4_;
              fVar220 = fVar334 * fVar226 * fVar226 * 3.0;
              auVar271._0_4_ = fVar226 * fVar226 * fVar226;
              auVar271._4_4_ = fVar219 * fVar219 * fVar219;
              auVar271._8_4_ = fVar201 * fVar201 * fVar201;
              auVar271._12_4_ = fVar390 * fVar390 * fVar390;
              fVar219 = fVar226 * 3.0 * fVar334 * fVar334;
              fVar201 = fVar334 * fVar334 * fVar334;
              fVar226 = (fVar254 * auVar104._0_4_ + fVar200 * auVar105._0_4_) * fVar201 +
                        (fVar254 * auVar139._0_4_ + fVar200 * auVar156._0_4_) * fVar219 +
                        fVar220 * (fVar254 * auVar146._0_4_ + fVar200 * auVar145._0_4_) +
                        auVar271._0_4_ * (auVar183._0_4_ * fVar200 + fVar254 * auVar290._0_4_);
              if ((fVar202 <= fVar226) &&
                 (fVar200 = *(float *)(ray + k * 4 + 0x80), fVar226 <= fVar200)) {
                pGVar23 = (context->scene->geometries).items[uVar83].ptr;
                if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar92 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar92 = true, pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1c8 = vshufps_avx(auVar10,auVar10,0x55);
                  auVar314._8_4_ = 0x3f800000;
                  auVar314._0_8_ = 0x3f8000003f800000;
                  auVar314._12_4_ = 0x3f800000;
                  auVar104 = vsubps_avx(auVar314,local_1c8);
                  fVar390 = local_1c8._0_4_;
                  fVar254 = local_1c8._4_4_;
                  fVar222 = local_1c8._8_4_;
                  fVar255 = local_1c8._12_4_;
                  fVar221 = auVar104._0_4_;
                  fVar259 = auVar104._4_4_;
                  fVar275 = auVar104._8_4_;
                  fVar276 = auVar104._12_4_;
                  auVar326._0_4_ =
                       fVar390 * (float)local_438._0_4_ + fVar221 * (float)local_408._0_4_;
                  auVar326._4_4_ =
                       fVar254 * (float)local_438._4_4_ + fVar259 * (float)local_408._4_4_;
                  auVar326._8_4_ = fVar222 * fStack_430 + fVar275 * fStack_400;
                  auVar326._12_4_ = fVar255 * fStack_42c + fVar276 * fStack_3fc;
                  auVar339._0_4_ = fVar390 * (float)local_448._0_4_ + fVar221 * fVar277;
                  auVar339._4_4_ = fVar254 * (float)local_448._4_4_ + fVar259 * fVar278;
                  auVar339._8_4_ = fVar222 * fStack_440 + fVar275 * fVar279;
                  auVar339._12_4_ = fVar255 * fStack_43c + fVar276 * fVar280;
                  auVar350._0_4_ =
                       fVar390 * (float)local_318._0_4_ + fVar221 * (float)local_418._0_4_;
                  auVar350._4_4_ =
                       fVar254 * (float)local_318._4_4_ + fVar259 * (float)local_418._4_4_;
                  auVar350._8_4_ = fVar222 * fStack_310 + fVar275 * fStack_410;
                  auVar350._12_4_ = fVar255 * fStack_30c + fVar276 * fStack_40c;
                  auVar315._0_4_ = fVar390 * fVar223 + fVar221 * (float)local_428._0_4_;
                  auVar315._4_4_ = fVar254 * fVar224 + fVar259 * (float)local_428._4_4_;
                  auVar315._8_4_ = fVar222 * fVar225 + fVar275 * fStack_420;
                  auVar315._12_4_ = fVar255 * fVar258 + fVar276 * fStack_41c;
                  auVar156 = vsubps_avx(auVar339,auVar326);
                  auVar145 = vsubps_avx(auVar350,auVar339);
                  auVar183 = vsubps_avx(auVar315,auVar350);
                  local_1d8 = vshufps_avx(auVar10,auVar10,0);
                  fVar390 = local_1d8._0_4_;
                  fVar222 = local_1d8._4_4_;
                  fVar255 = local_1d8._8_4_;
                  fVar259 = local_1d8._12_4_;
                  auVar104 = vshufps_avx(ZEXT416((uint)fVar334),ZEXT416((uint)fVar334),0);
                  fVar254 = auVar104._0_4_;
                  fVar334 = auVar104._4_4_;
                  fVar221 = auVar104._8_4_;
                  fVar275 = auVar104._12_4_;
                  auVar104 = vshufps_avx(auVar271,auVar271,0);
                  auVar139 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
                  auVar105 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
                  auVar250._0_4_ =
                       ((auVar145._0_4_ * fVar254 + auVar183._0_4_ * fVar390) * fVar390 +
                       (auVar156._0_4_ * fVar254 + auVar145._0_4_ * fVar390) * fVar254) * 3.0;
                  auVar250._4_4_ =
                       ((auVar145._4_4_ * fVar334 + auVar183._4_4_ * fVar222) * fVar222 +
                       (auVar156._4_4_ * fVar334 + auVar145._4_4_ * fVar222) * fVar334) * 3.0;
                  auVar250._8_4_ =
                       ((auVar145._8_4_ * fVar221 + auVar183._8_4_ * fVar255) * fVar255 +
                       (auVar156._8_4_ * fVar221 + auVar145._8_4_ * fVar255) * fVar221) * 3.0;
                  auVar250._12_4_ =
                       ((auVar145._12_4_ * fVar275 + auVar183._12_4_ * fVar259) * fVar259 +
                       (auVar156._12_4_ * fVar275 + auVar145._12_4_ * fVar259) * fVar275) * 3.0;
                  auVar156 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                  auVar159._0_4_ =
                       auVar156._0_4_ * (float)local_348._0_4_ +
                       auVar105._0_4_ * (float)local_358._0_4_ +
                       auVar104._0_4_ * (float)local_378._0_4_ +
                       auVar139._0_4_ * (float)local_368._0_4_;
                  auVar159._4_4_ =
                       auVar156._4_4_ * (float)local_348._4_4_ +
                       auVar105._4_4_ * (float)local_358._4_4_ +
                       auVar104._4_4_ * (float)local_378._4_4_ +
                       auVar139._4_4_ * (float)local_368._4_4_;
                  auVar159._8_4_ =
                       auVar156._8_4_ * fStack_340 +
                       auVar105._8_4_ * fStack_350 +
                       auVar104._8_4_ * fStack_370 + auVar139._8_4_ * fStack_360;
                  auVar159._12_4_ =
                       auVar156._12_4_ * fStack_33c +
                       auVar105._12_4_ * fStack_34c +
                       auVar104._12_4_ * fStack_36c + auVar139._12_4_ * fStack_35c;
                  auVar104 = vshufps_avx(auVar250,auVar250,0xc9);
                  auVar193._0_4_ = auVar159._0_4_ * auVar104._0_4_;
                  auVar193._4_4_ = auVar159._4_4_ * auVar104._4_4_;
                  auVar193._8_4_ = auVar159._8_4_ * auVar104._8_4_;
                  auVar193._12_4_ = auVar159._12_4_ * auVar104._12_4_;
                  auVar104 = vshufps_avx(auVar159,auVar159,0xc9);
                  auVar160._0_4_ = auVar250._0_4_ * auVar104._0_4_;
                  auVar160._4_4_ = auVar250._4_4_ * auVar104._4_4_;
                  auVar160._8_4_ = auVar250._8_4_ * auVar104._8_4_;
                  auVar160._12_4_ = auVar250._12_4_ * auVar104._12_4_;
                  auVar139 = vsubps_avx(auVar160,auVar193);
                  auVar104 = vshufps_avx(auVar139,auVar139,0x55);
                  local_208[0] = (RTCHitN)auVar104[0];
                  local_208[1] = (RTCHitN)auVar104[1];
                  local_208[2] = (RTCHitN)auVar104[2];
                  local_208[3] = (RTCHitN)auVar104[3];
                  local_208[4] = (RTCHitN)auVar104[4];
                  local_208[5] = (RTCHitN)auVar104[5];
                  local_208[6] = (RTCHitN)auVar104[6];
                  local_208[7] = (RTCHitN)auVar104[7];
                  local_208[8] = (RTCHitN)auVar104[8];
                  local_208[9] = (RTCHitN)auVar104[9];
                  local_208[10] = (RTCHitN)auVar104[10];
                  local_208[0xb] = (RTCHitN)auVar104[0xb];
                  local_208[0xc] = (RTCHitN)auVar104[0xc];
                  local_208[0xd] = (RTCHitN)auVar104[0xd];
                  local_208[0xe] = (RTCHitN)auVar104[0xe];
                  local_208[0xf] = (RTCHitN)auVar104[0xf];
                  local_1f8 = vshufps_avx(auVar139,auVar139,0xaa);
                  local_1e8 = vshufps_avx(auVar139,auVar139,0);
                  local_1b8 = local_338._0_8_;
                  uStack_1b0 = local_338._8_8_;
                  local_1a8 = local_328._0_8_;
                  uStack_1a0 = local_328._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_194 = context->user->instID[0];
                  local_198 = uStack_194;
                  uStack_190 = uStack_194;
                  uStack_18c = uStack_194;
                  uStack_188 = context->user->instPrimID[0];
                  uStack_184 = uStack_188;
                  uStack_180 = uStack_188;
                  uStack_17c = uStack_188;
                  *(float *)(ray + k * 4 + 0x80) = fVar226;
                  local_468 = *local_458;
                  local_3c8.valid = (int *)local_468;
                  local_3c8.geometryUserPtr = pGVar23->userPtr;
                  local_3c8.context = context->user;
                  local_3c8.ray = (RTCRayN *)ray;
                  local_3c8.hit = local_208;
                  local_3c8.N = 4;
                  local_398._0_4_ = (int)uVar84;
                  if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar23->occlusionFilterN)(&local_3c8);
                    uVar84 = (ulong)(uint)local_398._0_4_;
                  }
                  if (local_468 == (undefined1  [16])0x0) {
                    auVar104 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar104 = auVar104 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var28 = context->args->filter;
                    if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var28)(&local_3c8);
                      uVar84 = (ulong)(uint)local_398._0_4_;
                    }
                    auVar139 = vpcmpeqd_avx(local_468,ZEXT816(0) << 0x40);
                    auVar104 = auVar139 ^ _DAT_01f7ae20;
                    auVar194._8_4_ = 0xff800000;
                    auVar194._0_8_ = 0xff800000ff800000;
                    auVar194._12_4_ = 0xff800000;
                    auVar139 = vblendvps_avx(auVar194,*(undefined1 (*) [16])(local_3c8.ray + 0x80),
                                             auVar139);
                    *(undefined1 (*) [16])(local_3c8.ray + 0x80) = auVar139;
                  }
                  auVar161._8_8_ = 0x100000001;
                  auVar161._0_8_ = 0x100000001;
                  bVar92 = (auVar161 & auVar104) != (undefined1  [16])0x0;
                  if (!bVar92) {
                    *(float *)(ray + k * 4 + 0x80) = fVar200;
                  }
                }
                uVar84 = CONCAT71((int7)(uVar84 >> 8),(byte)uVar84 | bVar92);
              }
            }
          }
          break;
        }
        lVar90 = lVar90 + -1;
      } while (lVar90 != 0);
      goto LAB_01133956;
    }
    local_308 = vinsertps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar226),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }